

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_fEf.cpp
# Opt level: O2

Matrix<double,_5,_1,_0,_5,_1> *
DronePoseLib::ValtonenOrnhagArxiv2021::calculate_coefficients
          (Matrix<double,_5,_1,_0,_5,_1> *__return_storage_ptr__,Matrix<double,_27,_1,_0,_27,_1> *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *pCVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> local_30;
  
  dVar142 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[5];
  dVar90 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[1];
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [8];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xb];
  dVar38 = dVar90 * dVar142 * dVar1 * dVar2;
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xc];
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[2];
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [3];
  dVar138 = -dVar10;
  dVar145 = dVar5 * dVar138 * dVar1;
  dVar14 = dVar10 * dVar5 * dVar1;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [4];
  dVar15 = dVar5 * dVar138 * dVar1;
  dVar127 = dVar5 * dVar10 * dVar1;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [6];
  dVar16 = dVar10 * dVar142 * dVar5;
  dVar5 = dVar5 * dVar138 * dVar142;
  dVar139 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[7];
  dVar39 = dVar10 * dVar142 * dVar139;
  dVar139 = dVar138 * dVar142 * dVar139;
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x11];
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x12];
  dVar6 = -dVar90 * dVar142 * dVar1 * dVar2;
  dVar90 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x13];
  dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x18];
  dVar13 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x19];
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xd];
  dVar37 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xe];
  dVar136 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xf];
  dVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x10];
  dVar133 = dVar27 * dVar142 * dVar1 * dVar2;
  dVar94 = -dVar27 * dVar142 * dVar1 * dVar2;
  dVar142 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x16];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x15];
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [9];
  dVar76 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[10];
  dVar7 = dVar14 * dVar2 * dVar37;
  dVar146 = dVar145 * dVar2 * dVar37;
  dVar156 = dVar127 * dVar2 * dVar37;
  dVar147 = dVar15 * dVar2 * dVar37;
  dVar95 = dVar13 * dVar13;
  dVar105 = dVar3 * dVar3;
  local_30.m_row = 0;
  local_30.m_col = 1;
  local_30.m_currentBlockRows = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.
  m_data.array[0] =
       dVar139 * dVar2 * dVar11 * dVar10 * dVar142 * dVar105 +
       dVar39 * dVar2 * dVar11 * dVar10 * dVar27 * dVar3 * dVar13 +
       dVar9 * dVar39 * dVar2 * dVar10 * dVar142 * dVar3 * dVar13 +
       dVar139 * dVar2 * dVar9 * dVar10 * dVar27 * dVar95 +
       dVar76 * dVar39 * dVar37 * dVar10 * dVar142 * dVar105 +
       dVar139 * dVar76 * dVar37 * dVar10 * dVar27 * dVar3 * dVar13 +
       dVar1 * dVar139 * dVar37 * dVar10 * dVar142 * dVar3 * dVar13 +
       dVar39 * dVar1 * dVar37 * dVar10 * dVar27 * dVar95 +
       dVar5 * dVar2 * dVar11 * dVar10 * dVar90 * dVar105 +
       dVar16 * dVar2 * dVar11 * dVar10 * dVar138 * dVar3 * dVar13 +
       dVar16 * dVar2 * dVar9 * dVar10 * dVar90 * dVar3 * dVar13 +
       dVar5 * dVar2 * dVar9 * dVar10 * dVar138 * dVar95 +
       dVar16 * dVar76 * dVar37 * dVar10 * dVar90 * dVar105 +
       dVar5 * dVar76 * dVar37 * dVar10 * dVar138 * dVar3 * dVar13 +
       dVar5 * dVar1 * dVar37 * dVar10 * dVar90 * dVar3 * dVar13 +
       dVar16 * dVar1 * dVar37 * dVar10 * dVar138 * dVar95 +
       dVar156 * dVar12 * dVar142 * dVar105 +
       dVar147 * dVar12 * dVar27 * dVar3 * dVar13 +
       dVar136 * dVar147 * dVar142 * dVar3 * dVar13 +
       dVar156 * dVar136 * dVar27 * dVar95 +
       dVar15 * dVar76 * dVar37 * dVar10 * dVar142 * dVar105 +
       dVar127 * dVar76 * dVar37 * dVar10 * dVar27 * dVar3 * dVar13 +
       dVar127 * dVar1 * dVar37 * dVar10 * dVar142 * dVar3 * dVar13 +
       dVar15 * dVar1 * dVar37 * dVar10 * dVar27 * dVar95 +
       dVar7 * dVar12 * dVar90 * dVar105 +
       dVar146 * dVar12 * dVar138 * dVar3 * dVar13 +
       dVar146 * dVar136 * dVar90 * dVar3 * dVar13 +
       dVar7 * dVar136 * dVar138 * dVar95 +
       dVar145 * dVar76 * dVar37 * dVar10 * dVar90 * dVar105 +
       dVar14 * dVar76 * dVar37 * dVar10 * dVar138 * dVar3 * dVar13 +
       dVar14 * dVar1 * dVar37 * dVar10 * dVar90 * dVar3 * dVar13 +
       dVar145 * dVar1 * dVar37 * dVar10 * dVar138 * dVar95 +
       dVar94 * dVar37 * dVar12 * dVar142 * dVar105 +
       dVar133 * dVar37 * dVar12 * dVar27 * dVar3 * dVar13 +
       dVar133 * dVar37 * dVar136 * dVar142 * dVar3 * dVar13 +
       dVar94 * dVar37 * dVar136 * dVar27 * dVar95 +
       dVar133 * dVar11 * dVar10 * dVar142 * dVar105 +
       dVar94 * dVar11 * dVar10 * dVar27 * dVar3 * dVar13 +
       dVar94 * dVar9 * dVar10 * dVar142 * dVar3 * dVar13 +
       dVar133 * dVar9 * dVar10 * dVar27 * dVar95 +
       dVar6 * dVar37 * dVar12 * dVar90 * dVar105 +
       dVar38 * dVar37 * dVar12 * dVar138 * dVar3 * dVar13 +
       dVar38 * dVar37 * dVar136 * dVar90 * dVar3 * dVar13 +
       dVar6 * dVar37 * dVar136 * dVar138 * dVar95 +
       dVar38 * dVar11 * dVar10 * dVar90 * dVar105 +
       dVar6 * dVar11 * dVar10 * dVar138 * dVar3 * dVar13 +
       dVar38 * dVar9 * dVar10 * dVar138 * dVar95 + dVar6 * dVar9 * dVar10 * dVar90 * dVar3 * dVar13
  ;
  dVar142 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar90 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[1];
  dVar76 = -dVar90;
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [4];
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [5];
  dVar134 = dVar90 * dVar9;
  dVar77 = dVar76 * dVar9;
  dVar96 = -dVar27;
  dVar128 = dVar27 * dVar9;
  dVar97 = dVar96 * dVar9;
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[2];
  dVar17 = -dVar10;
  dVar16 = dVar10 * dVar142;
  dVar40 = dVar142 * dVar17;
  dVar41 = dVar10 * dVar1;
  dVar135 = dVar1 * dVar17;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [8];
  dVar58 = dVar142 * dVar76 * dVar5;
  dVar139 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[9];
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x11];
  dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x12];
  dVar13 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x13];
  dVar117 = dVar90 * dVar142 * dVar5;
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[10];
  dVar136 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xc];
  dVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xd];
  dVar106 = dVar1 * dVar76 * dVar5;
  dVar76 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xe];
  dVar118 = dVar90 * dVar1 * dVar5;
  dVar119 = dVar118 * dVar2;
  dVar107 = dVar106 * dVar2;
  dVar90 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[6];
  dVar18 = dVar134 * dVar90;
  dVar19 = dVar77 * dVar90;
  dVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [7];
  dVar108 = dVar134 * dVar6;
  dVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xb];
  dVar129 = dVar7 * dVar108;
  dVar78 = dVar77 * dVar5;
  dVar98 = dVar139 * dVar78;
  dVar79 = dVar128 * dVar90;
  dVar80 = dVar97 * dVar90;
  dVar81 = dVar40 * dVar90 * dVar7;
  dVar157 = dVar41 * dVar90;
  dVar82 = dVar135 * dVar90;
  dVar83 = dVar82 * dVar7;
  dVar42 = dVar17 * dVar9 * dVar90;
  dVar94 = dVar90 * dVar10 * dVar9;
  dVar95 = dVar94 * dVar7 * dVar12;
  dVar14 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xf];
  dVar15 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x10];
  dVar105 = dVar19 * dVar7 * dVar76;
  dVar77 = dVar77 * dVar6;
  dVar43 = dVar77 * dVar7;
  dVar134 = dVar134 * dVar5;
  dVar44 = dVar139 * dVar134;
  dVar99 = dVar142 * dVar96 * dVar5;
  dVar127 = dVar27 * dVar142 * dVar5;
  dVar133 = dVar127 * dVar7;
  dVar100 = dVar99 * dVar7;
  dVar145 = dVar80 * dVar7;
  dVar45 = dVar79 * dVar7;
  dVar46 = dVar16 * dVar90 * dVar7;
  dVar109 = dVar40 * dVar6;
  dVar101 = dVar16 * dVar6;
  dVar130 = dVar7 * dVar109;
  dVar102 = dVar101 * dVar7;
  dVar40 = dVar40 * dVar5;
  dVar103 = dVar139 * dVar40;
  dVar16 = dVar16 * dVar5;
  dVar20 = dVar139 * dVar16;
  dVar84 = dVar16 * dVar11;
  dVar85 = dVar16 * dVar7 * dVar136;
  dVar146 = dVar40 * dVar7 * dVar136;
  dVar21 = dVar157 * dVar7;
  dVar147 = dVar94 * dVar139 * dVar76;
  dVar47 = dVar76 * dVar42 * dVar11;
  dVar48 = dVar42 * dVar7 * dVar136;
  dVar59 = dVar13 * dVar13;
  dVar142 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x18];
  dVar90 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x19];
  dVar156 = dVar134 * dVar11;
  dVar22 = dVar40 * dVar7 * dVar12;
  dVar23 = dVar16 * dVar7 * dVar12;
  dVar86 = dVar42 * dVar7 * dVar12;
  dVar24 = dVar78 * dVar11;
  dVar40 = dVar40 * dVar11;
  dVar110 = dVar42 * dVar139 * dVar76;
  dVar25 = dVar94 * dVar11 * dVar76;
  dVar8 = dVar94 * dVar7 * dVar136;
  dVar120 = dVar3 * dVar3;
  dVar16 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x15];
  dVar38 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x16];
  dVar26 = dVar18 * dVar7 * dVar76;
  dVar39 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x1a];
  dVar148 = dVar1 * dVar96 * dVar5;
  dVar121 = dVar27 * dVar1 * dVar5;
  dVar154 = dVar128 * dVar5;
  dVar96 = dVar97 * dVar5;
  dVar27 = dVar135 * dVar5;
  dVar5 = dVar41 * dVar5;
  dVar128 = dVar128 * dVar6;
  dVar97 = dVar97 * dVar6;
  dVar140 = dVar17 * dVar9 * dVar6;
  dVar150 = dVar10 * dVar9 * dVar6;
  dVar131 = dVar154 * dVar139;
  dVar28 = dVar96 * dVar139;
  dVar29 = dVar96 * dVar11;
  dVar30 = dVar154 * dVar11;
  dVar158 = dVar135 * dVar6 * dVar7;
  dVar144 = dVar41 * dVar6 * dVar7;
  dVar135 = dVar27 * dVar139;
  dVar31 = dVar5 * dVar139;
  dVar32 = dVar5 * dVar11;
  dVar33 = dVar27 * dVar11;
  dVar9 = dVar27 * dVar7 * dVar12;
  dVar10 = dVar5 * dVar7 * dVar12;
  dVar111 = dVar5 * dVar7 * dVar136;
  dVar141 = dVar27 * dVar7 * dVar136;
  dVar87 = dVar76 * dVar11 * dVar140;
  dVar88 = dVar140 * dVar7 * dVar136;
  dVar5 = dVar136 * dVar150 * dVar7;
  dVar89 = dVar150 * dVar7 * dVar12;
  dVar112 = dVar140 * dVar7 * dVar12;
  dVar6 = dVar97 * dVar7 * dVar76;
  dVar17 = dVar139 * dVar150 * dVar76;
  dVar34 = dVar140 * dVar139 * dVar76;
  dVar35 = dVar150 * dVar11 * dVar76;
  dVar36 = dVar16 * dVar16;
  dVar41 = dVar128 * dVar7 * dVar76;
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x14];
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x17];
  dVar49 = dVar90 * dVar90;
  dVar60 = dVar38 * dVar38;
  dVar50 = dVar142 * dVar142;
  local_38 = dVar89 * dVar15 * dVar1 * dVar50 +
             dVar112 * dVar15 * dVar16 * dVar142 * dVar39 +
             dVar14 * dVar112 * dVar1 * dVar142 * dVar90 +
             dVar89 * dVar14 * dVar38 * dVar142 * dVar39 +
             dVar88 * dVar15 * dVar1 * dVar142 * dVar90 +
             dVar5 * dVar15 * dVar16 * dVar90 * dVar39 +
             dVar5 * dVar14 * dVar1 * dVar49 +
             dVar88 * dVar14 * dVar38 * dVar90 * dVar39 +
             dVar87 * dVar15 * dVar1 * dVar50 +
             dVar15 * dVar35 * dVar16 * dVar142 * dVar39 +
             dVar35 * dVar14 * dVar1 * dVar142 * dVar90 +
             dVar87 * dVar14 * dVar38 * dVar142 * dVar39 +
             dVar11 * dVar140 * dVar136 * dVar138 * dVar38 * dVar142 * dVar39 +
             dVar150 * dVar11 * dVar136 * dVar138 * dVar16 * dVar90 * dVar39 +
             dVar17 * dVar15 * dVar1 * dVar142 * dVar90 +
             dVar34 * dVar15 * dVar16 * dVar90 * dVar39 +
             dVar34 * dVar14 * dVar1 * dVar49 +
             dVar17 * dVar14 * dVar38 * dVar90 * dVar39 +
             dVar139 * dVar150 * dVar12 * dVar138 * dVar38 * dVar142 * dVar39 +
             dVar140 * dVar139 * dVar12 * dVar138 * dVar16 * dVar90 * dVar39 +
             dVar95 * dVar15 * dVar27 * dVar50 +
             dVar15 * dVar86 * dVar3 * dVar142 * dVar39 +
             dVar86 * dVar14 * dVar27 * dVar142 * dVar90 +
             dVar95 * dVar14 * dVar13 * dVar142 * dVar39 +
             dVar48 * dVar15 * dVar27 * dVar142 * dVar90 +
             dVar8 * dVar15 * dVar3 * dVar90 * dVar39 +
             dVar8 * dVar14 * dVar27 * dVar49 +
             dVar48 * dVar14 * dVar13 * dVar90 * dVar39 +
             dVar47 * dVar15 * dVar27 * dVar50 +
             dVar15 * dVar25 * dVar3 * dVar142 * dVar39 +
             dVar25 * dVar14 * dVar27 * dVar142 * dVar90 +
             dVar47 * dVar14 * dVar13 * dVar142 * dVar39 +
             dVar42 * dVar11 * dVar136 * dVar138 * dVar13 * dVar142 * dVar39 +
             dVar94 * dVar11 * dVar136 * dVar138 * dVar3 * dVar90 * dVar39 +
             dVar147 * dVar15 * dVar27 * dVar142 * dVar90 +
             dVar110 * dVar15 * dVar3 * dVar90 * dVar39 +
             dVar110 * dVar14 * dVar27 * dVar49 +
             dVar147 * dVar14 * dVar13 * dVar90 * dVar39 +
             dVar94 * dVar139 * dVar12 * dVar138 * dVar13 * dVar142 * dVar39 +
             dVar42 * dVar139 * dVar12 * dVar138 * dVar3 * dVar90 * dVar39 +
             dVar9 * dVar15 * dVar1 * dVar50 +
             dVar15 * dVar10 * dVar16 * dVar142 * dVar39 +
             dVar10 * dVar14 * dVar1 * dVar142 * dVar90 +
             dVar9 * dVar14 * dVar16 * dVar90 * dVar39 +
             dVar111 * dVar15 * dVar1 * dVar142 * dVar90 +
             dVar141 * dVar15 * dVar38 * dVar142 * dVar39 +
             dVar14 * dVar141 * dVar1 * dVar49 +
             dVar14 * dVar111 * dVar38 * dVar90 * dVar39 +
             dVar32 * dVar76 * dVar14 * dVar38 * dVar142 * dVar39 +
             dVar33 * dVar76 * dVar14 * dVar16 * dVar90 * dVar39 +
             dVar12 * dVar32 * dVar138 * dVar1 * dVar50 +
             dVar12 * dVar33 * dVar138 * dVar16 * dVar142 * dVar39 +
             dVar33 * dVar136 * dVar138 * dVar1 * dVar142 * dVar90 +
             dVar32 * dVar136 * dVar138 * dVar38 * dVar142 * dVar39 +
             dVar135 * dVar76 * dVar15 * dVar38 * dVar142 * dVar39 +
             dVar31 * dVar76 * dVar15 * dVar16 * dVar90 * dVar39 +
             dVar135 * dVar12 * dVar138 * dVar1 * dVar142 * dVar90 +
             dVar31 * dVar12 * dVar138 * dVar16 * dVar90 * dVar39 +
             dVar31 * dVar136 * dVar138 * dVar1 * dVar49 +
             dVar135 * dVar136 * dVar138 * dVar38 * dVar90 * dVar39 +
             dVar144 * dVar76 * dVar15 * dVar16 * dVar38 * dVar142 +
             dVar158 * dVar76 * dVar15 * dVar36 * dVar90 +
             dVar158 * dVar76 * dVar14 * dVar60 * dVar142 +
             dVar144 * dVar76 * dVar14 * dVar16 * dVar38 * dVar90 +
             dVar158 * dVar12 * dVar138 * dVar16 * dVar38 * dVar142 +
             dVar144 * dVar12 * dVar138 * dVar36 * dVar90 +
             dVar136 * dVar144 * dVar138 * dVar60 * dVar142 +
             dVar136 * dVar158 * dVar138 * dVar16 * dVar38 * dVar90 +
             dVar21 * dVar76 * dVar15 * dVar3 * dVar38 * dVar142 +
             dVar83 * dVar76 * dVar15 * dVar3 * dVar16 * dVar90 +
             dVar83 * dVar76 * dVar14 * dVar13 * dVar38 * dVar142 +
             dVar21 * dVar76 * dVar14 * dVar13 * dVar16 * dVar90 +
             dVar83 * dVar12 * dVar138 * dVar13 * dVar16 * dVar142 +
             dVar21 * dVar12 * dVar138 * dVar3 * dVar16 * dVar90 +
             dVar21 * dVar136 * dVar138 * dVar13 * dVar38 * dVar142 +
             dVar83 * dVar136 * dVar138 * dVar3 * dVar38 * dVar90 +
             dVar157 * dVar11 * dVar76 * dVar138 * dVar13 * dVar16 * dVar142 +
             dVar82 * dVar11 * dVar76 * dVar138 * dVar3 * dVar38 * dVar142 +
             dVar82 * dVar139 * dVar76 * dVar138 * dVar13 * dVar16 * dVar90 +
             dVar157 * dVar139 * dVar76 * dVar138 * dVar3 * dVar38 * dVar90 +
             dVar22 * dVar15 * dVar27 * dVar50 +
             dVar15 * dVar23 * dVar3 * dVar142 * dVar39 +
             dVar23 * dVar14 * dVar27 * dVar142 * dVar90 +
             dVar22 * dVar14 * dVar3 * dVar90 * dVar39 +
             dVar85 * dVar15 * dVar27 * dVar142 * dVar90 +
             dVar146 * dVar15 * dVar13 * dVar142 * dVar39 +
             dVar14 * dVar146 * dVar27 * dVar49 +
             dVar14 * dVar85 * dVar13 * dVar90 * dVar39 +
             dVar84 * dVar76 * dVar14 * dVar13 * dVar142 * dVar39 +
             dVar40 * dVar76 * dVar14 * dVar3 * dVar90 * dVar39 +
             dVar12 * dVar84 * dVar138 * dVar27 * dVar50 +
             dVar12 * dVar40 * dVar138 * dVar3 * dVar142 * dVar39 +
             dVar40 * dVar136 * dVar138 * dVar27 * dVar142 * dVar90 +
             dVar84 * dVar136 * dVar138 * dVar13 * dVar142 * dVar39 +
             dVar103 * dVar76 * dVar15 * dVar13 * dVar142 * dVar39 +
             dVar20 * dVar76 * dVar15 * dVar3 * dVar90 * dVar39 +
             dVar103 * dVar12 * dVar138 * dVar27 * dVar142 * dVar90 +
             dVar20 * dVar12 * dVar138 * dVar3 * dVar90 * dVar39 +
             dVar136 * dVar20 * dVar138 * dVar27 * dVar49 +
             dVar136 * dVar103 * dVar138 * dVar13 * dVar90 * dVar39 +
             dVar102 * dVar76 * dVar15 * dVar13 * dVar16 * dVar142 +
             dVar15 * dVar130 * dVar76 * dVar3 * dVar16 * dVar90 +
             dVar130 * dVar76 * dVar14 * dVar13 * dVar38 * dVar142 +
             dVar102 * dVar76 * dVar14 * dVar3 * dVar38 * dVar90 +
             dVar130 * dVar12 * dVar138 * dVar3 * dVar38 * dVar142 +
             dVar102 * dVar12 * dVar138 * dVar3 * dVar16 * dVar90 +
             dVar102 * dVar136 * dVar138 * dVar13 * dVar38 * dVar142 +
             dVar130 * dVar136 * dVar138 * dVar13 * dVar16 * dVar90 +
             dVar109 * dVar11 * dVar76 * dVar138 * dVar13 * dVar16 * dVar142 +
             dVar101 * dVar11 * dVar76 * dVar138 * dVar3 * dVar38 * dVar142 +
             dVar101 * dVar139 * dVar76 * dVar138 * dVar13 * dVar16 * dVar90 +
             dVar109 * dVar139 * dVar76 * dVar138 * dVar3 * dVar38 * dVar90 +
             dVar46 * dVar76 * dVar15 * dVar3 * dVar13 * dVar142 +
             dVar81 * dVar76 * dVar15 * dVar120 * dVar90 +
             dVar81 * dVar76 * dVar14 * dVar59 * dVar142 +
             dVar46 * dVar76 * dVar14 * dVar3 * dVar13 * dVar90 +
             dVar81 * dVar12 * dVar138 * dVar3 * dVar13 * dVar142 +
             dVar46 * dVar12 * dVar138 * dVar120 * dVar90 +
             dVar136 * dVar46 * dVar138 * dVar59 * dVar142 +
             dVar136 * dVar81 * dVar138 * dVar3 * dVar13 * dVar90 +
             dVar96 * dVar7 * dVar12 * dVar14 * dVar38 * dVar142 * dVar39 +
             dVar154 * dVar7 * dVar12 * dVar14 * dVar16 * dVar90 * dVar39 +
             dVar154 * dVar7 * dVar136 * dVar15 * dVar38 * dVar142 * dVar39 +
             dVar96 * dVar7 * dVar136 * dVar15 * dVar16 * dVar90 * dVar39 +
             dVar30 * dVar76 * dVar15 * dVar1 * dVar50 +
             dVar29 * dVar76 * dVar15 * dVar16 * dVar142 * dVar39 +
             dVar29 * dVar76 * dVar14 * dVar1 * dVar142 * dVar90 +
             dVar30 * dVar76 * dVar14 * dVar16 * dVar90 * dVar39 +
             dVar29 * dVar12 * dVar138 * dVar1 * dVar50 +
             dVar30 * dVar12 * dVar138 * dVar16 * dVar142 * dVar39 +
             dVar30 * dVar136 * dVar138 * dVar1 * dVar142 * dVar90 +
             dVar29 * dVar136 * dVar138 * dVar16 * dVar90 * dVar39 +
             dVar28 * dVar76 * dVar15 * dVar1 * dVar142 * dVar90 +
             dVar131 * dVar76 * dVar15 * dVar38 * dVar142 * dVar39 +
             dVar131 * dVar76 * dVar14 * dVar1 * dVar49 +
             dVar28 * dVar76 * dVar14 * dVar38 * dVar90 * dVar39 +
             dVar131 * dVar12 * dVar138 * dVar1 * dVar142 * dVar90 +
             dVar28 * dVar12 * dVar138 * dVar38 * dVar142 * dVar39 +
             dVar28 * dVar136 * dVar138 * dVar1 * dVar49 +
             dVar131 * dVar136 * dVar138 * dVar38 * dVar90 * dVar39 +
             dVar6 * dVar15 * dVar16 * dVar38 * dVar142 +
             dVar41 * dVar15 * dVar36 * dVar90 +
             dVar14 * dVar41 * dVar60 * dVar142 +
             dVar14 * dVar6 * dVar16 * dVar38 * dVar90 +
             dVar128 * dVar11 * dVar76 * dVar138 * dVar16 * dVar38 * dVar142 +
             dVar97 * dVar11 * dVar76 * dVar138 * dVar36 * dVar90 +
             dVar139 * dVar97 * dVar76 * dVar138 * dVar60 * dVar142 +
             dVar139 * dVar128 * dVar76 * dVar138 * dVar16 * dVar38 * dVar90 +
             dVar145 * dVar76 * dVar15 * dVar3 * dVar38 * dVar142 +
             dVar45 * dVar76 * dVar15 * dVar3 * dVar16 * dVar90 +
             dVar45 * dVar76 * dVar14 * dVar13 * dVar38 * dVar142 +
             dVar145 * dVar76 * dVar14 * dVar13 * dVar16 * dVar90 +
             dVar12 * dVar145 * dVar138 * dVar13 * dVar16 * dVar142 +
             dVar12 * dVar45 * dVar138 * dVar3 * dVar38 * dVar142 +
             dVar45 * dVar136 * dVar138 * dVar13 * dVar16 * dVar90 +
             dVar145 * dVar136 * dVar138 * dVar3 * dVar38 * dVar90 +
             dVar79 * dVar11 * dVar76 * dVar138 * dVar13 * dVar16 * dVar142 +
             dVar80 * dVar11 * dVar76 * dVar138 * dVar3 * dVar16 * dVar90 +
             dVar80 * dVar139 * dVar76 * dVar138 * dVar13 * dVar38 * dVar142 +
             dVar79 * dVar139 * dVar76 * dVar138 * dVar3 * dVar38 * dVar90 +
             dVar121 * dVar7 * dVar12 * dVar138 * dVar16 * dVar38 * dVar142 +
             dVar148 * dVar7 * dVar12 * dVar138 * dVar36 * dVar90 +
             dVar148 * dVar7 * dVar136 * dVar138 * dVar60 * dVar142 +
             dVar121 * dVar7 * dVar136 * dVar138 * dVar16 * dVar38 * dVar90 +
             dVar148 * dVar11 * dVar76 * dVar138 * dVar16 * dVar38 * dVar142 +
             dVar121 * dVar11 * dVar76 * dVar138 * dVar36 * dVar90 +
             dVar139 * dVar121 * dVar76 * dVar138 * dVar60 * dVar142 +
             dVar139 * dVar148 * dVar76 * dVar138 * dVar16 * dVar38 * dVar90 +
             dVar133 * dVar76 * dVar15 * dVar13 * dVar16 * dVar142 +
             dVar100 * dVar76 * dVar15 * dVar3 * dVar38 * dVar142 +
             dVar14 * dVar100 * dVar76 * dVar13 * dVar16 * dVar90 +
             dVar14 * dVar133 * dVar76 * dVar3 * dVar38 * dVar90 +
             dVar12 * dVar133 * dVar138 * dVar3 * dVar38 * dVar142 +
             dVar12 * dVar100 * dVar138 * dVar3 * dVar16 * dVar90 +
             dVar136 * dVar100 * dVar138 * dVar13 * dVar38 * dVar142 +
             dVar136 * dVar133 * dVar138 * dVar13 * dVar16 * dVar90 +
             dVar99 * dVar11 * dVar76 * dVar138 * dVar13 * dVar16 * dVar142 +
             dVar127 * dVar11 * dVar76 * dVar138 * dVar3 * dVar16 * dVar90 +
             dVar139 * dVar127 * dVar76 * dVar138 * dVar13 * dVar38 * dVar142 +
             dVar139 * dVar99 * dVar76 * dVar138 * dVar3 * dVar38 * dVar90 +
             dVar78 * dVar7 * dVar12 * dVar14 * dVar13 * dVar142 * dVar39 +
             dVar134 * dVar7 * dVar12 * dVar14 * dVar3 * dVar90 * dVar39 +
             dVar134 * dVar7 * dVar136 * dVar15 * dVar13 * dVar142 * dVar39 +
             dVar78 * dVar7 * dVar136 * dVar15 * dVar3 * dVar90 * dVar39 +
             dVar156 * dVar76 * dVar15 * dVar27 * dVar50 +
             dVar24 * dVar76 * dVar15 * dVar3 * dVar142 * dVar39 +
             dVar24 * dVar76 * dVar14 * dVar27 * dVar142 * dVar90 +
             dVar156 * dVar76 * dVar14 * dVar3 * dVar90 * dVar39 +
             dVar24 * dVar12 * dVar138 * dVar27 * dVar50 +
             dVar156 * dVar12 * dVar138 * dVar3 * dVar142 * dVar39 +
             dVar156 * dVar136 * dVar138 * dVar27 * dVar142 * dVar90 +
             dVar24 * dVar136 * dVar138 * dVar3 * dVar90 * dVar39 +
             dVar98 * dVar76 * dVar15 * dVar27 * dVar142 * dVar90 +
             dVar44 * dVar76 * dVar15 * dVar13 * dVar142 * dVar39 +
             dVar44 * dVar76 * dVar14 * dVar27 * dVar49 +
             dVar98 * dVar76 * dVar14 * dVar13 * dVar90 * dVar39 +
             dVar44 * dVar12 * dVar138 * dVar27 * dVar142 * dVar90 +
             dVar98 * dVar12 * dVar138 * dVar13 * dVar142 * dVar39 +
             dVar136 * dVar98 * dVar138 * dVar27 * dVar49 +
             dVar136 * dVar44 * dVar138 * dVar13 * dVar90 * dVar39 +
             dVar43 * dVar76 * dVar15 * dVar13 * dVar16 * dVar142 +
             dVar15 * dVar129 * dVar76 * dVar3 * dVar16 * dVar90 +
             dVar129 * dVar76 * dVar14 * dVar13 * dVar38 * dVar142 +
             dVar43 * dVar76 * dVar14 * dVar3 * dVar38 * dVar90 +
             dVar129 * dVar12 * dVar138 * dVar13 * dVar16 * dVar142 +
             dVar43 * dVar12 * dVar138 * dVar3 * dVar38 * dVar142 +
             dVar43 * dVar136 * dVar138 * dVar13 * dVar16 * dVar90 +
             dVar129 * dVar136 * dVar138 * dVar3 * dVar38 * dVar90 +
             dVar108 * dVar11 * dVar76 * dVar138 * dVar3 * dVar38 * dVar142 +
             dVar77 * dVar11 * dVar76 * dVar138 * dVar3 * dVar16 * dVar90 +
             dVar77 * dVar139 * dVar76 * dVar138 * dVar13 * dVar38 * dVar142 +
             dVar108 * dVar139 * dVar76 * dVar138 * dVar13 * dVar16 * dVar90 +
             dVar105 * dVar15 * dVar3 * dVar13 * dVar142 +
             dVar26 * dVar15 * dVar120 * dVar90 +
             dVar14 * dVar26 * dVar59 * dVar142 +
             dVar14 * dVar105 * dVar3 * dVar13 * dVar90 +
             dVar18 * dVar11 * dVar76 * dVar138 * dVar3 * dVar13 * dVar142 +
             dVar19 * dVar11 * dVar76 * dVar138 * dVar120 * dVar90 +
             dVar139 * dVar19 * dVar76 * dVar138 * dVar59 * dVar142 +
             dVar139 * dVar18 * dVar76 * dVar138 * dVar3 * dVar13 * dVar90 +
             dVar107 * dVar76 * dVar15 * dVar13 * dVar16 * dVar142 +
             dVar119 * dVar76 * dVar15 * dVar3 * dVar38 * dVar142 +
             dVar119 * dVar76 * dVar14 * dVar13 * dVar16 * dVar90 +
             dVar107 * dVar76 * dVar14 * dVar3 * dVar38 * dVar90 +
             dVar12 * dVar119 * dVar138 * dVar13 * dVar16 * dVar142 +
             dVar12 * dVar107 * dVar138 * dVar3 * dVar16 * dVar90 +
             dVar107 * dVar136 * dVar138 * dVar13 * dVar38 * dVar142 +
             dVar119 * dVar136 * dVar138 * dVar3 * dVar38 * dVar90 +
             dVar106 * dVar11 * dVar76 * dVar138 * dVar3 * dVar38 * dVar142 +
             dVar118 * dVar11 * dVar76 * dVar138 * dVar3 * dVar16 * dVar90 +
             dVar139 * dVar118 * dVar76 * dVar138 * dVar13 * dVar38 * dVar142 +
             dVar139 * dVar106 * dVar76 * dVar138 * dVar13 * dVar16 * dVar90 +
             dVar117 * dVar2 * dVar12 * dVar138 * dVar3 * dVar13 * dVar142 +
             dVar58 * dVar2 * dVar12 * dVar138 * dVar120 * dVar90 +
             dVar58 * dVar2 * dVar136 * dVar138 * dVar59 * dVar142 +
             dVar117 * dVar2 * dVar136 * dVar138 * dVar3 * dVar13 * dVar90 +
             dVar58 * dVar11 * dVar37 * dVar138 * dVar3 * dVar13 * dVar142 +
             dVar117 * dVar11 * dVar37 * dVar138 * dVar120 * dVar90 +
             dVar58 * dVar139 * dVar37 * dVar138 * dVar3 * dVar13 * dVar90 +
             dVar117 * dVar139 * dVar37 * dVar138 * dVar59 * dVar142;
  local_30.m_xpr = __return_storage_ptr__;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (&local_30,&local_38);
  dVar142 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar90 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[7];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0];
  dVar136 = -dVar27;
  dVar122 = dVar142 * dVar136 * dVar90;
  dVar157 = dVar27 * dVar142 * dVar90;
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xb];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [8];
  dVar14 = dVar27 * dVar142 * dVar2;
  dVar15 = dVar142 * dVar136 * dVar2;
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [4];
  dVar41 = dVar27 * dVar9;
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[6];
  dVar61 = dVar41 * dVar10;
  dVar18 = dVar9 * dVar136;
  dVar123 = dVar18 * dVar10;
  dVar16 = dVar41 * dVar90 * dVar1;
  dVar38 = dVar18 * dVar90 * dVar1;
  dVar41 = dVar41 * dVar2;
  dVar18 = dVar18 * dVar2;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [5];
  dVar27 = dVar27 * dVar5;
  dVar43 = dVar27 * dVar10;
  dVar139 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[9];
  dVar39 = dVar139 * dVar43;
  dVar136 = dVar136 * dVar5;
  dVar48 = dVar136 * dVar10;
  dVar45 = dVar27 * dVar90;
  dVar76 = dVar136 * dVar90;
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[1];
  dVar20 = -dVar138;
  dVar6 = dVar142 * dVar20;
  dVar59 = dVar6 * dVar10 * dVar1;
  dVar19 = dVar138 * dVar142;
  dVar60 = dVar19 * dVar10 * dVar1;
  dVar94 = dVar6 * dVar90;
  dVar78 = dVar19 * dVar90;
  dVar6 = dVar6 * dVar2;
  dVar19 = dVar19 * dVar2;
  dVar158 = dVar138 * dVar9 * dVar10;
  dVar95 = dVar9 * dVar20 * dVar10;
  dVar79 = dVar138 * dVar9 * dVar2;
  dVar151 = dVar9 * dVar20 * dVar2;
  dVar138 = dVar138 * dVar5;
  dVar49 = dVar138 * dVar10;
  dVar20 = dVar20 * dVar5;
  dVar7 = dVar20 * dVar10;
  dVar58 = dVar138 * dVar90;
  dVar105 = dVar139 * dVar58;
  dVar80 = dVar20 * dVar90;
  dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [2];
  dVar37 = -dVar3;
  dVar11 = dVar3 * dVar142;
  dVar142 = dVar142 * dVar37;
  dVar127 = dVar142 * dVar10;
  dVar81 = dVar11 * dVar10;
  dVar23 = dVar142 * dVar90;
  dVar133 = dVar11 * dVar90;
  dVar13 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[10];
  dVar82 = dVar13 * dVar133;
  dVar83 = dVar13 * dVar23;
  dVar29 = dVar3 * dVar9;
  dVar9 = dVar9 * dVar37;
  dVar28 = dVar9 * dVar10;
  dVar96 = dVar29 * dVar10;
  dVar84 = dVar13 * dVar96;
  dVar85 = dVar13 * dVar28;
  dVar51 = dVar9 * dVar90;
  dVar86 = dVar139 * dVar51;
  dVar87 = dVar29 * dVar90;
  dVar50 = dVar37 * dVar5 * dVar10;
  dVar10 = dVar10 * dVar3 * dVar5;
  dVar62 = dVar37 * dVar5 * dVar90;
  dVar90 = dVar3 * dVar5 * dVar90;
  dVar145 = dVar18 * dVar13;
  dVar146 = dVar41 * dVar13;
  dVar63 = dVar48 * dVar13;
  dVar147 = dVar43 * dVar13;
  dVar156 = dVar76 * dVar13;
  dVar40 = dVar45 * dVar13;
  dVar8 = dVar27 * dVar2 * dVar13;
  dVar104 = dVar139 * dVar136 * dVar2;
  dVar113 = dVar136 * dVar2 * dVar13;
  dVar88 = dVar19 * dVar13;
  dVar89 = dVar6 * dVar13;
  dVar97 = dVar49 * dVar13;
  dVar98 = dVar7 * dVar13;
  dVar17 = dVar80 * dVar13;
  dVar99 = dVar58 * dVar13;
  dVar149 = dVar138 * dVar2 * dVar13;
  dVar152 = dVar20 * dVar2 * dVar13;
  dVar159 = dVar81 * dVar13;
  dVar100 = dVar127 * dVar13;
  dVar155 = dVar142 * dVar2 * dVar13;
  dVar114 = dVar139 * dVar11 * dVar2;
  dVar52 = dVar11 * dVar2 * dVar13;
  dVar53 = dVar87 * dVar13;
  dVar54 = dVar51 * dVar13;
  dVar55 = dVar9 * dVar2 * dVar13;
  dVar56 = dVar29 * dVar2 * dVar13;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xe];
  dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x11];
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x12];
  dVar37 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x13];
  dVar136 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xc];
  dVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xd];
  dVar101 = dVar15 * dVar1 * dVar12;
  dVar102 = dVar14 * dVar1 * dVar12;
  dVar124 = dVar41 * dVar139;
  dVar103 = dVar18 * dVar139;
  dVar106 = dVar136 * dVar41 * dVar1;
  dVar125 = dVar136 * dVar18 * dVar1;
  dVar91 = dVar41 * dVar1 * dVar12;
  dVar107 = dVar18 * dVar1 * dVar12;
  dVar108 = dVar48 * dVar139;
  dVar134 = dVar43 * dVar1 * dVar12;
  dVar109 = dVar48 * dVar1 * dVar12;
  dVar64 = dVar45 * dVar139;
  dVar65 = dVar76 * dVar139;
  dVar110 = dVar45 * dVar1 * dVar12;
  dVar111 = dVar76 * dVar1 * dVar12;
  dVar66 = dVar27 * dVar2 * dVar139;
  dVar67 = dVar6 * dVar139;
  dVar112 = dVar19 * dVar139;
  dVar117 = dVar136 * dVar19 * dVar1;
  dVar92 = dVar136 * dVar6 * dVar1;
  dVar118 = dVar6 * dVar1 * dVar12;
  dVar68 = dVar19 * dVar1 * dVar12;
  dVar119 = dVar151 * dVar1 * dVar12;
  dVar120 = dVar79 * dVar1 * dVar12;
  dVar69 = dVar49 * dVar139;
  dVar70 = dVar7 * dVar139;
  dVar121 = dVar49 * dVar1 * dVar12;
  dVar128 = dVar7 * dVar1 * dVar12;
  dVar129 = dVar80 * dVar139;
  dVar41 = dVar58 * dVar1 * dVar12;
  dVar18 = dVar80 * dVar1 * dVar12;
  dVar19 = dVar20 * dVar2 * dVar139;
  dVar130 = dVar138 * dVar2 * dVar139;
  dVar20 = dVar127 * dVar139;
  dVar131 = dVar81 * dVar139;
  dVar21 = dVar23 * dVar139;
  dVar22 = dVar133 * dVar139;
  dVar140 = dVar136 * dVar133 * dVar1;
  dVar71 = dVar136 * dVar23 * dVar1;
  dVar141 = dVar23 * dVar1 * dVar12;
  dVar133 = dVar133 * dVar1 * dVar12;
  dVar23 = dVar142 * dVar2 * dVar139;
  dVar24 = dVar28 * dVar139;
  dVar25 = dVar96 * dVar139;
  dVar26 = dVar136 * dVar28 * dVar1;
  dVar72 = dVar136 * dVar96 * dVar1;
  dVar96 = dVar96 * dVar1 * dVar12;
  dVar144 = dVar28 * dVar1 * dVar12;
  dVar28 = dVar87 * dVar139;
  dVar29 = dVar29 * dVar2 * dVar139;
  dVar148 = dVar9 * dVar2 * dVar139;
  dVar30 = dVar50 * dVar139 * dVar12;
  dVar135 = dVar10 * dVar139 * dVar12;
  dVar31 = dVar62 * dVar139 * dVar12;
  dVar137 = dVar139 * dVar90 * dVar12;
  dVar73 = dVar15 * dVar139 * dVar5;
  dVar93 = dVar14 * dVar139 * dVar5;
  dVar142 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xf];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x10];
  dVar32 = dVar15 * dVar13 * dVar5;
  dVar33 = dVar123 * dVar1 * dVar5;
  dVar74 = dVar61 * dVar1 * dVar5;
  dVar34 = dVar78 * dVar1 * dVar5;
  dVar143 = dVar94 * dVar1 * dVar5;
  dVar35 = dVar151 * dVar139 * dVar5;
  dVar36 = dVar79 * dVar139 * dVar5;
  dVar42 = dVar151 * dVar13 * dVar5;
  dVar132 = dVar5 * dVar14 * dVar13;
  dVar160 = dVar14 * dVar1 * dVar136;
  dVar77 = dVar15 * dVar1 * dVar136;
  dVar43 = dVar43 * dVar1 * dVar136;
  dVar44 = dVar76 * dVar1 * dVar136;
  dVar45 = dVar45 * dVar1 * dVar136;
  dVar46 = dVar7 * dVar1 * dVar136;
  dVar47 = dVar10 * dVar13 * dVar136;
  dVar153 = dVar37 * dVar37;
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x16];
  dVar48 = dVar48 * dVar1 * dVar136;
  dVar150 = dVar49 * dVar1 * dVar136;
  dVar49 = dVar50 * dVar13 * dVar136;
  dVar126 = dVar11 * dVar11;
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x15];
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x14];
  dVar57 = dVar5 * dVar79 * dVar13;
  dVar50 = dVar151 * dVar1 * dVar136;
  dVar58 = dVar58 * dVar1 * dVar136;
  dVar75 = dVar9 * dVar9;
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x17];
  dVar76 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x19];
  dVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x18];
  dVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x1a];
  dVar115 = dVar79 * dVar1 * dVar136;
  dVar116 = dVar2 * dVar2;
  dVar154 = dVar90 * dVar13 * dVar136;
  dVar80 = dVar80 * dVar1 * dVar136;
  dVar62 = dVar62 * dVar13 * dVar136;
  dVar90 = dVar7 * dVar7;
  local_40 = dVar154 * dVar27 * dVar138 * dVar6 * dVar7 +
             dVar62 * dVar27 * dVar9 * dVar90 +
             dVar142 * dVar62 * dVar138 * dVar76 * dVar7 +
             dVar154 * dVar142 * dVar2 * dVar90 +
             dVar31 * dVar27 * dVar138 * dVar6 * dVar7 +
             dVar137 * dVar27 * dVar9 * dVar90 +
             dVar137 * dVar142 * dVar138 * dVar76 * dVar7 +
             dVar31 * dVar142 * dVar2 * dVar90 +
             dVar47 * dVar27 * dVar10 * dVar6 * dVar7 +
             dVar49 * dVar27 * dVar11 * dVar90 +
             dVar49 * dVar142 * dVar10 * dVar76 * dVar7 +
             dVar47 * dVar142 * dVar37 * dVar90 +
             dVar30 * dVar27 * dVar10 * dVar6 * dVar7 +
             dVar135 * dVar27 * dVar11 * dVar90 +
             dVar135 * dVar142 * dVar10 * dVar76 * dVar7 +
             dVar142 * dVar30 * dVar37 * dVar90 +
             dVar55 * dVar12 * dVar142 * dVar138 * dVar6 * dVar7 +
             dVar56 * dVar12 * dVar142 * dVar9 * dVar90 +
             dVar56 * dVar136 * dVar142 * dVar138 * dVar76 * dVar7 +
             dVar55 * dVar136 * dVar142 * dVar2 * dVar90 +
             dVar29 * dVar12 * dVar27 * dVar138 * dVar6 * dVar7 +
             dVar148 * dVar12 * dVar27 * dVar9 * dVar90 +
             dVar148 * dVar136 * dVar27 * dVar138 * dVar76 * dVar7 +
             dVar136 * dVar29 * dVar27 * dVar2 * dVar90 +
             dVar87 * dVar1 * dVar12 * dVar142 * dVar2 * dVar138 * dVar6 +
             dVar51 * dVar1 * dVar12 * dVar142 * dVar9 * dVar138 * dVar76 +
             dVar51 * dVar1 * dVar136 * dVar27 * dVar2 * dVar138 * dVar6 +
             dVar87 * dVar1 * dVar136 * dVar27 * dVar9 * dVar138 * dVar76 +
             dVar54 * dVar5 * dVar27 * dVar9 * dVar138 * dVar6 +
             dVar53 * dVar5 * dVar27 * dVar75 * dVar7 +
             dVar53 * dVar5 * dVar142 * dVar2 * dVar138 * dVar6 +
             dVar54 * dVar5 * dVar142 * dVar9 * dVar2 * dVar7 +
             dVar53 * dVar12 * dVar3 * dVar9 * dVar138 * dVar6 +
             dVar54 * dVar12 * dVar3 * dVar75 * dVar7 +
             dVar54 * dVar136 * dVar3 * dVar2 * dVar138 * dVar6 +
             dVar53 * dVar136 * dVar3 * dVar9 * dVar2 * dVar7 +
             dVar28 * dVar5 * dVar27 * dVar9 * dVar138 * dVar76 +
             dVar86 * dVar5 * dVar27 * dVar9 * dVar2 * dVar7 +
             dVar86 * dVar5 * dVar142 * dVar2 * dVar138 * dVar76 +
             dVar28 * dVar5 * dVar142 * dVar116 * dVar7 +
             dVar86 * dVar12 * dVar3 * dVar9 * dVar138 * dVar76 +
             dVar28 * dVar12 * dVar3 * dVar9 * dVar2 * dVar7 +
             dVar28 * dVar136 * dVar3 * dVar2 * dVar138 * dVar76 +
             dVar136 * dVar86 * dVar3 * dVar116 * dVar7 +
             dVar96 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar144 * dVar27 * dVar11 * dVar138 * dVar6 +
             dVar142 * dVar144 * dVar10 * dVar9 * dVar76 +
             dVar142 * dVar96 * dVar37 * dVar138 * dVar6 +
             dVar26 * dVar27 * dVar10 * dVar2 * dVar6 +
             dVar72 * dVar27 * dVar11 * dVar138 * dVar76 +
             dVar142 * dVar72 * dVar10 * dVar2 * dVar76 +
             dVar142 * dVar26 * dVar37 * dVar138 * dVar76 +
             dVar85 * dVar5 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar84 * dVar5 * dVar27 * dVar11 * dVar9 * dVar7 +
             dVar142 * dVar84 * dVar5 * dVar10 * dVar2 * dVar6 +
             dVar142 * dVar85 * dVar5 * dVar37 * dVar9 * dVar7 +
             dVar12 * dVar84 * dVar3 * dVar11 * dVar138 * dVar6 +
             dVar12 * dVar85 * dVar3 * dVar11 * dVar9 * dVar7 +
             dVar85 * dVar136 * dVar3 * dVar37 * dVar138 * dVar6 +
             dVar84 * dVar136 * dVar3 * dVar11 * dVar2 * dVar7 +
             dVar25 * dVar5 * dVar27 * dVar10 * dVar9 * dVar76 +
             dVar24 * dVar5 * dVar27 * dVar11 * dVar2 * dVar7 +
             dVar142 * dVar24 * dVar5 * dVar10 * dVar2 * dVar76 +
             dVar142 * dVar25 * dVar5 * dVar37 * dVar2 * dVar7 +
             dVar12 * dVar25 * dVar3 * dVar37 * dVar9 * dVar7 +
             dVar12 * dVar24 * dVar3 * dVar11 * dVar138 * dVar76 +
             dVar25 * dVar136 * dVar3 * dVar37 * dVar138 * dVar76 +
             dVar24 * dVar136 * dVar3 * dVar37 * dVar2 * dVar7 +
             dVar155 * dVar12 * dVar142 * dVar10 * dVar6 * dVar7 +
             dVar52 * dVar12 * dVar142 * dVar11 * dVar90 +
             dVar52 * dVar136 * dVar142 * dVar10 * dVar76 * dVar7 +
             dVar155 * dVar136 * dVar142 * dVar37 * dVar90 +
             dVar114 * dVar12 * dVar27 * dVar10 * dVar6 * dVar7 +
             dVar23 * dVar12 * dVar27 * dVar11 * dVar90 +
             dVar23 * dVar136 * dVar27 * dVar10 * dVar76 * dVar7 +
             dVar136 * dVar114 * dVar27 * dVar37 * dVar90 +
             dVar141 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar133 * dVar27 * dVar11 * dVar138 * dVar6 +
             dVar142 * dVar133 * dVar10 * dVar2 * dVar6 +
             dVar142 * dVar141 * dVar11 * dVar138 * dVar76 +
             dVar140 * dVar27 * dVar10 * dVar9 * dVar76 +
             dVar71 * dVar27 * dVar37 * dVar138 * dVar6 +
             dVar142 * dVar71 * dVar10 * dVar2 * dVar76 +
             dVar142 * dVar140 * dVar37 * dVar138 * dVar76 +
             dVar83 * dVar5 * dVar27 * dVar11 * dVar138 * dVar6 +
             dVar82 * dVar5 * dVar27 * dVar11 * dVar9 * dVar7 +
             dVar142 * dVar82 * dVar5 * dVar37 * dVar138 * dVar6 +
             dVar142 * dVar83 * dVar5 * dVar11 * dVar2 * dVar7 +
             dVar12 * dVar82 * dVar3 * dVar10 * dVar9 * dVar6 +
             dVar12 * dVar83 * dVar3 * dVar11 * dVar9 * dVar7 +
             dVar136 * dVar83 * dVar3 * dVar10 * dVar2 * dVar6 +
             dVar136 * dVar82 * dVar3 * dVar37 * dVar9 * dVar7 +
             dVar21 * dVar5 * dVar27 * dVar37 * dVar9 * dVar7 +
             dVar22 * dVar5 * dVar27 * dVar11 * dVar138 * dVar76 +
             dVar142 * dVar21 * dVar5 * dVar37 * dVar138 * dVar76 +
             dVar142 * dVar22 * dVar5 * dVar37 * dVar2 * dVar7 +
             dVar12 * dVar21 * dVar3 * dVar10 * dVar9 * dVar76 +
             dVar12 * dVar22 * dVar3 * dVar11 * dVar2 * dVar7 +
             dVar136 * dVar22 * dVar3 * dVar10 * dVar2 * dVar76 +
             dVar136 * dVar21 * dVar3 * dVar37 * dVar2 * dVar7 +
             dVar81 * dVar1 * dVar12 * dVar142 * dVar37 * dVar10 * dVar6 +
             dVar127 * dVar1 * dVar12 * dVar142 * dVar11 * dVar10 * dVar76 +
             dVar127 * dVar1 * dVar136 * dVar27 * dVar37 * dVar10 * dVar6 +
             dVar81 * dVar1 * dVar136 * dVar27 * dVar11 * dVar10 * dVar76 +
             dVar100 * dVar5 * dVar27 * dVar11 * dVar10 * dVar6 +
             dVar159 * dVar5 * dVar27 * dVar126 * dVar7 +
             dVar159 * dVar5 * dVar142 * dVar37 * dVar10 * dVar6 +
             dVar100 * dVar5 * dVar142 * dVar11 * dVar37 * dVar7 +
             dVar159 * dVar12 * dVar3 * dVar11 * dVar10 * dVar6 +
             dVar100 * dVar12 * dVar3 * dVar126 * dVar7 +
             dVar100 * dVar136 * dVar3 * dVar37 * dVar10 * dVar6 +
             dVar159 * dVar136 * dVar3 * dVar11 * dVar37 * dVar7 +
             dVar131 * dVar5 * dVar27 * dVar11 * dVar10 * dVar76 +
             dVar20 * dVar5 * dVar27 * dVar11 * dVar37 * dVar7 +
             dVar20 * dVar5 * dVar142 * dVar37 * dVar10 * dVar76 +
             dVar131 * dVar5 * dVar142 * dVar153 * dVar7 +
             dVar20 * dVar12 * dVar3 * dVar11 * dVar10 * dVar76 +
             dVar131 * dVar12 * dVar3 * dVar11 * dVar37 * dVar7 +
             dVar131 * dVar136 * dVar3 * dVar37 * dVar10 * dVar76 +
             dVar20 * dVar136 * dVar3 * dVar153 * dVar7 +
             dVar149 * dVar12 * dVar142 * dVar138 * dVar6 * dVar7 +
             dVar152 * dVar12 * dVar142 * dVar9 * dVar90 +
             dVar152 * dVar136 * dVar27 * dVar138 * dVar6 * dVar7 +
             dVar149 * dVar136 * dVar27 * dVar9 * dVar90 +
             dVar19 * dVar12 * dVar142 * dVar138 * dVar76 * dVar7 +
             dVar130 * dVar12 * dVar142 * dVar2 * dVar90 +
             dVar130 * dVar136 * dVar27 * dVar138 * dVar76 * dVar7 +
             dVar19 * dVar136 * dVar27 * dVar2 * dVar90 +
             dVar41 * dVar27 * dVar9 * dVar138 * dVar6 +
             dVar18 * dVar27 * dVar75 * dVar7 +
             dVar142 * dVar18 * dVar2 * dVar138 * dVar6 +
             dVar142 * dVar41 * dVar9 * dVar2 * dVar7 +
             dVar80 * dVar27 * dVar9 * dVar138 * dVar76 +
             dVar58 * dVar27 * dVar9 * dVar2 * dVar7 +
             dVar58 * dVar142 * dVar2 * dVar138 * dVar76 +
             dVar142 * dVar80 * dVar116 * dVar7 +
             dVar17 * dVar5 * dVar142 * dVar2 * dVar138 * dVar6 +
             dVar99 * dVar5 * dVar142 * dVar9 * dVar138 * dVar76 +
             dVar17 * dVar12 * dVar3 * dVar9 * dVar138 * dVar6 +
             dVar12 * dVar99 * dVar3 * dVar75 * dVar7 +
             dVar136 * dVar99 * dVar3 * dVar9 * dVar138 * dVar76 +
             dVar136 * dVar17 * dVar3 * dVar9 * dVar2 * dVar7 +
             dVar105 * dVar5 * dVar27 * dVar2 * dVar138 * dVar6 +
             dVar129 * dVar5 * dVar27 * dVar9 * dVar138 * dVar76 +
             dVar105 * dVar12 * dVar3 * dVar2 * dVar138 * dVar6 +
             dVar129 * dVar12 * dVar3 * dVar9 * dVar2 * dVar7 +
             dVar129 * dVar136 * dVar3 * dVar2 * dVar138 * dVar76 +
             dVar136 * dVar105 * dVar3 * dVar116 * dVar7 +
             dVar121 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar27 * dVar128 * dVar11 * dVar9 * dVar7 +
             dVar128 * dVar142 * dVar10 * dVar2 * dVar6 +
             dVar121 * dVar142 * dVar37 * dVar9 * dVar7 +
             dVar46 * dVar27 * dVar10 * dVar9 * dVar76 +
             dVar27 * dVar150 * dVar11 * dVar2 * dVar7 +
             dVar150 * dVar142 * dVar10 * dVar2 * dVar76 +
             dVar46 * dVar142 * dVar37 * dVar2 * dVar7 +
             dVar98 * dVar5 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar97 * dVar5 * dVar27 * dVar11 * dVar138 * dVar6 +
             dVar142 * dVar97 * dVar5 * dVar10 * dVar9 * dVar76 +
             dVar142 * dVar98 * dVar5 * dVar37 * dVar138 * dVar6 +
             dVar12 * dVar98 * dVar3 * dVar11 * dVar138 * dVar6 +
             dVar12 * dVar97 * dVar3 * dVar11 * dVar9 * dVar7 +
             dVar136 * dVar98 * dVar3 * dVar37 * dVar9 * dVar7 +
             dVar136 * dVar97 * dVar3 * dVar11 * dVar138 * dVar76 +
             dVar69 * dVar5 * dVar27 * dVar10 * dVar2 * dVar6 +
             dVar27 * dVar70 * dVar5 * dVar11 * dVar138 * dVar76 +
             dVar70 * dVar5 * dVar142 * dVar10 * dVar2 * dVar76 +
             dVar69 * dVar5 * dVar142 * dVar37 * dVar138 * dVar76 +
             dVar12 * dVar69 * dVar3 * dVar37 * dVar138 * dVar6 +
             dVar12 * dVar70 * dVar3 * dVar11 * dVar2 * dVar7 +
             dVar70 * dVar136 * dVar3 * dVar37 * dVar138 * dVar76 +
             dVar69 * dVar136 * dVar3 * dVar37 * dVar2 * dVar7 +
             dVar119 * dVar27 * dVar9 * dVar138 * dVar6 +
             dVar120 * dVar27 * dVar75 * dVar7 +
             dVar142 * dVar120 * dVar9 * dVar138 * dVar76 +
             dVar142 * dVar119 * dVar9 * dVar2 * dVar7 +
             dVar115 * dVar27 * dVar2 * dVar138 * dVar6 +
             dVar50 * dVar27 * dVar9 * dVar2 * dVar7 +
             dVar50 * dVar142 * dVar2 * dVar138 * dVar76 +
             dVar115 * dVar142 * dVar116 * dVar7 +
             dVar57 * dVar27 * dVar9 * dVar138 * dVar6 +
             dVar42 * dVar27 * dVar75 * dVar7 +
             dVar142 * dVar42 * dVar9 * dVar138 * dVar76 +
             dVar142 * dVar57 * dVar9 * dVar2 * dVar7 +
             dVar79 * dVar13 * dVar136 * dVar3 * dVar2 * dVar138 * dVar6 +
             dVar151 * dVar13 * dVar136 * dVar3 * dVar9 * dVar138 * dVar76 +
             dVar35 * dVar27 * dVar2 * dVar138 * dVar6 +
             dVar36 * dVar27 * dVar9 * dVar2 * dVar7 +
             dVar36 * dVar142 * dVar2 * dVar138 * dVar76 +
             dVar35 * dVar142 * dVar116 * dVar7 +
             dVar151 * dVar139 * dVar12 * dVar3 * dVar2 * dVar138 * dVar6 +
             dVar79 * dVar139 * dVar12 * dVar3 * dVar9 * dVar138 * dVar76 +
             dVar95 * dVar1 * dVar12 * dVar3 * dVar37 * dVar75 +
             dVar158 * dVar1 * dVar12 * dVar3 * dVar11 * dVar9 * dVar2 +
             dVar158 * dVar1 * dVar136 * dVar3 * dVar37 * dVar9 * dVar2 +
             dVar95 * dVar1 * dVar136 * dVar3 * dVar11 * dVar116 +
             dVar158 * dVar13 * dVar5 * dVar3 * dVar37 * dVar75 +
             dVar95 * dVar13 * dVar5 * dVar3 * dVar11 * dVar9 * dVar2 +
             dVar95 * dVar139 * dVar5 * dVar3 * dVar37 * dVar9 * dVar2 +
             dVar139 * dVar158 * dVar5 * dVar3 * dVar11 * dVar116 +
             dVar118 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar68 * dVar27 * dVar11 * dVar9 * dVar7 +
             dVar142 * dVar68 * dVar10 * dVar9 * dVar76 +
             dVar142 * dVar118 * dVar11 * dVar2 * dVar7 +
             dVar117 * dVar27 * dVar10 * dVar2 * dVar6 +
             dVar92 * dVar27 * dVar37 * dVar9 * dVar7 +
             dVar142 * dVar92 * dVar10 * dVar2 * dVar76 +
             dVar142 * dVar117 * dVar37 * dVar2 * dVar7 +
             dVar88 * dVar5 * dVar27 * dVar11 * dVar138 * dVar6 +
             dVar89 * dVar5 * dVar27 * dVar11 * dVar9 * dVar7 +
             dVar142 * dVar88 * dVar5 * dVar37 * dVar9 * dVar7 +
             dVar142 * dVar89 * dVar5 * dVar11 * dVar138 * dVar76 +
             dVar12 * dVar88 * dVar3 * dVar10 * dVar9 * dVar6 +
             dVar12 * dVar89 * dVar3 * dVar11 * dVar138 * dVar6 +
             dVar136 * dVar89 * dVar3 * dVar10 * dVar9 * dVar76 +
             dVar136 * dVar88 * dVar3 * dVar37 * dVar138 * dVar6 +
             dVar67 * dVar5 * dVar27 * dVar37 * dVar138 * dVar6 +
             dVar112 * dVar5 * dVar27 * dVar11 * dVar2 * dVar7 +
             dVar112 * dVar5 * dVar142 * dVar37 * dVar138 * dVar76 +
             dVar67 * dVar5 * dVar142 * dVar37 * dVar2 * dVar7 +
             dVar67 * dVar12 * dVar3 * dVar10 * dVar2 * dVar6 +
             dVar112 * dVar12 * dVar3 * dVar11 * dVar138 * dVar76 +
             dVar112 * dVar136 * dVar3 * dVar10 * dVar2 * dVar76 +
             dVar67 * dVar136 * dVar3 * dVar37 * dVar138 * dVar76 +
             dVar34 * dVar27 * dVar37 * dVar75 +
             dVar143 * dVar27 * dVar11 * dVar9 * dVar2 +
             dVar143 * dVar142 * dVar37 * dVar9 * dVar2 +
             dVar34 * dVar142 * dVar11 * dVar116 +
             dVar94 * dVar13 * dVar5 * dVar3 * dVar37 * dVar75 +
             dVar78 * dVar13 * dVar5 * dVar3 * dVar11 * dVar9 * dVar2 +
             dVar78 * dVar139 * dVar5 * dVar3 * dVar37 * dVar9 * dVar2 +
             dVar94 * dVar139 * dVar5 * dVar3 * dVar11 * dVar116 +
             dVar60 * dVar5 * dVar27 * dVar11 * dVar37 * dVar9 +
             dVar59 * dVar5 * dVar27 * dVar126 * dVar2 +
             dVar59 * dVar5 * dVar142 * dVar153 * dVar9 +
             dVar60 * dVar5 * dVar142 * dVar11 * dVar37 * dVar2 +
             dVar59 * dVar12 * dVar3 * dVar11 * dVar37 * dVar9 +
             dVar60 * dVar12 * dVar3 * dVar126 * dVar2 +
             dVar60 * dVar136 * dVar3 * dVar153 * dVar9 +
             dVar59 * dVar136 * dVar3 * dVar11 * dVar37 * dVar2 +
             dVar8 * dVar12 * dVar142 * dVar10 * dVar6 * dVar7 +
             dVar113 * dVar12 * dVar142 * dVar11 * dVar90 +
             dVar113 * dVar136 * dVar27 * dVar10 * dVar6 * dVar7 +
             dVar8 * dVar136 * dVar27 * dVar11 * dVar90 +
             dVar104 * dVar12 * dVar142 * dVar10 * dVar76 * dVar7 +
             dVar66 * dVar12 * dVar142 * dVar37 * dVar90 +
             dVar66 * dVar136 * dVar27 * dVar10 * dVar76 * dVar7 +
             dVar136 * dVar104 * dVar27 * dVar37 * dVar90 +
             dVar110 * dVar27 * dVar11 * dVar138 * dVar6 +
             dVar27 * dVar111 * dVar11 * dVar9 * dVar7 +
             dVar111 * dVar142 * dVar37 * dVar138 * dVar6 +
             dVar110 * dVar142 * dVar11 * dVar2 * dVar7 +
             dVar27 * dVar45 * dVar37 * dVar9 * dVar7 +
             dVar44 * dVar27 * dVar11 * dVar138 * dVar76 +
             dVar45 * dVar142 * dVar37 * dVar138 * dVar76 +
             dVar44 * dVar142 * dVar37 * dVar2 * dVar7 +
             dVar40 * dVar5 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar156 * dVar5 * dVar27 * dVar11 * dVar138 * dVar6 +
             dVar142 * dVar156 * dVar5 * dVar10 * dVar2 * dVar6 +
             dVar142 * dVar40 * dVar5 * dVar11 * dVar138 * dVar76 +
             dVar12 * dVar156 * dVar3 * dVar10 * dVar9 * dVar6 +
             dVar12 * dVar40 * dVar3 * dVar11 * dVar9 * dVar7 +
             dVar136 * dVar40 * dVar3 * dVar10 * dVar9 * dVar76 +
             dVar136 * dVar156 * dVar3 * dVar11 * dVar2 * dVar7 +
             dVar65 * dVar5 * dVar27 * dVar10 * dVar9 * dVar76 +
             dVar27 * dVar64 * dVar5 * dVar37 * dVar138 * dVar6 +
             dVar64 * dVar5 * dVar142 * dVar10 * dVar2 * dVar76 +
             dVar65 * dVar5 * dVar142 * dVar37 * dVar138 * dVar76 +
             dVar12 * dVar64 * dVar3 * dVar10 * dVar2 * dVar6 +
             dVar12 * dVar65 * dVar3 * dVar37 * dVar9 * dVar7 +
             dVar65 * dVar136 * dVar3 * dVar10 * dVar2 * dVar76 +
             dVar64 * dVar136 * dVar3 * dVar37 * dVar2 * dVar7 +
             dVar134 * dVar27 * dVar11 * dVar10 * dVar6 +
             dVar109 * dVar27 * dVar126 * dVar7 +
             dVar142 * dVar109 * dVar37 * dVar10 * dVar6 +
             dVar142 * dVar134 * dVar11 * dVar37 * dVar7 +
             dVar48 * dVar27 * dVar11 * dVar10 * dVar76 +
             dVar43 * dVar27 * dVar11 * dVar37 * dVar7 +
             dVar43 * dVar142 * dVar37 * dVar10 * dVar76 +
             dVar142 * dVar48 * dVar153 * dVar7 +
             dVar63 * dVar5 * dVar142 * dVar37 * dVar10 * dVar6 +
             dVar147 * dVar5 * dVar142 * dVar11 * dVar10 * dVar76 +
             dVar63 * dVar12 * dVar3 * dVar11 * dVar10 * dVar6 +
             dVar12 * dVar147 * dVar3 * dVar126 * dVar7 +
             dVar136 * dVar147 * dVar3 * dVar11 * dVar10 * dVar76 +
             dVar136 * dVar63 * dVar3 * dVar11 * dVar37 * dVar7 +
             dVar39 * dVar5 * dVar27 * dVar37 * dVar10 * dVar6 +
             dVar108 * dVar5 * dVar27 * dVar11 * dVar10 * dVar76 +
             dVar39 * dVar12 * dVar3 * dVar37 * dVar10 * dVar6 +
             dVar108 * dVar12 * dVar3 * dVar11 * dVar37 * dVar7 +
             dVar108 * dVar136 * dVar3 * dVar37 * dVar10 * dVar76 +
             dVar136 * dVar39 * dVar3 * dVar153 * dVar7 +
             dVar107 * dVar27 * dVar11 * dVar138 * dVar6 +
             dVar91 * dVar27 * dVar11 * dVar9 * dVar7 +
             dVar142 * dVar107 * dVar37 * dVar9 * dVar7 +
             dVar142 * dVar91 * dVar11 * dVar138 * dVar76 +
             dVar106 * dVar27 * dVar37 * dVar138 * dVar6 +
             dVar125 * dVar27 * dVar11 * dVar2 * dVar7 +
             dVar142 * dVar125 * dVar37 * dVar138 * dVar76 +
             dVar142 * dVar106 * dVar37 * dVar2 * dVar7 +
             dVar146 * dVar5 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar145 * dVar5 * dVar27 * dVar11 * dVar9 * dVar7 +
             dVar142 * dVar145 * dVar5 * dVar10 * dVar9 * dVar76 +
             dVar142 * dVar146 * dVar5 * dVar11 * dVar2 * dVar7 +
             dVar12 * dVar145 * dVar3 * dVar10 * dVar9 * dVar6 +
             dVar12 * dVar146 * dVar3 * dVar11 * dVar138 * dVar6 +
             dVar136 * dVar146 * dVar3 * dVar10 * dVar2 * dVar6 +
             dVar136 * dVar145 * dVar3 * dVar11 * dVar138 * dVar76 +
             dVar103 * dVar5 * dVar27 * dVar10 * dVar2 * dVar6 +
             dVar124 * dVar5 * dVar27 * dVar37 * dVar9 * dVar7 +
             dVar124 * dVar5 * dVar142 * dVar10 * dVar2 * dVar76 +
             dVar103 * dVar5 * dVar142 * dVar37 * dVar2 * dVar7 +
             dVar124 * dVar12 * dVar3 * dVar10 * dVar9 * dVar76 +
             dVar103 * dVar12 * dVar3 * dVar37 * dVar138 * dVar6 +
             dVar103 * dVar136 * dVar3 * dVar10 * dVar2 * dVar76 +
             dVar124 * dVar136 * dVar3 * dVar37 * dVar138 * dVar76 +
             dVar38 * dVar5 * dVar27 * dVar37 * dVar75 +
             dVar16 * dVar5 * dVar27 * dVar11 * dVar9 * dVar2 +
             dVar16 * dVar5 * dVar142 * dVar37 * dVar9 * dVar2 +
             dVar38 * dVar5 * dVar142 * dVar11 * dVar116 +
             dVar16 * dVar12 * dVar3 * dVar37 * dVar75 +
             dVar38 * dVar12 * dVar3 * dVar11 * dVar9 * dVar2 +
             dVar38 * dVar136 * dVar3 * dVar37 * dVar9 * dVar2 +
             dVar136 * dVar16 * dVar3 * dVar11 * dVar116 +
             dVar33 * dVar27 * dVar11 * dVar37 * dVar9 +
             dVar74 * dVar27 * dVar126 * dVar2 +
             dVar142 * dVar74 * dVar153 * dVar9 +
             dVar142 * dVar33 * dVar11 * dVar37 * dVar2 +
             dVar61 * dVar13 * dVar5 * dVar3 * dVar11 * dVar37 * dVar9 +
             dVar123 * dVar13 * dVar5 * dVar3 * dVar126 * dVar2 +
             dVar123 * dVar139 * dVar5 * dVar3 * dVar153 * dVar9 +
             dVar61 * dVar139 * dVar5 * dVar3 * dVar11 * dVar37 * dVar2 +
             dVar101 * dVar27 * dVar11 * dVar10 * dVar6 +
             dVar102 * dVar27 * dVar126 * dVar7 +
             dVar142 * dVar102 * dVar11 * dVar10 * dVar76 +
             dVar142 * dVar101 * dVar11 * dVar37 * dVar7 +
             dVar160 * dVar27 * dVar37 * dVar10 * dVar6 +
             dVar77 * dVar27 * dVar11 * dVar37 * dVar7 +
             dVar77 * dVar142 * dVar37 * dVar10 * dVar76 +
             dVar160 * dVar142 * dVar153 * dVar7 +
             dVar132 * dVar27 * dVar11 * dVar10 * dVar6 +
             dVar32 * dVar27 * dVar126 * dVar7 +
             dVar142 * dVar32 * dVar11 * dVar10 * dVar76 +
             dVar142 * dVar132 * dVar11 * dVar37 * dVar7 +
             dVar14 * dVar13 * dVar136 * dVar3 * dVar37 * dVar10 * dVar6 +
             dVar15 * dVar13 * dVar136 * dVar3 * dVar11 * dVar10 * dVar76 +
             dVar73 * dVar27 * dVar37 * dVar10 * dVar6 +
             dVar93 * dVar27 * dVar11 * dVar37 * dVar7 +
             dVar93 * dVar142 * dVar37 * dVar10 * dVar76 +
             dVar73 * dVar142 * dVar153 * dVar7 +
             dVar12 * dVar15 * dVar139 * dVar3 * dVar37 * dVar10 * dVar6 +
             dVar12 * dVar14 * dVar139 * dVar3 * dVar11 * dVar10 * dVar76 +
             dVar157 * dVar1 * dVar12 * dVar3 * dVar11 * dVar37 * dVar9 +
             dVar122 * dVar1 * dVar12 * dVar3 * dVar126 * dVar2 +
             dVar122 * dVar1 * dVar136 * dVar3 * dVar153 * dVar9 +
             dVar157 * dVar1 * dVar136 * dVar3 * dVar11 * dVar37 * dVar2 +
             dVar122 * dVar13 * dVar5 * dVar3 * dVar11 * dVar37 * dVar9 +
             dVar157 * dVar13 * dVar5 * dVar3 * dVar126 * dVar2 +
             dVar122 * dVar139 * dVar5 * dVar3 * dVar11 * dVar37 * dVar2 +
             dVar157 * dVar139 * dVar5 * dVar3 * dVar153 * dVar9;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar4,&local_40);
  dVar142 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar90 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[7];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[9];
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xd];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x11];
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x12];
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0];
  dVar39 = dVar10 * dVar142 * dVar90;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x14];
  dVar29 = -dVar10;
  dVar47 = dVar142 * dVar29 * dVar90;
  dVar139 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x13];
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x15];
  dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x16];
  dVar13 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xb];
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[4];
  dVar45 = dVar10 * dVar11;
  dVar37 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[6];
  dVar28 = dVar45 * dVar37;
  dVar136 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[1];
  dVar43 = dVar136 * dVar142;
  dVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[2];
  dVar33 = dVar142 * -dVar12;
  dVar67 = -dVar12 * dVar11;
  dVar35 = dVar11 * dVar29;
  dVar94 = dVar35 * dVar37;
  dVar48 = dVar45 * dVar90;
  dVar95 = dVar35 * dVar90;
  dVar131 = -dVar136;
  dVar97 = dVar142 * dVar131;
  dVar49 = dVar97 * dVar37;
  dVar103 = dVar27 * dVar49;
  dVar106 = dVar43 * dVar37;
  dVar77 = dVar97 * dVar90;
  dVar46 = dVar43 * dVar90;
  dVar50 = dVar11 * dVar131 * dVar37;
  dVar91 = dVar136 * dVar11 * dVar37;
  dVar76 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[5];
  dVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xe];
  dVar92 = dVar47 * dVar27 * dVar6;
  dVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xf];
  dVar58 = dVar39 * dVar27 * dVar6;
  dVar14 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x10];
  dVar15 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[10];
  dVar105 = dVar47 * dVar15 * dVar6;
  dVar68 = dVar28 * dVar27;
  dVar113 = dVar94 * dVar27;
  dVar127 = dVar94 * dVar15;
  dVar16 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xc];
  dVar59 = dVar28 * dVar15;
  dVar133 = dVar48 * dVar27;
  dVar114 = dVar95 * dVar27;
  dVar145 = dVar95 * dVar15;
  dVar60 = dVar48 * dVar15;
  dVar146 = dVar106 * dVar27;
  dVar62 = dVar106 * dVar15;
  dVar147 = dVar49 * dVar15;
  dVar156 = dVar77 * dVar27;
  dVar69 = dVar46 * dVar27;
  dVar40 = dVar46 * dVar15;
  dVar70 = dVar77 * dVar15;
  dVar54 = dVar27 * dVar91 * dVar6;
  dVar8 = dVar27 * dVar50 * dVar6;
  dVar17 = dVar91 * dVar15 * dVar6;
  dVar64 = dVar6 * dVar39 * dVar15;
  dVar65 = dVar47 * dVar13 * dVar16;
  dVar38 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[8];
  dVar41 = dVar142 * dVar29 * dVar38;
  dVar18 = dVar41 * dVar15 * dVar16;
  dVar93 = dVar28 * dVar13 * dVar16;
  dVar19 = dVar10 * dVar76 * dVar37;
  dVar98 = dVar27 * dVar19;
  dVar19 = dVar19 * dVar15;
  dVar73 = dVar10 * dVar76 * dVar90;
  dVar20 = dVar73 * dVar27;
  dVar21 = dVar20 * dVar1;
  dVar22 = dVar6 * dVar50 * dVar15;
  dVar23 = dVar50 * dVar13 * dVar16;
  dVar24 = dVar91 * dVar13 * dVar1;
  dVar25 = dVar131 * dVar76 * dVar37;
  dVar78 = dVar25 * dVar27;
  dVar79 = dVar78 * dVar1;
  dVar26 = dVar33 * dVar37;
  dVar96 = dVar26 * dVar27;
  dVar61 = dVar39 * dVar13 * dVar16;
  dVar63 = dVar47 * dVar13 * dVar1;
  dVar10 = dVar10 * dVar142 * dVar38;
  dVar71 = dVar10 * dVar27 * dVar1;
  dVar80 = dVar28 * dVar13 * dVar1;
  dVar28 = dVar94 * dVar13 * dVar1;
  dVar55 = dVar35 * dVar38 * dVar27;
  dVar140 = dVar45 * dVar38 * dVar27;
  dVar141 = dVar140 * dVar1;
  dVar36 = dVar29 * dVar76 * dVar37;
  dVar144 = dVar27 * dVar36;
  dVar42 = dVar29 * dVar76 * dVar90;
  dVar148 = dVar42 * dVar27;
  dVar81 = dVar46 * dVar13 * dVar16;
  dVar29 = dVar77 * dVar13 * dVar16;
  dVar30 = dVar43 * dVar38 * dVar27;
  dVar135 = dVar97 * dVar38 * dVar15;
  dVar82 = dVar16 * dVar135;
  dVar83 = dVar136 * dVar76 * dVar37;
  dVar84 = dVar83 * dVar15;
  dVar150 = dVar16 * dVar84;
  dVar154 = dVar12 * dVar142 * dVar37;
  dVar31 = dVar154 * dVar27;
  dVar44 = dVar12 * dVar142 * dVar90;
  dVar32 = dVar44 * dVar27;
  dVar33 = dVar33 * dVar90;
  dVar34 = dVar33 * dVar15;
  dVar85 = dVar16 * dVar34;
  dVar86 = dVar12 * dVar11 * dVar37;
  dVar56 = dVar27 * dVar86;
  dVar37 = dVar37 * dVar67;
  dVar87 = dVar27 * dVar37;
  dVar88 = dVar87 * dVar1;
  dVar86 = dVar86 * dVar15;
  dVar89 = dVar16 * dVar86;
  dVar107 = dVar139 * dVar139;
  dVar142 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x17];
  dVar35 = dVar35 * dVar38 * dVar15;
  dVar99 = dVar16 * dVar35;
  dVar36 = dVar36 * dVar15;
  dVar42 = dVar42 * dVar15;
  dVar100 = dVar16 * dVar42;
  dVar77 = dVar77 * dVar13 * dVar1;
  dVar43 = dVar43 * dVar38 * dVar15;
  dVar101 = dVar16 * dVar43;
  dVar154 = dVar154 * dVar15;
  dVar44 = dVar44 * dVar15;
  dVar102 = dVar16 * dVar44;
  dVar115 = dVar39 * dVar13 * dVar1;
  dVar108 = dVar41 * dVar27 * dVar1;
  dVar134 = dVar10 * dVar15 * dVar16;
  dVar109 = dVar94 * dVar13 * dVar16;
  dVar72 = dVar45 * dVar38 * dVar15;
  dVar110 = dVar16 * dVar72;
  dVar73 = dVar73 * dVar15;
  dVar111 = dVar16 * dVar73;
  dVar112 = dVar46 * dVar13 * dVar1;
  dVar97 = dVar97 * dVar38 * dVar27;
  dVar117 = dVar97 * dVar1;
  dVar118 = dVar91 * dVar13 * dVar16;
  dVar119 = dVar50 * dVar13 * dVar1;
  dVar83 = dVar83 * dVar27;
  dVar120 = dVar83 * dVar1;
  dVar25 = dVar25 * dVar15;
  dVar121 = dVar16 * dVar25;
  dVar26 = dVar26 * dVar15;
  dVar33 = dVar33 * dVar27;
  dVar128 = dVar33 * dVar1;
  dVar157 = dVar56 * dVar1;
  dVar37 = dVar37 * dVar15;
  dVar129 = dVar16 * dVar37;
  dVar130 = dVar9 * dVar9;
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x1a];
  dVar41 = dVar136 * dVar11 * dVar38;
  dVar38 = dVar11 * dVar131 * dVar38;
  dVar94 = dVar131 * dVar76 * dVar90;
  dVar104 = dVar136 * dVar76 * dVar90;
  dVar66 = dVar12 * dVar11 * dVar90;
  dVar67 = dVar67 * dVar90;
  dVar158 = dVar27 * dVar94;
  dVar51 = dVar27 * dVar104;
  dVar104 = dVar104 * dVar15;
  dVar94 = dVar94 * dVar15;
  dVar75 = dVar27 * dVar66;
  dVar57 = dVar27 * dVar67;
  dVar67 = dVar67 * dVar15;
  dVar66 = dVar66 * dVar15;
  dVar136 = dVar148 * dVar1;
  dVar12 = dVar30 * dVar1;
  dVar74 = dVar41 * dVar27 * dVar1;
  dVar76 = dVar38 * dVar27 * dVar1;
  dVar38 = dVar38 * dVar15 * dVar16;
  dVar131 = dVar41 * dVar15 * dVar16;
  dVar41 = dVar32 * dVar1;
  dVar45 = dVar55 * dVar1;
  dVar52 = dVar5 * dVar5;
  dVar90 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x19];
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x18];
  dVar116 = dVar3 * dVar3;
  dVar53 = dVar138 * dVar138;
  dVar46 = dVar142 * dVar142;
  local_48 = dVar67 * dVar1 * dVar7 * dVar46 * dVar11 +
             dVar66 * dVar1 * dVar7 * dVar138 * dVar142 * dVar10 +
             dVar16 * dVar66 * dVar14 * dVar46 * dVar11 +
             dVar67 * dVar16 * dVar14 * dVar138 * dVar142 * dVar10 +
             dVar75 * dVar1 * dVar7 * dVar46 * dVar90 +
             dVar57 * dVar1 * dVar7 * dVar3 * dVar142 * dVar10 +
             dVar16 * dVar57 * dVar14 * dVar46 * dVar90 +
             dVar16 * dVar75 * dVar14 * dVar3 * dVar142 * dVar10 +
             dVar37 * dVar1 * dVar7 * dVar5 * dVar142 * dVar11 +
             dVar86 * dVar1 * dVar7 * dVar5 * dVar138 * dVar10 +
             dVar89 * dVar14 * dVar5 * dVar142 * dVar11 +
             dVar129 * dVar14 * dVar9 * dVar142 * dVar10 +
             dVar7 * dVar129 * dVar5 * dVar3 * dVar10 +
             dVar7 * dVar89 * dVar139 * dVar142 * dVar10 +
             dVar88 * dVar14 * dVar5 * dVar138 * dVar10 +
             dVar157 * dVar14 * dVar9 * dVar142 * dVar10 +
             dVar7 * dVar157 * dVar5 * dVar142 * dVar90 +
             dVar7 * dVar88 * dVar139 * dVar142 * dVar10 +
             dVar16 * dVar87 * dVar14 * dVar5 * dVar142 * dVar90 +
             dVar16 * dVar56 * dVar14 * dVar5 * dVar3 * dVar10 +
             dVar34 * dVar1 * dVar7 * dVar5 * dVar142 * dVar11 +
             dVar44 * dVar1 * dVar7 * dVar9 * dVar142 * dVar10 +
             dVar102 * dVar14 * dVar5 * dVar142 * dVar11 +
             dVar85 * dVar14 * dVar5 * dVar138 * dVar10 +
             dVar7 * dVar102 * dVar5 * dVar3 * dVar10 +
             dVar7 * dVar85 * dVar139 * dVar142 * dVar10 +
             dVar14 * dVar41 * dVar5 * dVar138 * dVar10 +
             dVar14 * dVar128 * dVar9 * dVar142 * dVar10 +
             dVar41 * dVar7 * dVar5 * dVar142 * dVar90 +
             dVar128 * dVar7 * dVar5 * dVar3 * dVar10 +
             dVar33 * dVar16 * dVar14 * dVar5 * dVar142 * dVar90 +
             dVar32 * dVar16 * dVar14 * dVar139 * dVar142 * dVar10 +
             dVar26 * dVar1 * dVar7 * dVar52 * dVar11 +
             dVar154 * dVar1 * dVar7 * dVar9 * dVar5 * dVar10 +
             dVar154 * dVar16 * dVar14 * dVar52 * dVar11 +
             dVar26 * dVar16 * dVar14 * dVar9 * dVar5 * dVar10 +
             dVar31 * dVar1 * dVar7 * dVar52 * dVar90 +
             dVar96 * dVar1 * dVar7 * dVar139 * dVar5 * dVar10 +
             dVar96 * dVar16 * dVar14 * dVar52 * dVar90 +
             dVar31 * dVar16 * dVar14 * dVar139 * dVar5 * dVar10 +
             dVar104 * dVar1 * dVar7 * dVar46 * dVar11 +
             dVar94 * dVar1 * dVar7 * dVar138 * dVar142 * dVar10 +
             dVar94 * dVar16 * dVar7 * dVar46 * dVar90 +
             dVar104 * dVar16 * dVar7 * dVar3 * dVar142 * dVar10 +
             dVar158 * dVar1 * dVar14 * dVar46 * dVar11 +
             dVar51 * dVar1 * dVar14 * dVar138 * dVar142 * dVar10 +
             dVar16 * dVar51 * dVar14 * dVar46 * dVar90 +
             dVar16 * dVar158 * dVar14 * dVar3 * dVar142 * dVar10 +
             dVar84 * dVar1 * dVar7 * dVar5 * dVar142 * dVar11 +
             dVar25 * dVar1 * dVar7 * dVar5 * dVar138 * dVar10 +
             dVar150 * dVar14 * dVar5 * dVar138 * dVar10 +
             dVar121 * dVar14 * dVar9 * dVar142 * dVar10 +
             dVar7 * dVar121 * dVar5 * dVar142 * dVar90 +
             dVar7 * dVar150 * dVar139 * dVar142 * dVar10 +
             dVar79 * dVar14 * dVar5 * dVar142 * dVar11 +
             dVar14 * dVar120 * dVar9 * dVar142 * dVar10 +
             dVar120 * dVar7 * dVar5 * dVar3 * dVar10 +
             dVar79 * dVar7 * dVar139 * dVar142 * dVar10 +
             dVar83 * dVar16 * dVar14 * dVar5 * dVar142 * dVar90 +
             dVar78 * dVar16 * dVar14 * dVar5 * dVar3 * dVar10 +
             dVar38 * dVar14 * dVar46 * dVar11 +
             dVar131 * dVar14 * dVar138 * dVar142 * dVar10 +
             dVar131 * dVar7 * dVar46 * dVar90 +
             dVar38 * dVar7 * dVar3 * dVar142 * dVar10 +
             dVar74 * dVar14 * dVar46 * dVar11 +
             dVar76 * dVar14 * dVar138 * dVar142 * dVar10 +
             dVar76 * dVar7 * dVar46 * dVar90 +
             dVar74 * dVar7 * dVar3 * dVar142 * dVar10 +
             dVar24 * dVar14 * dVar5 * dVar53 +
             dVar14 * dVar119 * dVar9 * dVar138 * dVar142 +
             dVar119 * dVar7 * dVar5 * dVar138 * dVar3 +
             dVar24 * dVar7 * dVar139 * dVar138 * dVar142 +
             dVar23 * dVar14 * dVar5 * dVar138 * dVar3 +
             dVar118 * dVar14 * dVar9 * dVar3 * dVar142 +
             dVar118 * dVar7 * dVar5 * dVar116 +
             dVar23 * dVar7 * dVar139 * dVar3 * dVar142 +
             dVar22 * dVar14 * dVar5 * dVar53 +
             dVar14 * dVar17 * dVar9 * dVar138 * dVar142 +
             dVar17 * dVar7 * dVar5 * dVar138 * dVar3 +
             dVar22 * dVar7 * dVar139 * dVar138 * dVar142 +
             dVar50 * dVar15 * dVar16 * dVar2 * dVar139 * dVar138 * dVar142 +
             dVar91 * dVar15 * dVar16 * dVar2 * dVar9 * dVar3 * dVar142 +
             dVar54 * dVar14 * dVar5 * dVar138 * dVar3 +
             dVar8 * dVar14 * dVar9 * dVar3 * dVar142 +
             dVar7 * dVar8 * dVar5 * dVar116 +
             dVar7 * dVar54 * dVar139 * dVar3 * dVar142 +
             dVar1 * dVar27 * dVar91 * dVar2 * dVar139 * dVar138 * dVar142 +
             dVar1 * dVar27 * dVar50 * dVar2 * dVar9 * dVar3 * dVar142 +
             dVar135 * dVar1 * dVar7 * dVar5 * dVar138 * dVar10 +
             dVar43 * dVar1 * dVar7 * dVar9 * dVar142 * dVar10 +
             dVar82 * dVar14 * dVar5 * dVar142 * dVar11 +
             dVar101 * dVar14 * dVar5 * dVar138 * dVar10 +
             dVar7 * dVar101 * dVar5 * dVar142 * dVar90 +
             dVar7 * dVar82 * dVar139 * dVar142 * dVar10 +
             dVar12 * dVar14 * dVar5 * dVar142 * dVar11 +
             dVar14 * dVar117 * dVar9 * dVar142 * dVar10 +
             dVar117 * dVar7 * dVar5 * dVar142 * dVar90 +
             dVar12 * dVar7 * dVar5 * dVar3 * dVar10 +
             dVar97 * dVar16 * dVar14 * dVar5 * dVar3 * dVar10 +
             dVar30 * dVar16 * dVar14 * dVar139 * dVar142 * dVar10 +
             dVar77 * dVar14 * dVar5 * dVar53 +
             dVar14 * dVar112 * dVar9 * dVar138 * dVar142 +
             dVar112 * dVar7 * dVar5 * dVar138 * dVar3 +
             dVar77 * dVar7 * dVar9 * dVar3 * dVar142 +
             dVar81 * dVar14 * dVar5 * dVar138 * dVar3 +
             dVar29 * dVar14 * dVar139 * dVar138 * dVar142 +
             dVar7 * dVar29 * dVar5 * dVar116 +
             dVar7 * dVar81 * dVar139 * dVar3 * dVar142 +
             dVar40 * dVar6 * dVar7 * dVar139 * dVar138 * dVar142 +
             dVar70 * dVar6 * dVar7 * dVar9 * dVar3 * dVar142 +
             dVar1 * dVar40 * dVar2 * dVar5 * dVar53 +
             dVar1 * dVar70 * dVar2 * dVar9 * dVar138 * dVar142 +
             dVar70 * dVar16 * dVar2 * dVar5 * dVar138 * dVar3 +
             dVar40 * dVar16 * dVar2 * dVar139 * dVar138 * dVar142 +
             dVar156 * dVar6 * dVar14 * dVar139 * dVar138 * dVar142 +
             dVar69 * dVar6 * dVar14 * dVar9 * dVar3 * dVar142 +
             dVar156 * dVar1 * dVar2 * dVar5 * dVar138 * dVar3 +
             dVar69 * dVar1 * dVar2 * dVar9 * dVar3 * dVar142 +
             dVar16 * dVar69 * dVar2 * dVar5 * dVar116 +
             dVar16 * dVar156 * dVar2 * dVar139 * dVar3 * dVar142 +
             dVar106 * dVar13 * dVar1 * dVar7 * dVar139 * dVar5 * dVar138 +
             dVar49 * dVar13 * dVar1 * dVar7 * dVar9 * dVar5 * dVar3 +
             dVar49 * dVar13 * dVar16 * dVar14 * dVar139 * dVar5 * dVar138 +
             dVar106 * dVar13 * dVar16 * dVar14 * dVar9 * dVar5 * dVar3 +
             dVar147 * dVar6 * dVar14 * dVar9 * dVar5 * dVar138 +
             dVar62 * dVar6 * dVar14 * dVar130 * dVar142 +
             dVar62 * dVar6 * dVar7 * dVar139 * dVar5 * dVar138 +
             dVar147 * dVar6 * dVar7 * dVar9 * dVar139 * dVar142 +
             dVar62 * dVar1 * dVar2 * dVar9 * dVar5 * dVar138 +
             dVar147 * dVar1 * dVar2 * dVar130 * dVar142 +
             dVar147 * dVar16 * dVar2 * dVar139 * dVar5 * dVar138 +
             dVar62 * dVar16 * dVar2 * dVar9 * dVar139 * dVar142 +
             dVar146 * dVar6 * dVar14 * dVar9 * dVar5 * dVar3 +
             dVar103 * dVar6 * dVar14 * dVar9 * dVar139 * dVar142 +
             dVar103 * dVar6 * dVar7 * dVar139 * dVar5 * dVar3 +
             dVar146 * dVar6 * dVar7 * dVar107 * dVar142 +
             dVar103 * dVar1 * dVar2 * dVar9 * dVar5 * dVar3 +
             dVar146 * dVar1 * dVar2 * dVar9 * dVar139 * dVar142 +
             dVar146 * dVar16 * dVar2 * dVar139 * dVar5 * dVar3 +
             dVar16 * dVar103 * dVar2 * dVar107 * dVar142 +
             dVar73 * dVar1 * dVar7 * dVar5 * dVar142 * dVar11 +
             dVar42 * dVar1 * dVar7 * dVar9 * dVar142 * dVar10 +
             dVar100 * dVar14 * dVar5 * dVar138 * dVar10 +
             dVar111 * dVar14 * dVar9 * dVar142 * dVar10 +
             dVar7 * dVar100 * dVar5 * dVar142 * dVar90 +
             dVar7 * dVar111 * dVar5 * dVar3 * dVar10 +
             dVar14 * dVar136 * dVar5 * dVar142 * dVar11 +
             dVar14 * dVar21 * dVar5 * dVar138 * dVar10 +
             dVar136 * dVar7 * dVar5 * dVar3 * dVar10 +
             dVar21 * dVar7 * dVar139 * dVar142 * dVar10 +
             dVar20 * dVar16 * dVar14 * dVar5 * dVar142 * dVar90 +
             dVar148 * dVar16 * dVar14 * dVar139 * dVar142 * dVar10 +
             dVar19 * dVar1 * dVar7 * dVar52 * dVar11 +
             dVar36 * dVar1 * dVar7 * dVar9 * dVar5 * dVar10 +
             dVar36 * dVar16 * dVar7 * dVar52 * dVar90 +
             dVar19 * dVar16 * dVar7 * dVar139 * dVar5 * dVar10 +
             dVar144 * dVar1 * dVar14 * dVar52 * dVar11 +
             dVar98 * dVar1 * dVar14 * dVar9 * dVar5 * dVar10 +
             dVar16 * dVar98 * dVar14 * dVar52 * dVar90 +
             dVar16 * dVar144 * dVar14 * dVar139 * dVar5 * dVar10 +
             dVar72 * dVar1 * dVar7 * dVar5 * dVar138 * dVar10 +
             dVar35 * dVar1 * dVar7 * dVar9 * dVar142 * dVar10 +
             dVar99 * dVar14 * dVar5 * dVar142 * dVar11 +
             dVar110 * dVar14 * dVar9 * dVar142 * dVar10 +
             dVar7 * dVar110 * dVar5 * dVar142 * dVar90 +
             dVar7 * dVar99 * dVar5 * dVar3 * dVar10 +
             dVar141 * dVar14 * dVar5 * dVar142 * dVar11 +
             dVar45 * dVar14 * dVar5 * dVar138 * dVar10 +
             dVar7 * dVar45 * dVar5 * dVar142 * dVar90 +
             dVar7 * dVar141 * dVar139 * dVar142 * dVar10 +
             dVar16 * dVar140 * dVar14 * dVar5 * dVar3 * dVar10 +
             dVar16 * dVar55 * dVar14 * dVar139 * dVar142 * dVar10 +
             dVar95 * dVar13 * dVar1 * dVar7 * dVar139 * dVar138 * dVar142 +
             dVar48 * dVar13 * dVar1 * dVar7 * dVar9 * dVar3 * dVar142 +
             dVar48 * dVar13 * dVar16 * dVar14 * dVar139 * dVar138 * dVar142 +
             dVar95 * dVar13 * dVar16 * dVar14 * dVar9 * dVar3 * dVar142 +
             dVar60 * dVar6 * dVar14 * dVar5 * dVar53 +
             dVar145 * dVar6 * dVar14 * dVar9 * dVar138 * dVar142 +
             dVar145 * dVar6 * dVar7 * dVar5 * dVar138 * dVar3 +
             dVar60 * dVar6 * dVar7 * dVar9 * dVar3 * dVar142 +
             dVar145 * dVar1 * dVar2 * dVar5 * dVar53 +
             dVar60 * dVar1 * dVar2 * dVar9 * dVar138 * dVar142 +
             dVar60 * dVar16 * dVar2 * dVar5 * dVar138 * dVar3 +
             dVar145 * dVar16 * dVar2 * dVar9 * dVar3 * dVar142 +
             dVar114 * dVar6 * dVar14 * dVar5 * dVar138 * dVar3 +
             dVar133 * dVar6 * dVar14 * dVar139 * dVar138 * dVar142 +
             dVar133 * dVar6 * dVar7 * dVar5 * dVar116 +
             dVar114 * dVar6 * dVar7 * dVar139 * dVar3 * dVar142 +
             dVar133 * dVar1 * dVar2 * dVar5 * dVar138 * dVar3 +
             dVar114 * dVar1 * dVar2 * dVar139 * dVar138 * dVar142 +
             dVar114 * dVar16 * dVar2 * dVar5 * dVar116 +
             dVar133 * dVar16 * dVar2 * dVar139 * dVar3 * dVar142 +
             dVar80 * dVar14 * dVar9 * dVar5 * dVar138 +
             dVar28 * dVar14 * dVar130 * dVar142 +
             dVar7 * dVar28 * dVar139 * dVar5 * dVar138 +
             dVar7 * dVar80 * dVar9 * dVar139 * dVar142 +
             dVar109 * dVar14 * dVar9 * dVar5 * dVar3 +
             dVar93 * dVar14 * dVar9 * dVar139 * dVar142 +
             dVar93 * dVar7 * dVar139 * dVar5 * dVar3 +
             dVar7 * dVar109 * dVar107 * dVar142 +
             dVar127 * dVar6 * dVar7 * dVar139 * dVar5 * dVar138 +
             dVar59 * dVar6 * dVar7 * dVar9 * dVar5 * dVar3 +
             dVar127 * dVar1 * dVar2 * dVar9 * dVar5 * dVar138 +
             dVar1 * dVar59 * dVar2 * dVar130 * dVar142 +
             dVar16 * dVar59 * dVar2 * dVar9 * dVar5 * dVar3 +
             dVar16 * dVar127 * dVar2 * dVar9 * dVar139 * dVar142 +
             dVar68 * dVar6 * dVar14 * dVar139 * dVar5 * dVar138 +
             dVar113 * dVar6 * dVar14 * dVar9 * dVar5 * dVar3 +
             dVar68 * dVar1 * dVar2 * dVar139 * dVar5 * dVar138 +
             dVar113 * dVar1 * dVar2 * dVar9 * dVar139 * dVar142 +
             dVar113 * dVar16 * dVar2 * dVar139 * dVar5 * dVar3 +
             dVar68 * dVar16 * dVar2 * dVar107 * dVar142 +
             dVar18 * dVar14 * dVar52 * dVar11 +
             dVar134 * dVar14 * dVar9 * dVar5 * dVar10 +
             dVar134 * dVar7 * dVar52 * dVar90 +
             dVar18 * dVar7 * dVar139 * dVar5 * dVar10 +
             dVar71 * dVar14 * dVar52 * dVar11 +
             dVar108 * dVar14 * dVar9 * dVar5 * dVar10 +
             dVar7 * dVar108 * dVar52 * dVar90 +
             dVar7 * dVar71 * dVar139 * dVar5 * dVar10 +
             dVar63 * dVar14 * dVar9 * dVar5 * dVar138 +
             dVar115 * dVar14 * dVar130 * dVar142 +
             dVar7 * dVar115 * dVar9 * dVar5 * dVar3 +
             dVar7 * dVar63 * dVar9 * dVar139 * dVar142 +
             dVar61 * dVar14 * dVar139 * dVar5 * dVar138 +
             dVar65 * dVar14 * dVar9 * dVar139 * dVar142 +
             dVar65 * dVar7 * dVar139 * dVar5 * dVar3 +
             dVar61 * dVar7 * dVar107 * dVar142 +
             dVar64 * dVar14 * dVar9 * dVar5 * dVar138 +
             dVar105 * dVar14 * dVar130 * dVar142 +
             dVar7 * dVar105 * dVar9 * dVar5 * dVar3 +
             dVar7 * dVar64 * dVar9 * dVar139 * dVar142 +
             dVar39 * dVar15 * dVar16 * dVar2 * dVar139 * dVar5 * dVar138 +
             dVar47 * dVar15 * dVar16 * dVar2 * dVar9 * dVar5 * dVar3 +
             dVar92 * dVar14 * dVar139 * dVar5 * dVar138 +
             dVar58 * dVar14 * dVar9 * dVar139 * dVar142 +
             dVar58 * dVar7 * dVar139 * dVar5 * dVar3 +
             dVar92 * dVar7 * dVar107 * dVar142 +
             dVar39 * dVar27 * dVar1 * dVar2 * dVar9 * dVar5 * dVar3 +
             dVar47 * dVar27 * dVar1 * dVar2 * dVar139 * dVar5 * dVar138;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar4,&local_48);
  dVar142 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar90 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[7];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[9];
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [1];
  dVar13 = dVar1 * dVar142 * dVar90;
  dVar11 = dVar142 * -dVar1 * dVar90;
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [4];
  dVar37 = -dVar1 * dVar9;
  dVar136 = dVar37 * dVar90;
  dVar156 = dVar1 * dVar9 * dVar90;
  dVar39 = dVar142 * -dVar2;
  dVar133 = dVar2 * dVar142 * dVar90;
  dVar90 = dVar39 * dVar90;
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[6];
  dVar37 = dVar37 * dVar10;
  dVar8 = dVar1 * dVar9 * dVar10;
  dVar17 = dVar2 * dVar142 * dVar10;
  dVar39 = dVar39 * dVar10;
  dVar38 = -dVar2 * dVar9 * dVar10;
  dVar10 = dVar2 * dVar9 * dVar10;
  dVar142 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[10];
  dVar7 = dVar37 * dVar27;
  dVar14 = dVar8 * dVar27;
  dVar8 = dVar8 * dVar142;
  dVar37 = dVar37 * dVar142;
  dVar95 = dVar136 * dVar27;
  dVar105 = dVar156 * dVar27;
  dVar156 = dVar156 * dVar142;
  dVar136 = dVar136 * dVar142;
  dVar127 = dVar17 * dVar27;
  dVar12 = dVar39 * dVar27;
  dVar39 = dVar39 * dVar142;
  dVar17 = dVar17 * dVar142;
  dVar76 = dVar133 * dVar27;
  dVar6 = dVar90 * dVar27;
  dVar90 = dVar90 * dVar142;
  dVar133 = dVar133 * dVar142;
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xd];
  dVar40 = dVar13 * dVar27 * dVar1;
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xf];
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x13];
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x14];
  dVar145 = dVar11 * dVar27 * dVar1;
  dVar139 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x10];
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x12];
  dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xc];
  dVar146 = dVar11 * dVar142 * dVar3;
  dVar147 = dVar13 * dVar142 * dVar3;
  dVar15 = dVar38 * dVar27 * dVar1;
  dVar13 = dVar27 * dVar10 * dVar1;
  dVar16 = dVar10 * dVar142 * dVar3;
  dVar11 = dVar38 * dVar142 * dVar3;
  dVar94 = dVar5 * dVar5;
  dVar142 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x16];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x17];
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x15];
  dVar38 = dVar27 * dVar27;
  local_50 = dVar16 * dVar139 * dVar5 * dVar10 * dVar27 +
             dVar11 * dVar139 * dVar138 * dVar38 +
             dVar2 * dVar11 * dVar5 * dVar142 * dVar27 +
             dVar16 * dVar2 * dVar9 * dVar38 +
             dVar15 * dVar139 * dVar5 * dVar10 * dVar27 +
             dVar13 * dVar139 * dVar138 * dVar38 +
             dVar13 * dVar2 * dVar5 * dVar142 * dVar27 +
             dVar2 * dVar15 * dVar9 * dVar38 +
             dVar90 * dVar1 * dVar2 * dVar5 * dVar10 * dVar27 +
             dVar133 * dVar1 * dVar2 * dVar138 * dVar38 +
             dVar133 * dVar3 * dVar2 * dVar5 * dVar142 * dVar27 +
             dVar90 * dVar3 * dVar2 * dVar9 * dVar38 +
             dVar76 * dVar1 * dVar139 * dVar5 * dVar10 * dVar27 +
             dVar6 * dVar1 * dVar139 * dVar138 * dVar38 +
             dVar6 * dVar3 * dVar139 * dVar5 * dVar142 * dVar27 +
             dVar76 * dVar3 * dVar139 * dVar9 * dVar38 +
             dVar39 * dVar1 * dVar2 * dVar94 * dVar10 +
             dVar17 * dVar1 * dVar2 * dVar138 * dVar5 * dVar27 +
             dVar17 * dVar3 * dVar139 * dVar94 * dVar10 +
             dVar39 * dVar3 * dVar139 * dVar138 * dVar5 * dVar27 +
             dVar127 * dVar1 * dVar2 * dVar94 * dVar142 +
             dVar12 * dVar1 * dVar2 * dVar9 * dVar5 * dVar27 +
             dVar12 * dVar3 * dVar139 * dVar94 * dVar142 +
             dVar127 * dVar3 * dVar139 * dVar9 * dVar5 * dVar27 +
             dVar156 * dVar1 * dVar2 * dVar5 * dVar10 * dVar27 +
             dVar136 * dVar1 * dVar2 * dVar138 * dVar38 +
             dVar136 * dVar3 * dVar139 * dVar5 * dVar10 * dVar27 +
             dVar156 * dVar3 * dVar139 * dVar138 * dVar38 +
             dVar95 * dVar1 * dVar2 * dVar5 * dVar142 * dVar27 +
             dVar105 * dVar1 * dVar2 * dVar9 * dVar38 +
             dVar105 * dVar3 * dVar139 * dVar5 * dVar142 * dVar27 +
             dVar95 * dVar3 * dVar139 * dVar9 * dVar38 +
             dVar8 * dVar1 * dVar2 * dVar94 * dVar10 +
             dVar37 * dVar1 * dVar2 * dVar138 * dVar5 * dVar27 +
             dVar37 * dVar3 * dVar2 * dVar94 * dVar142 +
             dVar8 * dVar3 * dVar2 * dVar9 * dVar5 * dVar27 +
             dVar7 * dVar1 * dVar139 * dVar94 * dVar10 +
             dVar14 * dVar1 * dVar139 * dVar138 * dVar5 * dVar27 +
             dVar14 * dVar3 * dVar139 * dVar94 * dVar142 +
             dVar7 * dVar3 * dVar139 * dVar9 * dVar5 * dVar27 +
             dVar146 * dVar139 * dVar94 * dVar10 +
             dVar147 * dVar139 * dVar138 * dVar5 * dVar27 +
             dVar147 * dVar2 * dVar94 * dVar142 +
             dVar146 * dVar2 * dVar9 * dVar5 * dVar27 +
             dVar40 * dVar139 * dVar94 * dVar10 +
             dVar145 * dVar139 * dVar138 * dVar5 * dVar27 +
             dVar40 * dVar2 * dVar9 * dVar5 * dVar27 + dVar145 * dVar2 * dVar94 * dVar142;
  Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_(pCVar4,&local_50);
  Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::finished(&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline Eigen::Matrix<double, 5, 1> calculate_coefficients(const Eigen::Matrix<double, 27, 1> &x) {
    Eigen::Matrix<double, 5, 1> coeffs;
    coeffs << x[0]*x[5]*x[8]*x[11]*x[12]*x[17]*x[18]*std::pow(x[25], 2) - x[0]*x[5]*x[8]*x[11]*x[12]*x[17]*x[19]*x[24]*x[25] - x[0]*x[5]*x[8]*x[11]*x[13]*x[17]*x[18]*x[24]*x[25] + x[0]*x[5]*x[8]*x[11]*x[13]*x[17]*x[19]*std::pow(x[24], 2) - x[0]*x[5]*x[8]*x[11]*x[14]*x[15]*x[18]*std::pow(x[25], 2) + x[0]*x[5]*x[8]*x[11]*x[14]*x[15]*x[19]*x[24]*x[25] + x[0]*x[5]*x[8]*x[11]*x[14]*x[16]*x[18]*x[24]*x[25] - x[0]*x[5]*x[8]*x[11]*x[14]*x[16]*x[19]*std::pow(x[24], 2) + x[1]*x[5]*x[8]*x[11]*x[12]*x[17]*x[21]*std::pow(x[25], 2) - x[1]*x[5]*x[8]*x[11]*x[12]*x[17]*x[22]*x[24]*x[25] - x[1]*x[5]*x[8]*x[11]*x[13]*x[17]*x[21]*x[24]*x[25] + x[1]*x[5]*x[8]*x[11]*x[13]*x[17]*x[22]*std::pow(x[24], 2) - x[1]*x[5]*x[8]*x[11]*x[14]*x[15]*x[21]*std::pow(x[25], 2) + x[1]*x[5]*x[8]*x[11]*x[14]*x[15]*x[22]*x[24]*x[25] + x[1]*x[5]*x[8]*x[11]*x[14]*x[16]*x[21]*x[24]*x[25] - x[1]*x[5]*x[8]*x[11]*x[14]*x[16]*x[22]*std::pow(x[24], 2) - x[2]*x[3]*x[8]*x[9]*x[14]*x[17]*x[18]*std::pow(x[25], 2) + x[2]*x[3]*x[8]*x[9]*x[14]*x[17]*x[19]*x[24]*x[25] + x[2]*x[3]*x[8]*x[10]*x[14]*x[17]*x[18]*x[24]*x[25] - x[2]*x[3]*x[8]*x[10]*x[14]*x[17]*x[19]*std::pow(x[24], 2) + x[2]*x[3]*x[8]*x[11]*x[14]*x[15]*x[18]*std::pow(x[25], 2) - x[2]*x[3]*x[8]*x[11]*x[14]*x[15]*x[19]*x[24]*x[25] - x[2]*x[3]*x[8]*x[11]*x[14]*x[16]*x[18]*x[24]*x[25] + x[2]*x[3]*x[8]*x[11]*x[14]*x[16]*x[19]*std::pow(x[24], 2) - x[2]*x[4]*x[8]*x[9]*x[14]*x[17]*x[21]*std::pow(x[25], 2) + x[2]*x[4]*x[8]*x[9]*x[14]*x[17]*x[22]*x[24]*x[25] + x[2]*x[4]*x[8]*x[10]*x[14]*x[17]*x[21]*x[24]*x[25] - x[2]*x[4]*x[8]*x[10]*x[14]*x[17]*x[22]*std::pow(x[24], 2) + x[2]*x[4]*x[8]*x[11]*x[14]*x[15]*x[21]*std::pow(x[25], 2) - x[2]*x[4]*x[8]*x[11]*x[14]*x[15]*x[22]*x[24]*x[25] - x[2]*x[4]*x[8]*x[11]*x[14]*x[16]*x[21]*x[24]*x[25] + x[2]*x[4]*x[8]*x[11]*x[14]*x[16]*x[22]*std::pow(x[24], 2) + x[2]*x[5]*x[6]*x[9]*x[14]*x[17]*x[18]*std::pow(x[25], 2) - x[2]*x[5]*x[6]*x[9]*x[14]*x[17]*x[19]*x[24]*x[25] - x[2]*x[5]*x[6]*x[10]*x[14]*x[17]*x[18]*x[24]*x[25] + x[2]*x[5]*x[6]*x[10]*x[14]*x[17]*x[19]*std::pow(x[24], 2) - x[2]*x[5]*x[6]*x[11]*x[12]*x[17]*x[18]*std::pow(x[25], 2) + x[2]*x[5]*x[6]*x[11]*x[12]*x[17]*x[19]*x[24]*x[25] + x[2]*x[5]*x[6]*x[11]*x[13]*x[17]*x[18]*x[24]*x[25] - x[2]*x[5]*x[6]*x[11]*x[13]*x[17]*x[19]*std::pow(x[24], 2) + x[2]*x[5]*x[7]*x[9]*x[14]*x[17]*x[21]*std::pow(x[25], 2) - x[2]*x[5]*x[7]*x[9]*x[14]*x[17]*x[22]*x[24]*x[25] - x[2]*x[5]*x[7]*x[10]*x[14]*x[17]*x[21]*x[24]*x[25] + x[2]*x[5]*x[7]*x[10]*x[14]*x[17]*x[22]*std::pow(x[24], 2) - x[2]*x[5]*x[7]*x[11]*x[12]*x[17]*x[21]*std::pow(x[25], 2) + x[2]*x[5]*x[7]*x[11]*x[12]*x[17]*x[22]*x[24]*x[25] + x[2]*x[5]*x[7]*x[11]*x[13]*x[17]*x[21]*x[24]*x[25] - x[2]*x[5]*x[7]*x[11]*x[13]*x[17]*x[22]*std::pow(x[24], 2),  // NOLINT [whitespace/line_length]
     -x[0]*x[3]*x[8]*x[9]*x[14]*x[17]*x[18]*x[19]*x[25] + x[0]*x[3]*x[8]*x[9]*x[14]*x[17]*std::pow(x[19], 2)*x[24] + x[0]*x[3]*x[8]*x[10]*x[14]*x[17]*std::pow(x[18], 2)*x[25] - x[0]*x[3]*x[8]*x[10]*x[14]*x[17]*x[18]*x[19]*x[24] + x[0]*x[3]*x[8]*x[11]*x[12]*x[17]*x[18]*x[19]*x[25] - x[0]*x[3]*x[8]*x[11]*x[12]*x[17]*std::pow(x[19], 2)*x[24] - x[0]*x[3]*x[8]*x[11]*x[13]*x[17]*std::pow(x[18], 2)*x[25] + x[0]*x[3]*x[8]*x[11]*x[13]*x[17]*x[18]*x[19]*x[24] - x[0]*x[4]*x[8]*x[9]*x[14]*x[17]*x[19]*x[21]*x[25] + x[0]*x[4]*x[8]*x[9]*x[14]*x[17]*x[19]*x[22]*x[24] + x[0]*x[4]*x[8]*x[10]*x[14]*x[17]*x[18]*x[21]*x[25] - x[0]*x[4]*x[8]*x[10]*x[14]*x[17]*x[18]*x[22]*x[24] + x[0]*x[4]*x[8]*x[11]*x[12]*x[17]*x[18]*x[22]*x[25] - x[0]*x[4]*x[8]*x[11]*x[12]*x[17]*x[19]*x[22]*x[24] - x[0]*x[4]*x[8]*x[11]*x[13]*x[17]*x[18]*x[21]*x[25] + x[0]*x[4]*x[8]*x[11]*x[13]*x[17]*x[19]*x[21]*x[24] - x[0]*x[4]*x[8]*x[11]*x[14]*x[15]*x[18]*x[22]*x[25] + x[0]*x[4]*x[8]*x[11]*x[14]*x[15]*x[19]*x[21]*x[25] + x[0]*x[4]*x[8]*x[11]*x[14]*x[16]*x[18]*x[22]*x[24] - x[0]*x[4]*x[8]*x[11]*x[14]*x[16]*x[19]*x[21]*x[24] + x[0]*x[5]*x[6]*x[9]*x[14]*x[17]*x[18]*x[19]*x[25] - x[0]*x[5]*x[6]*x[9]*x[14]*x[17]*std::pow(x[19], 2)*x[24] - x[0]*x[5]*x[6]*x[10]*x[14]*x[17]*std::pow(x[18], 2)*x[25] + x[0]*x[5]*x[6]*x[10]*x[14]*x[17]*x[18]*x[19]*x[24] - x[0]*x[5]*x[6]*x[11]*x[14]*x[15]*x[18]*x[19]*x[25] + x[0]*x[5]*x[6]*x[11]*x[14]*x[15]*std::pow(x[19], 2)*x[24] + x[0]*x[5]*x[6]*x[11]*x[14]*x[16]*std::pow(x[18], 2)*x[25] - x[0]*x[5]*x[6]*x[11]*x[14]*x[16]*x[18]*x[19]*x[24] + x[0]*x[5]*x[7]*x[9]*x[14]*x[17]*x[19]*x[21]*x[25] - x[0]*x[5]*x[7]*x[9]*x[14]*x[17]*x[19]*x[22]*x[24] - x[0]*x[5]*x[7]*x[10]*x[14]*x[17]*x[18]*x[21]*x[25] + x[0]*x[5]*x[7]*x[10]*x[14]*x[17]*x[18]*x[22]*x[24] + x[0]*x[5]*x[7]*x[11]*x[12]*x[17]*x[18]*x[22]*x[25] - x[0]*x[5]*x[7]*x[11]*x[12]*x[17]*x[19]*x[21]*x[25] - x[0]*x[5]*x[7]*x[11]*x[13]*x[17]*x[18]*x[22]*x[24] + x[0]*x[5]*x[7]*x[11]*x[13]*x[17]*x[19]*x[21]*x[24] - x[0]*x[5]*x[7]*x[11]*x[14]*x[15]*x[18]*x[22]*x[25] + x[0]*x[5]*x[7]*x[11]*x[14]*x[15]*x[19]*x[22]*x[24] + x[0]*x[5]*x[7]*x[11]*x[14]*x[16]*x[18]*x[21]*x[25] - x[0]*x[5]*x[7]*x[11]*x[14]*x[16]*x[19]*x[21]*x[24] + x[0]*x[5]*x[8]*x[9]*x[12]*x[17]*x[19]*x[25]*x[26] - x[0]*x[5]*x[8]*x[9]*x[12]*x[17]*x[20]*std::pow(x[25], 2) - x[0]*x[5]*x[8]*x[9]*x[13]*x[17]*x[19]*x[24]*x[26] + x[0]*x[5]*x[8]*x[9]*x[13]*x[17]*x[20]*x[24]*x[25] - x[0]*x[5]*x[8]*x[9]*x[14]*x[15]*x[19]*x[25]*x[26] + x[0]*x[5]*x[8]*x[9]*x[14]*x[15]*x[20]*std::pow(x[25], 2) + x[0]*x[5]*x[8]*x[9]*x[14]*x[16]*x[19]*x[24]*x[26] - x[0]*x[5]*x[8]*x[9]*x[14]*x[16]*x[20]*x[24]*x[25] - x[0]*x[5]*x[8]*x[10]*x[12]*x[17]*x[18]*x[25]*x[26] + x[0]*x[5]*x[8]*x[10]*x[12]*x[17]*x[20]*x[24]*x[25] + x[0]*x[5]*x[8]*x[10]*x[13]*x[17]*x[18]*x[24]*x[26] - x[0]*x[5]*x[8]*x[10]*x[13]*x[17]*x[20]*std::pow(x[24], 2) + x[0]*x[5]*x[8]*x[10]*x[14]*x[15]*x[18]*x[25]*x[26] - x[0]*x[5]*x[8]*x[10]*x[14]*x[15]*x[20]*x[24]*x[25] - x[0]*x[5]*x[8]*x[10]*x[14]*x[16]*x[18]*x[24]*x[26] + x[0]*x[5]*x[8]*x[10]*x[14]*x[16]*x[20]*std::pow(x[24], 2) - x[0]*x[5]*x[8]*x[11]*x[12]*x[16]*x[18]*x[25]*x[26] + x[0]*x[5]*x[8]*x[11]*x[12]*x[16]*x[19]*x[24]*x[26] + x[0]*x[5]*x[8]*x[11]*x[13]*x[15]*x[18]*x[25]*x[26] - x[0]*x[5]*x[8]*x[11]*x[13]*x[15]*x[19]*x[24]*x[26] - x[1]*x[3]*x[8]*x[9]*x[14]*x[17]*x[18]*x[22]*x[25] + x[1]*x[3]*x[8]*x[9]*x[14]*x[17]*x[19]*x[22]*x[24] + x[1]*x[3]*x[8]*x[10]*x[14]*x[17]*x[18]*x[21]*x[25] - x[1]*x[3]*x[8]*x[10]*x[14]*x[17]*x[19]*x[21]*x[24] + x[1]*x[3]*x[8]*x[11]*x[12]*x[17]*x[19]*x[21]*x[25] - x[1]*x[3]*x[8]*x[11]*x[12]*x[17]*x[19]*x[22]*x[24] - x[1]*x[3]*x[8]*x[11]*x[13]*x[17]*x[18]*x[21]*x[25] + x[1]*x[3]*x[8]*x[11]*x[13]*x[17]*x[18]*x[22]*x[24] + x[1]*x[3]*x[8]*x[11]*x[14]*x[15]*x[18]*x[22]*x[25] - x[1]*x[3]*x[8]*x[11]*x[14]*x[15]*x[19]*x[21]*x[25] - x[1]*x[3]*x[8]*x[11]*x[14]*x[16]*x[18]*x[22]*x[24] + x[1]*x[3]*x[8]*x[11]*x[14]*x[16]*x[19]*x[21]*x[24] - x[1]*x[4]*x[8]*x[9]*x[14]*x[17]*x[21]*x[22]*x[25] + x[1]*x[4]*x[8]*x[9]*x[14]*x[17]*std::pow(x[22], 2)*x[24] + x[1]*x[4]*x[8]*x[10]*x[14]*x[17]*std::pow(x[21], 2)*x[25] - x[1]*x[4]*x[8]*x[10]*x[14]*x[17]*x[21]*x[22]*x[24] + x[1]*x[4]*x[8]*x[11]*x[12]*x[17]*x[21]*x[22]*x[25] - x[1]*x[4]*x[8]*x[11]*x[12]*x[17]*std::pow(x[22], 2)*x[24] - x[1]*x[4]*x[8]*x[11]*x[13]*x[17]*std::pow(x[21], 2)*x[25] + x[1]*x[4]*x[8]*x[11]*x[13]*x[17]*x[21]*x[22]*x[24] + x[1]*x[5]*x[6]*x[9]*x[14]*x[17]*x[18]*x[22]*x[25] - x[1]*x[5]*x[6]*x[9]*x[14]*x[17]*x[19]*x[22]*x[24] - x[1]*x[5]*x[6]*x[10]*x[14]*x[17]*x[18]*x[21]*x[25] + x[1]*x[5]*x[6]*x[10]*x[14]*x[17]*x[19]*x[21]*x[24] - x[1]*x[5]*x[6]*x[11]*x[12]*x[17]*x[18]*x[22]*x[25] + x[1]*x[5]*x[6]*x[11]*x[12]*x[17]*x[19]*x[21]*x[25] + x[1]*x[5]*x[6]*x[11]*x[13]*x[17]*x[18]*x[22]*x[24] - x[1]*x[5]*x[6]*x[11]*x[13]*x[17]*x[19]*x[21]*x[24] - x[1]*x[5]*x[6]*x[11]*x[14]*x[15]*x[19]*x[21]*x[25] + x[1]*x[5]*x[6]*x[11]*x[14]*x[15]*x[19]*x[22]*x[24] + x[1]*x[5]*x[6]*x[11]*x[14]*x[16]*x[18]*x[21]*x[25] - x[1]*x[5]*x[6]*x[11]*x[14]*x[16]*x[18]*x[22]*x[24] + x[1]*x[5]*x[7]*x[9]*x[14]*x[17]*x[21]*x[22]*x[25] - x[1]*x[5]*x[7]*x[9]*x[14]*x[17]*std::pow(x[22], 2)*x[24] - x[1]*x[5]*x[7]*x[10]*x[14]*x[17]*std::pow(x[21], 2)*x[25] + x[1]*x[5]*x[7]*x[10]*x[14]*x[17]*x[21]*x[22]*x[24] - x[1]*x[5]*x[7]*x[11]*x[14]*x[15]*x[21]*x[22]*x[25] + x[1]*x[5]*x[7]*x[11]*x[14]*x[15]*std::pow(x[22], 2)*x[24] + x[1]*x[5]*x[7]*x[11]*x[14]*x[16]*std::pow(x[21], 2)*x[25] - x[1]*x[5]*x[7]*x[11]*x[14]*x[16]*x[21]*x[22]*x[24] + x[1]*x[5]*x[8]*x[9]*x[12]*x[17]*x[22]*x[25]*x[26] - x[1]*x[5]*x[8]*x[9]*x[12]*x[17]*x[23]*std::pow(x[25], 2) - x[1]*x[5]*x[8]*x[9]*x[13]*x[17]*x[22]*x[24]*x[26] + x[1]*x[5]*x[8]*x[9]*x[13]*x[17]*x[23]*x[24]*x[25] - x[1]*x[5]*x[8]*x[9]*x[14]*x[15]*x[22]*x[25]*x[26] + x[1]*x[5]*x[8]*x[9]*x[14]*x[15]*x[23]*std::pow(x[25], 2) + x[1]*x[5]*x[8]*x[9]*x[14]*x[16]*x[22]*x[24]*x[26] - x[1]*x[5]*x[8]*x[9]*x[14]*x[16]*x[23]*x[24]*x[25] - x[1]*x[5]*x[8]*x[10]*x[12]*x[17]*x[21]*x[25]*x[26] + x[1]*x[5]*x[8]*x[10]*x[12]*x[17]*x[23]*x[24]*x[25] + x[1]*x[5]*x[8]*x[10]*x[13]*x[17]*x[21]*x[24]*x[26] - x[1]*x[5]*x[8]*x[10]*x[13]*x[17]*x[23]*std::pow(x[24], 2) + x[1]*x[5]*x[8]*x[10]*x[14]*x[15]*x[21]*x[25]*x[26] - x[1]*x[5]*x[8]*x[10]*x[14]*x[15]*x[23]*x[24]*x[25] - x[1]*x[5]*x[8]*x[10]*x[14]*x[16]*x[21]*x[24]*x[26] + x[1]*x[5]*x[8]*x[10]*x[14]*x[16]*x[23]*std::pow(x[24], 2) - x[1]*x[5]*x[8]*x[11]*x[12]*x[16]*x[21]*x[25]*x[26] + x[1]*x[5]*x[8]*x[11]*x[12]*x[16]*x[22]*x[24]*x[26] + x[1]*x[5]*x[8]*x[11]*x[13]*x[15]*x[21]*x[25]*x[26] - x[1]*x[5]*x[8]*x[11]*x[13]*x[15]*x[22]*x[24]*x[26] - x[2]*x[3]*x[6]*x[11]*x[12]*x[17]*x[18]*x[19]*x[25] + x[2]*x[3]*x[6]*x[11]*x[12]*x[17]*std::pow(x[19], 2)*x[24] + x[2]*x[3]*x[6]*x[11]*x[13]*x[17]*std::pow(x[18], 2)*x[25] - x[2]*x[3]*x[6]*x[11]*x[13]*x[17]*x[18]*x[19]*x[24] + x[2]*x[3]*x[6]*x[11]*x[14]*x[15]*x[18]*x[19]*x[25] - x[2]*x[3]*x[6]*x[11]*x[14]*x[15]*std::pow(x[19], 2)*x[24] - x[2]*x[3]*x[6]*x[11]*x[14]*x[16]*std::pow(x[18], 2)*x[25] + x[2]*x[3]*x[6]*x[11]*x[14]*x[16]*x[18]*x[19]*x[24] - x[2]*x[3]*x[7]*x[9]*x[14]*x[17]*x[18]*x[22]*x[25] + x[2]*x[3]*x[7]*x[9]*x[14]*x[17]*x[19]*x[21]*x[25] + x[2]*x[3]*x[7]*x[10]*x[14]*x[17]*x[18]*x[22]*x[24] - x[2]*x[3]*x[7]*x[10]*x[14]*x[17]*x[19]*x[21]*x[24] - x[2]*x[3]*x[7]*x[11]*x[12]*x[17]*x[19]*x[21]*x[25] + x[2]*x[3]*x[7]*x[11]*x[12]*x[17]*x[19]*x[22]*x[24] + x[2]*x[3]*x[7]*x[11]*x[13]*x[17]*x[18]*x[21]*x[25] - x[2]*x[3]*x[7]*x[11]*x[13]*x[17]*x[18]*x[22]*x[24] + x[2]*x[3]*x[7]*x[11]*x[14]*x[15]*x[18]*x[22]*x[25] - x[2]*x[3]*x[7]*x[11]*x[14]*x[15]*x[19]*x[22]*x[24] - x[2]*x[3]*x[7]*x[11]*x[14]*x[16]*x[18]*x[21]*x[25] + x[2]*x[3]*x[7]*x[11]*x[14]*x[16]*x[19]*x[21]*x[24] - x[2]*x[3]*x[8]*x[9]*x[12]*x[17]*x[19]*x[25]*x[26] + x[2]*x[3]*x[8]*x[9]*x[12]*x[17]*x[20]*std::pow(x[25], 2) + x[2]*x[3]*x[8]*x[9]*x[13]*x[17]*x[18]*x[25]*x[26] - x[2]*x[3]*x[8]*x[9]*x[13]*x[17]*x[20]*x[24]*x[25] + x[2]*x[3]*x[8]*x[9]*x[14]*x[16]*x[18]*x[25]*x[26] - x[2]*x[3]*x[8]*x[9]*x[14]*x[16]*x[19]*x[24]*x[26] + x[2]*x[3]*x[8]*x[10]*x[12]*x[17]*x[19]*x[24]*x[26] - x[2]*x[3]*x[8]*x[10]*x[12]*x[17]*x[20]*x[24]*x[25] - x[2]*x[3]*x[8]*x[10]*x[13]*x[17]*x[18]*x[24]*x[26] + x[2]*x[3]*x[8]*x[10]*x[13]*x[17]*x[20]*std::pow(x[24], 2) - x[2]*x[3]*x[8]*x[10]*x[14]*x[15]*x[18]*x[25]*x[26] + x[2]*x[3]*x[8]*x[10]*x[14]*x[15]*x[19]*x[24]*x[26] + x[2]*x[3]*x[8]*x[11]*x[12]*x[15]*x[19]*x[25]*x[26] - x[2]*x[3]*x[8]*x[11]*x[12]*x[15]*x[20]*std::pow(x[25], 2) - x[2]*x[3]*x[8]*x[11]*x[12]*x[16]*x[19]*x[24]*x[26] + x[2]*x[3]*x[8]*x[11]*x[12]*x[16]*x[20]*x[24]*x[25] - x[2]*x[3]*x[8]*x[11]*x[13]*x[15]*x[18]*x[25]*x[26] + x[2]*x[3]*x[8]*x[11]*x[13]*x[15]*x[20]*x[24]*x[25] + x[2]*x[3]*x[8]*x[11]*x[13]*x[16]*x[18]*x[24]*x[26] - x[2]*x[3]*x[8]*x[11]*x[13]*x[16]*x[20]*std::pow(x[24], 2) + x[2]*x[4]*x[6]*x[9]*x[14]*x[17]*x[18]*x[22]*x[25] - x[2]*x[4]*x[6]*x[9]*x[14]*x[17]*x[19]*x[21]*x[25] - x[2]*x[4]*x[6]*x[10]*x[14]*x[17]*x[18]*x[22]*x[24] + x[2]*x[4]*x[6]*x[10]*x[14]*x[17]*x[19]*x[21]*x[24] - x[2]*x[4]*x[6]*x[11]*x[12]*x[17]*x[18]*x[22]*x[25] + x[2]*x[4]*x[6]*x[11]*x[12]*x[17]*x[19]*x[22]*x[24] + x[2]*x[4]*x[6]*x[11]*x[13]*x[17]*x[18]*x[21]*x[25] - x[2]*x[4]*x[6]*x[11]*x[13]*x[17]*x[19]*x[21]*x[24] + x[2]*x[4]*x[6]*x[11]*x[14]*x[15]*x[19]*x[21]*x[25] - x[2]*x[4]*x[6]*x[11]*x[14]*x[15]*x[19]*x[22]*x[24] - x[2]*x[4]*x[6]*x[11]*x[14]*x[16]*x[18]*x[21]*x[25] + x[2]*x[4]*x[6]*x[11]*x[14]*x[16]*x[18]*x[22]*x[24] - x[2]*x[4]*x[7]*x[11]*x[12]*x[17]*x[21]*x[22]*x[25] + x[2]*x[4]*x[7]*x[11]*x[12]*x[17]*std::pow(x[22], 2)*x[24] + x[2]*x[4]*x[7]*x[11]*x[13]*x[17]*std::pow(x[21], 2)*x[25] - x[2]*x[4]*x[7]*x[11]*x[13]*x[17]*x[21]*x[22]*x[24] + x[2]*x[4]*x[7]*x[11]*x[14]*x[15]*x[21]*x[22]*x[25] - x[2]*x[4]*x[7]*x[11]*x[14]*x[15]*std::pow(x[22], 2)*x[24] - x[2]*x[4]*x[7]*x[11]*x[14]*x[16]*std::pow(x[21], 2)*x[25] + x[2]*x[4]*x[7]*x[11]*x[14]*x[16]*x[21]*x[22]*x[24] - x[2]*x[4]*x[8]*x[9]*x[12]*x[17]*x[22]*x[25]*x[26] + x[2]*x[4]*x[8]*x[9]*x[12]*x[17]*x[23]*std::pow(x[25], 2) + x[2]*x[4]*x[8]*x[9]*x[13]*x[17]*x[21]*x[25]*x[26] - x[2]*x[4]*x[8]*x[9]*x[13]*x[17]*x[23]*x[24]*x[25] + x[2]*x[4]*x[8]*x[9]*x[14]*x[16]*x[21]*x[25]*x[26] - x[2]*x[4]*x[8]*x[9]*x[14]*x[16]*x[22]*x[24]*x[26] + x[2]*x[4]*x[8]*x[10]*x[12]*x[17]*x[22]*x[24]*x[26] - x[2]*x[4]*x[8]*x[10]*x[12]*x[17]*x[23]*x[24]*x[25] - x[2]*x[4]*x[8]*x[10]*x[13]*x[17]*x[21]*x[24]*x[26] + x[2]*x[4]*x[8]*x[10]*x[13]*x[17]*x[23]*std::pow(x[24], 2) - x[2]*x[4]*x[8]*x[10]*x[14]*x[15]*x[21]*x[25]*x[26] + x[2]*x[4]*x[8]*x[10]*x[14]*x[15]*x[22]*x[24]*x[26] + x[2]*x[4]*x[8]*x[11]*x[12]*x[15]*x[22]*x[25]*x[26] - x[2]*x[4]*x[8]*x[11]*x[12]*x[15]*x[23]*std::pow(x[25], 2) - x[2]*x[4]*x[8]*x[11]*x[12]*x[16]*x[22]*x[24]*x[26] + x[2]*x[4]*x[8]*x[11]*x[12]*x[16]*x[23]*x[24]*x[25] - x[2]*x[4]*x[8]*x[11]*x[13]*x[15]*x[21]*x[25]*x[26] + x[2]*x[4]*x[8]*x[11]*x[13]*x[15]*x[23]*x[24]*x[25] + x[2]*x[4]*x[8]*x[11]*x[13]*x[16]*x[21]*x[24]*x[26] - x[2]*x[4]*x[8]*x[11]*x[13]*x[16]*x[23]*std::pow(x[24], 2) - x[2]*x[5]*x[6]*x[9]*x[13]*x[17]*x[18]*x[25]*x[26] + x[2]*x[5]*x[6]*x[9]*x[13]*x[17]*x[19]*x[24]*x[26] + x[2]*x[5]*x[6]*x[9]*x[14]*x[15]*x[19]*x[25]*x[26] - x[2]*x[5]*x[6]*x[9]*x[14]*x[15]*x[20]*std::pow(x[25], 2) - x[2]*x[5]*x[6]*x[9]*x[14]*x[16]*x[18]*x[25]*x[26] + x[2]*x[5]*x[6]*x[9]*x[14]*x[16]*x[20]*x[24]*x[25] + x[2]*x[5]*x[6]*x[10]*x[12]*x[17]*x[18]*x[25]*x[26] - x[2]*x[5]*x[6]*x[10]*x[12]*x[17]*x[19]*x[24]*x[26] - x[2]*x[5]*x[6]*x[10]*x[14]*x[15]*x[19]*x[24]*x[26] + x[2]*x[5]*x[6]*x[10]*x[14]*x[15]*x[20]*x[24]*x[25] + x[2]*x[5]*x[6]*x[10]*x[14]*x[16]*x[18]*x[24]*x[26] - x[2]*x[5]*x[6]*x[10]*x[14]*x[16]*x[20]*std::pow(x[24], 2) - x[2]*x[5]*x[6]*x[11]*x[12]*x[15]*x[19]*x[25]*x[26] + x[2]*x[5]*x[6]*x[11]*x[12]*x[15]*x[20]*std::pow(x[25], 2) + x[2]*x[5]*x[6]*x[11]*x[12]*x[16]*x[18]*x[25]*x[26] - x[2]*x[5]*x[6]*x[11]*x[12]*x[16]*x[20]*x[24]*x[25] + x[2]*x[5]*x[6]*x[11]*x[13]*x[15]*x[19]*x[24]*x[26] - x[2]*x[5]*x[6]*x[11]*x[13]*x[15]*x[20]*x[24]*x[25] - x[2]*x[5]*x[6]*x[11]*x[13]*x[16]*x[18]*x[24]*x[26] + x[2]*x[5]*x[6]*x[11]*x[13]*x[16]*x[20]*std::pow(x[24], 2) - x[2]*x[5]*x[7]*x[9]*x[13]*x[17]*x[21]*x[25]*x[26] + x[2]*x[5]*x[7]*x[9]*x[13]*x[17]*x[22]*x[24]*x[26] + x[2]*x[5]*x[7]*x[9]*x[14]*x[15]*x[22]*x[25]*x[26] - x[2]*x[5]*x[7]*x[9]*x[14]*x[15]*x[23]*std::pow(x[25], 2) - x[2]*x[5]*x[7]*x[9]*x[14]*x[16]*x[21]*x[25]*x[26] + x[2]*x[5]*x[7]*x[9]*x[14]*x[16]*x[23]*x[24]*x[25] + x[2]*x[5]*x[7]*x[10]*x[12]*x[17]*x[21]*x[25]*x[26] - x[2]*x[5]*x[7]*x[10]*x[12]*x[17]*x[22]*x[24]*x[26] - x[2]*x[5]*x[7]*x[10]*x[14]*x[15]*x[22]*x[24]*x[26] + x[2]*x[5]*x[7]*x[10]*x[14]*x[15]*x[23]*x[24]*x[25] + x[2]*x[5]*x[7]*x[10]*x[14]*x[16]*x[21]*x[24]*x[26] - x[2]*x[5]*x[7]*x[10]*x[14]*x[16]*x[23]*std::pow(x[24], 2) - x[2]*x[5]*x[7]*x[11]*x[12]*x[15]*x[22]*x[25]*x[26] + x[2]*x[5]*x[7]*x[11]*x[12]*x[15]*x[23]*std::pow(x[25], 2) + x[2]*x[5]*x[7]*x[11]*x[12]*x[16]*x[21]*x[25]*x[26] - x[2]*x[5]*x[7]*x[11]*x[12]*x[16]*x[23]*x[24]*x[25] + x[2]*x[5]*x[7]*x[11]*x[13]*x[15]*x[22]*x[24]*x[26] - x[2]*x[5]*x[7]*x[11]*x[13]*x[15]*x[23]*x[24]*x[25] - x[2]*x[5]*x[7]*x[11]*x[13]*x[16]*x[21]*x[24]*x[26] + x[2]*x[5]*x[7]*x[11]*x[13]*x[16]*x[23]*std::pow(x[24], 2),  // NOLINT [whitespace/line_length]
     -x[0]*x[3]*x[7]*x[9]*x[14]*x[17]*x[18]*x[19]*x[22] + x[0]*x[3]*x[7]*x[9]*x[14]*x[17]*std::pow(x[19], 2)*x[21] + x[0]*x[3]*x[7]*x[10]*x[14]*x[17]*std::pow(x[18], 2)*x[22] - x[0]*x[3]*x[7]*x[10]*x[14]*x[17]*x[18]*x[19]*x[21] + x[0]*x[3]*x[7]*x[11]*x[12]*x[17]*x[18]*x[19]*x[22] - x[0]*x[3]*x[7]*x[11]*x[12]*x[17]*std::pow(x[19], 2)*x[21] - x[0]*x[3]*x[7]*x[11]*x[13]*x[17]*std::pow(x[18], 2)*x[22] + x[0]*x[3]*x[7]*x[11]*x[13]*x[17]*x[18]*x[19]*x[21] + x[0]*x[3]*x[8]*x[9]*x[13]*x[17]*x[18]*x[20]*x[25] - x[0]*x[3]*x[8]*x[9]*x[13]*x[17]*x[19]*x[20]*x[24] - x[0]*x[3]*x[8]*x[9]*x[14]*x[15]*std::pow(x[19], 2)*x[26] + x[0]*x[3]*x[8]*x[9]*x[14]*x[15]*x[19]*x[20]*x[25] + x[0]*x[3]*x[8]*x[9]*x[14]*x[16]*x[18]*x[19]*x[26] - x[0]*x[3]*x[8]*x[9]*x[14]*x[16]*x[19]*x[20]*x[24] - x[0]*x[3]*x[8]*x[10]*x[12]*x[17]*x[18]*x[20]*x[25] + x[0]*x[3]*x[8]*x[10]*x[12]*x[17]*x[19]*x[20]*x[24] + x[0]*x[3]*x[8]*x[10]*x[14]*x[15]*x[18]*x[19]*x[26] - x[0]*x[3]*x[8]*x[10]*x[14]*x[15]*x[18]*x[20]*x[25] - x[0]*x[3]*x[8]*x[10]*x[14]*x[16]*std::pow(x[18], 2)*x[26] + x[0]*x[3]*x[8]*x[10]*x[14]*x[16]*x[18]*x[20]*x[24] + x[0]*x[3]*x[8]*x[11]*x[12]*x[15]*std::pow(x[19], 2)*x[26] - x[0]*x[3]*x[8]*x[11]*x[12]*x[15]*x[19]*x[20]*x[25] - x[0]*x[3]*x[8]*x[11]*x[12]*x[16]*x[18]*x[19]*x[26] + x[0]*x[3]*x[8]*x[11]*x[12]*x[16]*x[19]*x[20]*x[24] - x[0]*x[3]*x[8]*x[11]*x[13]*x[15]*x[18]*x[19]*x[26] + x[0]*x[3]*x[8]*x[11]*x[13]*x[15]*x[18]*x[20]*x[25] + x[0]*x[3]*x[8]*x[11]*x[13]*x[16]*std::pow(x[18], 2)*x[26] - x[0]*x[3]*x[8]*x[11]*x[13]*x[16]*x[18]*x[20]*x[24] + x[0]*x[4]*x[6]*x[9]*x[14]*x[17]*x[18]*x[19]*x[22] - x[0]*x[4]*x[6]*x[9]*x[14]*x[17]*std::pow(x[19], 2)*x[21] - x[0]*x[4]*x[6]*x[10]*x[14]*x[17]*std::pow(x[18], 2)*x[22] + x[0]*x[4]*x[6]*x[10]*x[14]*x[17]*x[18]*x[19]*x[21] - x[0]*x[4]*x[6]*x[11]*x[14]*x[15]*x[18]*x[19]*x[22] + x[0]*x[4]*x[6]*x[11]*x[14]*x[15]*std::pow(x[19], 2)*x[21] + x[0]*x[4]*x[6]*x[11]*x[14]*x[16]*std::pow(x[18], 2)*x[22] - x[0]*x[4]*x[6]*x[11]*x[14]*x[16]*x[18]*x[19]*x[21] + x[0]*x[4]*x[7]*x[11]*x[12]*x[17]*x[18]*std::pow(x[22], 2) - x[0]*x[4]*x[7]*x[11]*x[12]*x[17]*x[19]*x[21]*x[22] - x[0]*x[4]*x[7]*x[11]*x[13]*x[17]*x[18]*x[21]*x[22] + x[0]*x[4]*x[7]*x[11]*x[13]*x[17]*x[19]*std::pow(x[21], 2) - x[0]*x[4]*x[7]*x[11]*x[14]*x[15]*x[18]*std::pow(x[22], 2) + x[0]*x[4]*x[7]*x[11]*x[14]*x[15]*x[19]*x[21]*x[22] + x[0]*x[4]*x[7]*x[11]*x[14]*x[16]*x[18]*x[21]*x[22] - x[0]*x[4]*x[7]*x[11]*x[14]*x[16]*x[19]*std::pow(x[21], 2) + x[0]*x[4]*x[8]*x[9]*x[12]*x[17]*x[19]*x[23]*x[25] - x[0]*x[4]*x[8]*x[9]*x[12]*x[17]*x[20]*x[22]*x[25] - x[0]*x[4]*x[8]*x[9]*x[13]*x[17]*x[19]*x[23]*x[24] + x[0]*x[4]*x[8]*x[9]*x[13]*x[17]*x[20]*x[21]*x[25] - x[0]*x[4]*x[8]*x[9]*x[14]*x[15]*x[19]*x[22]*x[26] + x[0]*x[4]*x[8]*x[9]*x[14]*x[15]*x[20]*x[22]*x[25] + x[0]*x[4]*x[8]*x[9]*x[14]*x[16]*x[19]*x[21]*x[26] - x[0]*x[4]*x[8]*x[9]*x[14]*x[16]*x[20]*x[22]*x[24] - x[0]*x[4]*x[8]*x[10]*x[12]*x[17]*x[18]*x[23]*x[25] + x[0]*x[4]*x[8]*x[10]*x[12]*x[17]*x[20]*x[22]*x[24] + x[0]*x[4]*x[8]*x[10]*x[13]*x[17]*x[18]*x[23]*x[24] - x[0]*x[4]*x[8]*x[10]*x[13]*x[17]*x[20]*x[21]*x[24] + x[0]*x[4]*x[8]*x[10]*x[14]*x[15]*x[18]*x[22]*x[26] - x[0]*x[4]*x[8]*x[10]*x[14]*x[15]*x[20]*x[21]*x[25] - x[0]*x[4]*x[8]*x[10]*x[14]*x[16]*x[18]*x[21]*x[26] + x[0]*x[4]*x[8]*x[10]*x[14]*x[16]*x[20]*x[21]*x[24] + x[0]*x[4]*x[8]*x[11]*x[12]*x[15]*x[19]*x[22]*x[26] - x[0]*x[4]*x[8]*x[11]*x[12]*x[15]*x[19]*x[23]*x[25] - x[0]*x[4]*x[8]*x[11]*x[12]*x[16]*x[18]*x[22]*x[26] + x[0]*x[4]*x[8]*x[11]*x[12]*x[16]*x[19]*x[23]*x[24] + x[0]*x[4]*x[8]*x[11]*x[13]*x[15]*x[18]*x[23]*x[25] - x[0]*x[4]*x[8]*x[11]*x[13]*x[15]*x[19]*x[21]*x[26] + x[0]*x[4]*x[8]*x[11]*x[13]*x[16]*x[18]*x[21]*x[26] - x[0]*x[4]*x[8]*x[11]*x[13]*x[16]*x[18]*x[23]*x[24] + x[0]*x[5]*x[6]*x[9]*x[12]*x[17]*std::pow(x[19], 2)*x[26] - x[0]*x[5]*x[6]*x[9]*x[12]*x[17]*x[19]*x[20]*x[25] - x[0]*x[5]*x[6]*x[9]*x[13]*x[17]*x[18]*x[19]*x[26] + x[0]*x[5]*x[6]*x[9]*x[13]*x[17]*x[19]*x[20]*x[24] - x[0]*x[5]*x[6]*x[9]*x[14]*x[16]*x[18]*x[20]*x[25] + x[0]*x[5]*x[6]*x[9]*x[14]*x[16]*x[19]*x[20]*x[24] - x[0]*x[5]*x[6]*x[10]*x[12]*x[17]*x[18]*x[19]*x[26] + x[0]*x[5]*x[6]*x[10]*x[12]*x[17]*x[18]*x[20]*x[25] + x[0]*x[5]*x[6]*x[10]*x[13]*x[17]*std::pow(x[18], 2)*x[26] - x[0]*x[5]*x[6]*x[10]*x[13]*x[17]*x[18]*x[20]*x[24] + x[0]*x[5]*x[6]*x[10]*x[14]*x[15]*x[18]*x[20]*x[25] - x[0]*x[5]*x[6]*x[10]*x[14]*x[15]*x[19]*x[20]*x[24] - x[0]*x[5]*x[6]*x[11]*x[12]*x[15]*std::pow(x[19], 2)*x[26] + x[0]*x[5]*x[6]*x[11]*x[12]*x[15]*x[19]*x[20]*x[25] + x[0]*x[5]*x[6]*x[11]*x[12]*x[16]*x[18]*x[19]*x[26] - x[0]*x[5]*x[6]*x[11]*x[12]*x[16]*x[18]*x[20]*x[25] + x[0]*x[5]*x[6]*x[11]*x[13]*x[15]*x[18]*x[19]*x[26] - x[0]*x[5]*x[6]*x[11]*x[13]*x[15]*x[19]*x[20]*x[24] - x[0]*x[5]*x[6]*x[11]*x[13]*x[16]*std::pow(x[18], 2)*x[26] + x[0]*x[5]*x[6]*x[11]*x[13]*x[16]*x[18]*x[20]*x[24] + x[0]*x[5]*x[7]*x[9]*x[12]*x[17]*x[19]*x[22]*x[26] - x[0]*x[5]*x[7]*x[9]*x[12]*x[17]*x[20]*x[22]*x[25] - x[0]*x[5]*x[7]*x[9]*x[13]*x[17]*x[19]*x[21]*x[26] + x[0]*x[5]*x[7]*x[9]*x[13]*x[17]*x[20]*x[22]*x[24] - x[0]*x[5]*x[7]*x[9]*x[14]*x[15]*x[19]*x[23]*x[25] + x[0]*x[5]*x[7]*x[9]*x[14]*x[15]*x[20]*x[22]*x[25] + x[0]*x[5]*x[7]*x[9]*x[14]*x[16]*x[19]*x[23]*x[24] - x[0]*x[5]*x[7]*x[9]*x[14]*x[16]*x[20]*x[21]*x[25] - x[0]*x[5]*x[7]*x[10]*x[12]*x[17]*x[18]*x[22]*x[26] + x[0]*x[5]*x[7]*x[10]*x[12]*x[17]*x[20]*x[21]*x[25] + x[0]*x[5]*x[7]*x[10]*x[13]*x[17]*x[18]*x[21]*x[26] - x[0]*x[5]*x[7]*x[10]*x[13]*x[17]*x[20]*x[21]*x[24] + x[0]*x[5]*x[7]*x[10]*x[14]*x[15]*x[18]*x[23]*x[25] - x[0]*x[5]*x[7]*x[10]*x[14]*x[15]*x[20]*x[22]*x[24] - x[0]*x[5]*x[7]*x[10]*x[14]*x[16]*x[18]*x[23]*x[24] + x[0]*x[5]*x[7]*x[10]*x[14]*x[16]*x[20]*x[21]*x[24] - x[0]*x[5]*x[7]*x[11]*x[12]*x[15]*x[19]*x[22]*x[26] + x[0]*x[5]*x[7]*x[11]*x[12]*x[15]*x[19]*x[23]*x[25] - x[0]*x[5]*x[7]*x[11]*x[12]*x[16]*x[18]*x[23]*x[25] + x[0]*x[5]*x[7]*x[11]*x[12]*x[16]*x[19]*x[21]*x[26] + x[0]*x[5]*x[7]*x[11]*x[13]*x[15]*x[18]*x[22]*x[26] - x[0]*x[5]*x[7]*x[11]*x[13]*x[15]*x[19]*x[23]*x[24] - x[0]*x[5]*x[7]*x[11]*x[13]*x[16]*x[18]*x[21]*x[26] + x[0]*x[5]*x[7]*x[11]*x[13]*x[16]*x[18]*x[23]*x[24] - x[0]*x[5]*x[8]*x[9]*x[12]*x[16]*x[19]*std::pow(x[26], 2) + x[0]*x[5]*x[8]*x[9]*x[12]*x[16]*x[20]*x[25]*x[26] + x[0]*x[5]*x[8]*x[9]*x[13]*x[15]*x[19]*std::pow(x[26], 2) - x[0]*x[5]*x[8]*x[9]*x[13]*x[15]*x[20]*x[25]*x[26] + x[0]*x[5]*x[8]*x[10]*x[12]*x[16]*x[18]*std::pow(x[26], 2) - x[0]*x[5]*x[8]*x[10]*x[12]*x[16]*x[20]*x[24]*x[26] - x[0]*x[5]*x[8]*x[10]*x[13]*x[15]*x[18]*std::pow(x[26], 2) + x[0]*x[5]*x[8]*x[10]*x[13]*x[15]*x[20]*x[24]*x[26] - x[1]*x[3]*x[6]*x[11]*x[12]*x[17]*x[18]*x[19]*x[22] + x[1]*x[3]*x[6]*x[11]*x[12]*x[17]*std::pow(x[19], 2)*x[21] + x[1]*x[3]*x[6]*x[11]*x[13]*x[17]*std::pow(x[18], 2)*x[22] - x[1]*x[3]*x[6]*x[11]*x[13]*x[17]*x[18]*x[19]*x[21] + x[1]*x[3]*x[6]*x[11]*x[14]*x[15]*x[18]*x[19]*x[22] - x[1]*x[3]*x[6]*x[11]*x[14]*x[15]*std::pow(x[19], 2)*x[21] - x[1]*x[3]*x[6]*x[11]*x[14]*x[16]*std::pow(x[18], 2)*x[22] + x[1]*x[3]*x[6]*x[11]*x[14]*x[16]*x[18]*x[19]*x[21] - x[1]*x[3]*x[7]*x[9]*x[14]*x[17]*x[18]*std::pow(x[22], 2) + x[1]*x[3]*x[7]*x[9]*x[14]*x[17]*x[19]*x[21]*x[22] + x[1]*x[3]*x[7]*x[10]*x[14]*x[17]*x[18]*x[21]*x[22] - x[1]*x[3]*x[7]*x[10]*x[14]*x[17]*x[19]*std::pow(x[21], 2) + x[1]*x[3]*x[7]*x[11]*x[14]*x[15]*x[18]*std::pow(x[22], 2) - x[1]*x[3]*x[7]*x[11]*x[14]*x[15]*x[19]*x[21]*x[22] - x[1]*x[3]*x[7]*x[11]*x[14]*x[16]*x[18]*x[21]*x[22] + x[1]*x[3]*x[7]*x[11]*x[14]*x[16]*x[19]*std::pow(x[21], 2) - x[1]*x[3]*x[8]*x[9]*x[12]*x[17]*x[19]*x[23]*x[25] + x[1]*x[3]*x[8]*x[9]*x[12]*x[17]*x[20]*x[22]*x[25] + x[1]*x[3]*x[8]*x[9]*x[13]*x[17]*x[18]*x[23]*x[25] - x[1]*x[3]*x[8]*x[9]*x[13]*x[17]*x[20]*x[22]*x[24] - x[1]*x[3]*x[8]*x[9]*x[14]*x[15]*x[19]*x[22]*x[26] + x[1]*x[3]*x[8]*x[9]*x[14]*x[15]*x[19]*x[23]*x[25] + x[1]*x[3]*x[8]*x[9]*x[14]*x[16]*x[18]*x[22]*x[26] - x[1]*x[3]*x[8]*x[9]*x[14]*x[16]*x[19]*x[23]*x[24] + x[1]*x[3]*x[8]*x[10]*x[12]*x[17]*x[19]*x[23]*x[24] - x[1]*x[3]*x[8]*x[10]*x[12]*x[17]*x[20]*x[21]*x[25] - x[1]*x[3]*x[8]*x[10]*x[13]*x[17]*x[18]*x[23]*x[24] + x[1]*x[3]*x[8]*x[10]*x[13]*x[17]*x[20]*x[21]*x[24] - x[1]*x[3]*x[8]*x[10]*x[14]*x[15]*x[18]*x[23]*x[25] + x[1]*x[3]*x[8]*x[10]*x[14]*x[15]*x[19]*x[21]*x[26] - x[1]*x[3]*x[8]*x[10]*x[14]*x[16]*x[18]*x[21]*x[26] + x[1]*x[3]*x[8]*x[10]*x[14]*x[16]*x[18]*x[23]*x[24] + x[1]*x[3]*x[8]*x[11]*x[12]*x[15]*x[19]*x[22]*x[26] - x[1]*x[3]*x[8]*x[11]*x[12]*x[15]*x[20]*x[22]*x[25] - x[1]*x[3]*x[8]*x[11]*x[12]*x[16]*x[19]*x[21]*x[26] + x[1]*x[3]*x[8]*x[11]*x[12]*x[16]*x[20]*x[22]*x[24] - x[1]*x[3]*x[8]*x[11]*x[13]*x[15]*x[18]*x[22]*x[26] + x[1]*x[3]*x[8]*x[11]*x[13]*x[15]*x[20]*x[21]*x[25] + x[1]*x[3]*x[8]*x[11]*x[13]*x[16]*x[18]*x[21]*x[26] - x[1]*x[3]*x[8]*x[11]*x[13]*x[16]*x[20]*x[21]*x[24] + x[1]*x[4]*x[6]*x[9]*x[14]*x[17]*x[18]*std::pow(x[22], 2) - x[1]*x[4]*x[6]*x[9]*x[14]*x[17]*x[19]*x[21]*x[22] - x[1]*x[4]*x[6]*x[10]*x[14]*x[17]*x[18]*x[21]*x[22] + x[1]*x[4]*x[6]*x[10]*x[14]*x[17]*x[19]*std::pow(x[21], 2) - x[1]*x[4]*x[6]*x[11]*x[12]*x[17]*x[18]*std::pow(x[22], 2) + x[1]*x[4]*x[6]*x[11]*x[12]*x[17]*x[19]*x[21]*x[22] + x[1]*x[4]*x[6]*x[11]*x[13]*x[17]*x[18]*x[21]*x[22] - x[1]*x[4]*x[6]*x[11]*x[13]*x[17]*x[19]*std::pow(x[21], 2) + x[1]*x[4]*x[8]*x[9]*x[13]*x[17]*x[21]*x[23]*x[25] - x[1]*x[4]*x[8]*x[9]*x[13]*x[17]*x[22]*x[23]*x[24] - x[1]*x[4]*x[8]*x[9]*x[14]*x[15]*std::pow(x[22], 2)*x[26] + x[1]*x[4]*x[8]*x[9]*x[14]*x[15]*x[22]*x[23]*x[25] + x[1]*x[4]*x[8]*x[9]*x[14]*x[16]*x[21]*x[22]*x[26] - x[1]*x[4]*x[8]*x[9]*x[14]*x[16]*x[22]*x[23]*x[24] - x[1]*x[4]*x[8]*x[10]*x[12]*x[17]*x[21]*x[23]*x[25] + x[1]*x[4]*x[8]*x[10]*x[12]*x[17]*x[22]*x[23]*x[24] + x[1]*x[4]*x[8]*x[10]*x[14]*x[15]*x[21]*x[22]*x[26] - x[1]*x[4]*x[8]*x[10]*x[14]*x[15]*x[21]*x[23]*x[25] - x[1]*x[4]*x[8]*x[10]*x[14]*x[16]*std::pow(x[21], 2)*x[26] + x[1]*x[4]*x[8]*x[10]*x[14]*x[16]*x[21]*x[23]*x[24] + x[1]*x[4]*x[8]*x[11]*x[12]*x[15]*std::pow(x[22], 2)*x[26] - x[1]*x[4]*x[8]*x[11]*x[12]*x[15]*x[22]*x[23]*x[25] - x[1]*x[4]*x[8]*x[11]*x[12]*x[16]*x[21]*x[22]*x[26] + x[1]*x[4]*x[8]*x[11]*x[12]*x[16]*x[22]*x[23]*x[24] - x[1]*x[4]*x[8]*x[11]*x[13]*x[15]*x[21]*x[22]*x[26] + x[1]*x[4]*x[8]*x[11]*x[13]*x[15]*x[21]*x[23]*x[25] + x[1]*x[4]*x[8]*x[11]*x[13]*x[16]*std::pow(x[21], 2)*x[26] - x[1]*x[4]*x[8]*x[11]*x[13]*x[16]*x[21]*x[23]*x[24] + x[1]*x[5]*x[6]*x[9]*x[12]*x[17]*x[19]*x[22]*x[26] - x[1]*x[5]*x[6]*x[9]*x[12]*x[17]*x[19]*x[23]*x[25] - x[1]*x[5]*x[6]*x[9]*x[13]*x[17]*x[18]*x[22]*x[26] + x[1]*x[5]*x[6]*x[9]*x[13]*x[17]*x[19]*x[23]*x[24] + x[1]*x[5]*x[6]*x[9]*x[14]*x[15]*x[19]*x[23]*x[25] - x[1]*x[5]*x[6]*x[9]*x[14]*x[15]*x[20]*x[22]*x[25] - x[1]*x[5]*x[6]*x[9]*x[14]*x[16]*x[18]*x[23]*x[25] + x[1]*x[5]*x[6]*x[9]*x[14]*x[16]*x[20]*x[22]*x[24] + x[1]*x[5]*x[6]*x[10]*x[12]*x[17]*x[18]*x[23]*x[25] - x[1]*x[5]*x[6]*x[10]*x[12]*x[17]*x[19]*x[21]*x[26] + x[1]*x[5]*x[6]*x[10]*x[13]*x[17]*x[18]*x[21]*x[26] - x[1]*x[5]*x[6]*x[10]*x[13]*x[17]*x[18]*x[23]*x[24] - x[1]*x[5]*x[6]*x[10]*x[14]*x[15]*x[19]*x[23]*x[24] + x[1]*x[5]*x[6]*x[10]*x[14]*x[15]*x[20]*x[21]*x[25] + x[1]*x[5]*x[6]*x[10]*x[14]*x[16]*x[18]*x[23]*x[24] - x[1]*x[5]*x[6]*x[10]*x[14]*x[16]*x[20]*x[21]*x[24] - x[1]*x[5]*x[6]*x[11]*x[12]*x[15]*x[19]*x[22]*x[26] + x[1]*x[5]*x[6]*x[11]*x[12]*x[15]*x[20]*x[22]*x[25] + x[1]*x[5]*x[6]*x[11]*x[12]*x[16]*x[18]*x[22]*x[26] - x[1]*x[5]*x[6]*x[11]*x[12]*x[16]*x[20]*x[21]*x[25] + x[1]*x[5]*x[6]*x[11]*x[13]*x[15]*x[19]*x[21]*x[26] - x[1]*x[5]*x[6]*x[11]*x[13]*x[15]*x[20]*x[22]*x[24] - x[1]*x[5]*x[6]*x[11]*x[13]*x[16]*x[18]*x[21]*x[26] + x[1]*x[5]*x[6]*x[11]*x[13]*x[16]*x[20]*x[21]*x[24] + x[1]*x[5]*x[7]*x[9]*x[12]*x[17]*std::pow(x[22], 2)*x[26] - x[1]*x[5]*x[7]*x[9]*x[12]*x[17]*x[22]*x[23]*x[25] - x[1]*x[5]*x[7]*x[9]*x[13]*x[17]*x[21]*x[22]*x[26] + x[1]*x[5]*x[7]*x[9]*x[13]*x[17]*x[22]*x[23]*x[24] - x[1]*x[5]*x[7]*x[9]*x[14]*x[16]*x[21]*x[23]*x[25] + x[1]*x[5]*x[7]*x[9]*x[14]*x[16]*x[22]*x[23]*x[24] - x[1]*x[5]*x[7]*x[10]*x[12]*x[17]*x[21]*x[22]*x[26] + x[1]*x[5]*x[7]*x[10]*x[12]*x[17]*x[21]*x[23]*x[25] + x[1]*x[5]*x[7]*x[10]*x[13]*x[17]*std::pow(x[21], 2)*x[26] - x[1]*x[5]*x[7]*x[10]*x[13]*x[17]*x[21]*x[23]*x[24] + x[1]*x[5]*x[7]*x[10]*x[14]*x[15]*x[21]*x[23]*x[25] - x[1]*x[5]*x[7]*x[10]*x[14]*x[15]*x[22]*x[23]*x[24] - x[1]*x[5]*x[7]*x[11]*x[12]*x[15]*std::pow(x[22], 2)*x[26] + x[1]*x[5]*x[7]*x[11]*x[12]*x[15]*x[22]*x[23]*x[25] + x[1]*x[5]*x[7]*x[11]*x[12]*x[16]*x[21]*x[22]*x[26] - x[1]*x[5]*x[7]*x[11]*x[12]*x[16]*x[21]*x[23]*x[25] + x[1]*x[5]*x[7]*x[11]*x[13]*x[15]*x[21]*x[22]*x[26] - x[1]*x[5]*x[7]*x[11]*x[13]*x[15]*x[22]*x[23]*x[24] - x[1]*x[5]*x[7]*x[11]*x[13]*x[16]*std::pow(x[21], 2)*x[26] + x[1]*x[5]*x[7]*x[11]*x[13]*x[16]*x[21]*x[23]*x[24] - x[1]*x[5]*x[8]*x[9]*x[12]*x[16]*x[22]*std::pow(x[26], 2) + x[1]*x[5]*x[8]*x[9]*x[12]*x[16]*x[23]*x[25]*x[26] + x[1]*x[5]*x[8]*x[9]*x[13]*x[15]*x[22]*std::pow(x[26], 2) - x[1]*x[5]*x[8]*x[9]*x[13]*x[15]*x[23]*x[25]*x[26] + x[1]*x[5]*x[8]*x[10]*x[12]*x[16]*x[21]*std::pow(x[26], 2) - x[1]*x[5]*x[8]*x[10]*x[12]*x[16]*x[23]*x[24]*x[26] - x[1]*x[5]*x[8]*x[10]*x[13]*x[15]*x[21]*std::pow(x[26], 2) + x[1]*x[5]*x[8]*x[10]*x[13]*x[15]*x[23]*x[24]*x[26] - x[2]*x[3]*x[6]*x[9]*x[12]*x[17]*std::pow(x[19], 2)*x[26] + x[2]*x[3]*x[6]*x[9]*x[12]*x[17]*x[19]*x[20]*x[25] + x[2]*x[3]*x[6]*x[9]*x[13]*x[17]*x[18]*x[19]*x[26] - x[2]*x[3]*x[6]*x[9]*x[13]*x[17]*x[18]*x[20]*x[25] + x[2]*x[3]*x[6]*x[9]*x[14]*x[15]*std::pow(x[19], 2)*x[26] - x[2]*x[3]*x[6]*x[9]*x[14]*x[15]*x[19]*x[20]*x[25] - x[2]*x[3]*x[6]*x[9]*x[14]*x[16]*x[18]*x[19]*x[26] + x[2]*x[3]*x[6]*x[9]*x[14]*x[16]*x[18]*x[20]*x[25] + x[2]*x[3]*x[6]*x[10]*x[12]*x[17]*x[18]*x[19]*x[26] - x[2]*x[3]*x[6]*x[10]*x[12]*x[17]*x[19]*x[20]*x[24] - x[2]*x[3]*x[6]*x[10]*x[13]*x[17]*std::pow(x[18], 2)*x[26] + x[2]*x[3]*x[6]*x[10]*x[13]*x[17]*x[18]*x[20]*x[24] - x[2]*x[3]*x[6]*x[10]*x[14]*x[15]*x[18]*x[19]*x[26] + x[2]*x[3]*x[6]*x[10]*x[14]*x[15]*x[19]*x[20]*x[24] + x[2]*x[3]*x[6]*x[10]*x[14]*x[16]*std::pow(x[18], 2)*x[26] - x[2]*x[3]*x[6]*x[10]*x[14]*x[16]*x[18]*x[20]*x[24] + x[2]*x[3]*x[6]*x[11]*x[12]*x[16]*x[18]*x[20]*x[25] - x[2]*x[3]*x[6]*x[11]*x[12]*x[16]*x[19]*x[20]*x[24] - x[2]*x[3]*x[6]*x[11]*x[13]*x[15]*x[18]*x[20]*x[25] + x[2]*x[3]*x[6]*x[11]*x[13]*x[15]*x[19]*x[20]*x[24] - x[2]*x[3]*x[7]*x[9]*x[12]*x[17]*x[19]*x[22]*x[26] + x[2]*x[3]*x[7]*x[9]*x[12]*x[17]*x[20]*x[22]*x[25] + x[2]*x[3]*x[7]*x[9]*x[13]*x[17]*x[18]*x[22]*x[26] - x[2]*x[3]*x[7]*x[9]*x[13]*x[17]*x[20]*x[21]*x[25] + x[2]*x[3]*x[7]*x[9]*x[14]*x[15]*x[19]*x[22]*x[26] - x[2]*x[3]*x[7]*x[9]*x[14]*x[15]*x[19]*x[23]*x[25] + x[2]*x[3]*x[7]*x[9]*x[14]*x[16]*x[18]*x[23]*x[25] - x[2]*x[3]*x[7]*x[9]*x[14]*x[16]*x[19]*x[21]*x[26] + x[2]*x[3]*x[7]*x[10]*x[12]*x[17]*x[19]*x[21]*x[26] - x[2]*x[3]*x[7]*x[10]*x[12]*x[17]*x[20]*x[22]*x[24] - x[2]*x[3]*x[7]*x[10]*x[13]*x[17]*x[18]*x[21]*x[26] + x[2]*x[3]*x[7]*x[10]*x[13]*x[17]*x[20]*x[21]*x[24] - x[2]*x[3]*x[7]*x[10]*x[14]*x[15]*x[18]*x[22]*x[26] + x[2]*x[3]*x[7]*x[10]*x[14]*x[15]*x[19]*x[23]*x[24] + x[2]*x[3]*x[7]*x[10]*x[14]*x[16]*x[18]*x[21]*x[26] - x[2]*x[3]*x[7]*x[10]*x[14]*x[16]*x[18]*x[23]*x[24] + x[2]*x[3]*x[7]*x[11]*x[12]*x[15]*x[19]*x[23]*x[25] - x[2]*x[3]*x[7]*x[11]*x[12]*x[15]*x[20]*x[22]*x[25] - x[2]*x[3]*x[7]*x[11]*x[12]*x[16]*x[19]*x[23]*x[24] + x[2]*x[3]*x[7]*x[11]*x[12]*x[16]*x[20]*x[21]*x[25] - x[2]*x[3]*x[7]*x[11]*x[13]*x[15]*x[18]*x[23]*x[25] + x[2]*x[3]*x[7]*x[11]*x[13]*x[15]*x[20]*x[22]*x[24] + x[2]*x[3]*x[7]*x[11]*x[13]*x[16]*x[18]*x[23]*x[24] - x[2]*x[3]*x[7]*x[11]*x[13]*x[16]*x[20]*x[21]*x[24] + x[2]*x[3]*x[8]*x[9]*x[12]*x[16]*x[19]*std::pow(x[26], 2) - x[2]*x[3]*x[8]*x[9]*x[12]*x[16]*x[20]*x[25]*x[26] - x[2]*x[3]*x[8]*x[9]*x[13]*x[16]*x[18]*std::pow(x[26], 2) + x[2]*x[3]*x[8]*x[9]*x[13]*x[16]*x[20]*x[24]*x[26] - x[2]*x[3]*x[8]*x[10]*x[12]*x[15]*x[19]*std::pow(x[26], 2) + x[2]*x[3]*x[8]*x[10]*x[12]*x[15]*x[20]*x[25]*x[26] + x[2]*x[3]*x[8]*x[10]*x[13]*x[15]*x[18]*std::pow(x[26], 2) - x[2]*x[3]*x[8]*x[10]*x[13]*x[15]*x[20]*x[24]*x[26] - x[2]*x[4]*x[6]*x[9]*x[12]*x[17]*x[19]*x[22]*x[26] + x[2]*x[4]*x[6]*x[9]*x[12]*x[17]*x[19]*x[23]*x[25] - x[2]*x[4]*x[6]*x[9]*x[13]*x[17]*x[18]*x[23]*x[25] + x[2]*x[4]*x[6]*x[9]*x[13]*x[17]*x[19]*x[21]*x[26] + x[2]*x[4]*x[6]*x[9]*x[14]*x[15]*x[19]*x[22]*x[26] - x[2]*x[4]*x[6]*x[9]*x[14]*x[15]*x[20]*x[22]*x[25] - x[2]*x[4]*x[6]*x[9]*x[14]*x[16]*x[18]*x[22]*x[26] + x[2]*x[4]*x[6]*x[9]*x[14]*x[16]*x[20]*x[21]*x[25] + x[2]*x[4]*x[6]*x[10]*x[12]*x[17]*x[18]*x[22]*x[26] - x[2]*x[4]*x[6]*x[10]*x[12]*x[17]*x[19]*x[23]*x[24] - x[2]*x[4]*x[6]*x[10]*x[13]*x[17]*x[18]*x[21]*x[26] + x[2]*x[4]*x[6]*x[10]*x[13]*x[17]*x[18]*x[23]*x[24] - x[2]*x[4]*x[6]*x[10]*x[14]*x[15]*x[19]*x[21]*x[26] + x[2]*x[4]*x[6]*x[10]*x[14]*x[15]*x[20]*x[22]*x[24] + x[2]*x[4]*x[6]*x[10]*x[14]*x[16]*x[18]*x[21]*x[26] - x[2]*x[4]*x[6]*x[10]*x[14]*x[16]*x[20]*x[21]*x[24] - x[2]*x[4]*x[6]*x[11]*x[12]*x[15]*x[19]*x[23]*x[25] + x[2]*x[4]*x[6]*x[11]*x[12]*x[15]*x[20]*x[22]*x[25] + x[2]*x[4]*x[6]*x[11]*x[12]*x[16]*x[18]*x[23]*x[25] - x[2]*x[4]*x[6]*x[11]*x[12]*x[16]*x[20]*x[22]*x[24] + x[2]*x[4]*x[6]*x[11]*x[13]*x[15]*x[19]*x[23]*x[24] - x[2]*x[4]*x[6]*x[11]*x[13]*x[15]*x[20]*x[21]*x[25] - x[2]*x[4]*x[6]*x[11]*x[13]*x[16]*x[18]*x[23]*x[24] + x[2]*x[4]*x[6]*x[11]*x[13]*x[16]*x[20]*x[21]*x[24] - x[2]*x[4]*x[7]*x[9]*x[12]*x[17]*std::pow(x[22], 2)*x[26] + x[2]*x[4]*x[7]*x[9]*x[12]*x[17]*x[22]*x[23]*x[25] + x[2]*x[4]*x[7]*x[9]*x[13]*x[17]*x[21]*x[22]*x[26] - x[2]*x[4]*x[7]*x[9]*x[13]*x[17]*x[21]*x[23]*x[25] + x[2]*x[4]*x[7]*x[9]*x[14]*x[15]*std::pow(x[22], 2)*x[26] - x[2]*x[4]*x[7]*x[9]*x[14]*x[15]*x[22]*x[23]*x[25] - x[2]*x[4]*x[7]*x[9]*x[14]*x[16]*x[21]*x[22]*x[26] + x[2]*x[4]*x[7]*x[9]*x[14]*x[16]*x[21]*x[23]*x[25] + x[2]*x[4]*x[7]*x[10]*x[12]*x[17]*x[21]*x[22]*x[26] - x[2]*x[4]*x[7]*x[10]*x[12]*x[17]*x[22]*x[23]*x[24] - x[2]*x[4]*x[7]*x[10]*x[13]*x[17]*std::pow(x[21], 2)*x[26] + x[2]*x[4]*x[7]*x[10]*x[13]*x[17]*x[21]*x[23]*x[24] - x[2]*x[4]*x[7]*x[10]*x[14]*x[15]*x[21]*x[22]*x[26] + x[2]*x[4]*x[7]*x[10]*x[14]*x[15]*x[22]*x[23]*x[24] + x[2]*x[4]*x[7]*x[10]*x[14]*x[16]*std::pow(x[21], 2)*x[26] - x[2]*x[4]*x[7]*x[10]*x[14]*x[16]*x[21]*x[23]*x[24] + x[2]*x[4]*x[7]*x[11]*x[12]*x[16]*x[21]*x[23]*x[25] - x[2]*x[4]*x[7]*x[11]*x[12]*x[16]*x[22]*x[23]*x[24] - x[2]*x[4]*x[7]*x[11]*x[13]*x[15]*x[21]*x[23]*x[25] + x[2]*x[4]*x[7]*x[11]*x[13]*x[15]*x[22]*x[23]*x[24] + x[2]*x[4]*x[8]*x[9]*x[12]*x[16]*x[22]*std::pow(x[26], 2) - x[2]*x[4]*x[8]*x[9]*x[12]*x[16]*x[23]*x[25]*x[26] - x[2]*x[4]*x[8]*x[9]*x[13]*x[16]*x[21]*std::pow(x[26], 2) + x[2]*x[4]*x[8]*x[9]*x[13]*x[16]*x[23]*x[24]*x[26] - x[2]*x[4]*x[8]*x[10]*x[12]*x[15]*x[22]*std::pow(x[26], 2) + x[2]*x[4]*x[8]*x[10]*x[12]*x[15]*x[23]*x[25]*x[26] + x[2]*x[4]*x[8]*x[10]*x[13]*x[15]*x[21]*std::pow(x[26], 2) - x[2]*x[4]*x[8]*x[10]*x[13]*x[15]*x[23]*x[24]*x[26] - x[2]*x[5]*x[6]*x[9]*x[13]*x[15]*x[19]*std::pow(x[26], 2) + x[2]*x[5]*x[6]*x[9]*x[13]*x[15]*x[20]*x[25]*x[26] + x[2]*x[5]*x[6]*x[9]*x[13]*x[16]*x[18]*std::pow(x[26], 2) - x[2]*x[5]*x[6]*x[9]*x[13]*x[16]*x[20]*x[24]*x[26] + x[2]*x[5]*x[6]*x[10]*x[12]*x[15]*x[19]*std::pow(x[26], 2) - x[2]*x[5]*x[6]*x[10]*x[12]*x[15]*x[20]*x[25]*x[26] - x[2]*x[5]*x[6]*x[10]*x[12]*x[16]*x[18]*std::pow(x[26], 2) + x[2]*x[5]*x[6]*x[10]*x[12]*x[16]*x[20]*x[24]*x[26] - x[2]*x[5]*x[7]*x[9]*x[13]*x[15]*x[22]*std::pow(x[26], 2) + x[2]*x[5]*x[7]*x[9]*x[13]*x[15]*x[23]*x[25]*x[26] + x[2]*x[5]*x[7]*x[9]*x[13]*x[16]*x[21]*std::pow(x[26], 2) - x[2]*x[5]*x[7]*x[9]*x[13]*x[16]*x[23]*x[24]*x[26] + x[2]*x[5]*x[7]*x[10]*x[12]*x[15]*x[22]*std::pow(x[26], 2) - x[2]*x[5]*x[7]*x[10]*x[12]*x[15]*x[23]*x[25]*x[26] - x[2]*x[5]*x[7]*x[10]*x[12]*x[16]*x[21]*std::pow(x[26], 2) + x[2]*x[5]*x[7]*x[10]*x[12]*x[16]*x[23]*x[24]*x[26],  // NOLINT [whitespace/line_length]
     x[0]*x[3]*x[7]*x[9]*x[13]*x[17]*x[18]*x[20]*x[22] - x[0]*x[3]*x[7]*x[9]*x[13]*x[17]*x[19]*x[20]*x[21] - x[0]*x[3]*x[7]*x[9]*x[14]*x[15]*std::pow(x[19], 2)*x[23] + x[0]*x[3]*x[7]*x[9]*x[14]*x[15]*x[19]*x[20]*x[22] + x[0]*x[3]*x[7]*x[9]*x[14]*x[16]*x[18]*x[19]*x[23] - x[0]*x[3]*x[7]*x[9]*x[14]*x[16]*x[19]*x[20]*x[21] - x[0]*x[3]*x[7]*x[10]*x[12]*x[17]*x[18]*x[20]*x[22] + x[0]*x[3]*x[7]*x[10]*x[12]*x[17]*x[19]*x[20]*x[21] + x[0]*x[3]*x[7]*x[10]*x[14]*x[15]*x[18]*x[19]*x[23] - x[0]*x[3]*x[7]*x[10]*x[14]*x[15]*x[18]*x[20]*x[22] - x[0]*x[3]*x[7]*x[10]*x[14]*x[16]*std::pow(x[18], 2)*x[23] + x[0]*x[3]*x[7]*x[10]*x[14]*x[16]*x[18]*x[20]*x[21] + x[0]*x[3]*x[7]*x[11]*x[12]*x[15]*std::pow(x[19], 2)*x[23] - x[0]*x[3]*x[7]*x[11]*x[12]*x[15]*x[19]*x[20]*x[22] - x[0]*x[3]*x[7]*x[11]*x[12]*x[16]*x[18]*x[19]*x[23] + x[0]*x[3]*x[7]*x[11]*x[12]*x[16]*x[19]*x[20]*x[21] - x[0]*x[3]*x[7]*x[11]*x[13]*x[15]*x[18]*x[19]*x[23] + x[0]*x[3]*x[7]*x[11]*x[13]*x[15]*x[18]*x[20]*x[22] + x[0]*x[3]*x[7]*x[11]*x[13]*x[16]*std::pow(x[18], 2)*x[23] - x[0]*x[3]*x[7]*x[11]*x[13]*x[16]*x[18]*x[20]*x[21] + x[0]*x[3]*x[8]*x[9]*x[13]*x[15]*x[19]*x[20]*x[26] - x[0]*x[3]*x[8]*x[9]*x[13]*x[15]*std::pow(x[20], 2)*x[25] - x[0]*x[3]*x[8]*x[9]*x[13]*x[16]*x[18]*x[20]*x[26] + x[0]*x[3]*x[8]*x[9]*x[13]*x[16]*std::pow(x[20], 2)*x[24] - x[0]*x[3]*x[8]*x[10]*x[12]*x[15]*x[19]*x[20]*x[26] + x[0]*x[3]*x[8]*x[10]*x[12]*x[15]*std::pow(x[20], 2)*x[25] + x[0]*x[3]*x[8]*x[10]*x[12]*x[16]*x[18]*x[20]*x[26] - x[0]*x[3]*x[8]*x[10]*x[12]*x[16]*std::pow(x[20], 2)*x[24] + x[0]*x[4]*x[6]*x[9]*x[12]*x[17]*std::pow(x[19], 2)*x[23] - x[0]*x[4]*x[6]*x[9]*x[12]*x[17]*x[19]*x[20]*x[22] - x[0]*x[4]*x[6]*x[9]*x[13]*x[17]*x[18]*x[19]*x[23] + x[0]*x[4]*x[6]*x[9]*x[13]*x[17]*x[19]*x[20]*x[21] - x[0]*x[4]*x[6]*x[9]*x[14]*x[16]*x[18]*x[20]*x[22] + x[0]*x[4]*x[6]*x[9]*x[14]*x[16]*x[19]*x[20]*x[21] - x[0]*x[4]*x[6]*x[10]*x[12]*x[17]*x[18]*x[19]*x[23] + x[0]*x[4]*x[6]*x[10]*x[12]*x[17]*x[18]*x[20]*x[22] + x[0]*x[4]*x[6]*x[10]*x[13]*x[17]*std::pow(x[18], 2)*x[23] - x[0]*x[4]*x[6]*x[10]*x[13]*x[17]*x[18]*x[20]*x[21] + x[0]*x[4]*x[6]*x[10]*x[14]*x[15]*x[18]*x[20]*x[22] - x[0]*x[4]*x[6]*x[10]*x[14]*x[15]*x[19]*x[20]*x[21] - x[0]*x[4]*x[6]*x[11]*x[12]*x[15]*std::pow(x[19], 2)*x[23] + x[0]*x[4]*x[6]*x[11]*x[12]*x[15]*x[19]*x[20]*x[22] + x[0]*x[4]*x[6]*x[11]*x[12]*x[16]*x[18]*x[19]*x[23] - x[0]*x[4]*x[6]*x[11]*x[12]*x[16]*x[18]*x[20]*x[22] + x[0]*x[4]*x[6]*x[11]*x[13]*x[15]*x[18]*x[19]*x[23] - x[0]*x[4]*x[6]*x[11]*x[13]*x[15]*x[19]*x[20]*x[21] - x[0]*x[4]*x[6]*x[11]*x[13]*x[16]*std::pow(x[18], 2)*x[23] + x[0]*x[4]*x[6]*x[11]*x[13]*x[16]*x[18]*x[20]*x[21] + x[0]*x[4]*x[7]*x[9]*x[12]*x[17]*x[19]*x[22]*x[23] - x[0]*x[4]*x[7]*x[9]*x[12]*x[17]*x[20]*std::pow(x[22], 2) - x[0]*x[4]*x[7]*x[9]*x[13]*x[17]*x[19]*x[21]*x[23] + x[0]*x[4]*x[7]*x[9]*x[13]*x[17]*x[20]*x[21]*x[22] - x[0]*x[4]*x[7]*x[9]*x[14]*x[15]*x[19]*x[22]*x[23] + x[0]*x[4]*x[7]*x[9]*x[14]*x[15]*x[20]*std::pow(x[22], 2) + x[0]*x[4]*x[7]*x[9]*x[14]*x[16]*x[19]*x[21]*x[23] - x[0]*x[4]*x[7]*x[9]*x[14]*x[16]*x[20]*x[21]*x[22] - x[0]*x[4]*x[7]*x[10]*x[12]*x[17]*x[18]*x[22]*x[23] + x[0]*x[4]*x[7]*x[10]*x[12]*x[17]*x[20]*x[21]*x[22] + x[0]*x[4]*x[7]*x[10]*x[13]*x[17]*x[18]*x[21]*x[23] - x[0]*x[4]*x[7]*x[10]*x[13]*x[17]*x[20]*std::pow(x[21], 2) + x[0]*x[4]*x[7]*x[10]*x[14]*x[15]*x[18]*x[22]*x[23] - x[0]*x[4]*x[7]*x[10]*x[14]*x[15]*x[20]*x[21]*x[22] - x[0]*x[4]*x[7]*x[10]*x[14]*x[16]*x[18]*x[21]*x[23] + x[0]*x[4]*x[7]*x[10]*x[14]*x[16]*x[20]*std::pow(x[21], 2) - x[0]*x[4]*x[7]*x[11]*x[12]*x[16]*x[18]*x[22]*x[23] + x[0]*x[4]*x[7]*x[11]*x[12]*x[16]*x[19]*x[21]*x[23] + x[0]*x[4]*x[7]*x[11]*x[13]*x[15]*x[18]*x[22]*x[23] - x[0]*x[4]*x[7]*x[11]*x[13]*x[15]*x[19]*x[21]*x[23] - x[0]*x[4]*x[8]*x[9]*x[12]*x[16]*x[19]*x[23]*x[26] + x[0]*x[4]*x[8]*x[9]*x[12]*x[16]*x[20]*x[22]*x[26] + x[0]*x[4]*x[8]*x[9]*x[13]*x[15]*x[19]*x[23]*x[26] - x[0]*x[4]*x[8]*x[9]*x[13]*x[15]*x[20]*x[23]*x[25] - x[0]*x[4]*x[8]*x[9]*x[13]*x[16]*x[20]*x[21]*x[26] + x[0]*x[4]*x[8]*x[9]*x[13]*x[16]*x[20]*x[23]*x[24] - x[0]*x[4]*x[8]*x[10]*x[12]*x[15]*x[20]*x[22]*x[26] + x[0]*x[4]*x[8]*x[10]*x[12]*x[15]*x[20]*x[23]*x[25] + x[0]*x[4]*x[8]*x[10]*x[12]*x[16]*x[18]*x[23]*x[26] - x[0]*x[4]*x[8]*x[10]*x[12]*x[16]*x[20]*x[23]*x[24] - x[0]*x[4]*x[8]*x[10]*x[13]*x[15]*x[18]*x[23]*x[26] + x[0]*x[4]*x[8]*x[10]*x[13]*x[15]*x[20]*x[21]*x[26] - x[0]*x[5]*x[6]*x[9]*x[12]*x[16]*x[19]*x[20]*x[26] + x[0]*x[5]*x[6]*x[9]*x[12]*x[16]*std::pow(x[20], 2)*x[25] + x[0]*x[5]*x[6]*x[9]*x[13]*x[16]*x[18]*x[20]*x[26] - x[0]*x[5]*x[6]*x[9]*x[13]*x[16]*std::pow(x[20], 2)*x[24] + x[0]*x[5]*x[6]*x[10]*x[12]*x[15]*x[19]*x[20]*x[26] - x[0]*x[5]*x[6]*x[10]*x[12]*x[15]*std::pow(x[20], 2)*x[25] - x[0]*x[5]*x[6]*x[10]*x[13]*x[15]*x[18]*x[20]*x[26] + x[0]*x[5]*x[6]*x[10]*x[13]*x[15]*std::pow(x[20], 2)*x[24] - x[0]*x[5]*x[7]*x[9]*x[12]*x[16]*x[19]*x[23]*x[26] + x[0]*x[5]*x[7]*x[9]*x[12]*x[16]*x[20]*x[23]*x[25] + x[0]*x[5]*x[7]*x[9]*x[13]*x[15]*x[19]*x[23]*x[26] - x[0]*x[5]*x[7]*x[9]*x[13]*x[15]*x[20]*x[22]*x[26] + x[0]*x[5]*x[7]*x[9]*x[13]*x[16]*x[20]*x[21]*x[26] - x[0]*x[5]*x[7]*x[9]*x[13]*x[16]*x[20]*x[23]*x[24] + x[0]*x[5]*x[7]*x[10]*x[12]*x[15]*x[20]*x[22]*x[26] - x[0]*x[5]*x[7]*x[10]*x[12]*x[15]*x[20]*x[23]*x[25] + x[0]*x[5]*x[7]*x[10]*x[12]*x[16]*x[18]*x[23]*x[26] - x[0]*x[5]*x[7]*x[10]*x[12]*x[16]*x[20]*x[21]*x[26] - x[0]*x[5]*x[7]*x[10]*x[13]*x[15]*x[18]*x[23]*x[26] + x[0]*x[5]*x[7]*x[10]*x[13]*x[15]*x[20]*x[23]*x[24] - x[1]*x[3]*x[6]*x[9]*x[12]*x[17]*std::pow(x[19], 2)*x[23] + x[1]*x[3]*x[6]*x[9]*x[12]*x[17]*x[19]*x[20]*x[22] + x[1]*x[3]*x[6]*x[9]*x[13]*x[17]*x[18]*x[19]*x[23] - x[1]*x[3]*x[6]*x[9]*x[13]*x[17]*x[18]*x[20]*x[22] + x[1]*x[3]*x[6]*x[9]*x[14]*x[15]*std::pow(x[19], 2)*x[23] - x[1]*x[3]*x[6]*x[9]*x[14]*x[15]*x[19]*x[20]*x[22] - x[1]*x[3]*x[6]*x[9]*x[14]*x[16]*x[18]*x[19]*x[23] + x[1]*x[3]*x[6]*x[9]*x[14]*x[16]*x[18]*x[20]*x[22] + x[1]*x[3]*x[6]*x[10]*x[12]*x[17]*x[18]*x[19]*x[23] - x[1]*x[3]*x[6]*x[10]*x[12]*x[17]*x[19]*x[20]*x[21] - x[1]*x[3]*x[6]*x[10]*x[13]*x[17]*std::pow(x[18], 2)*x[23] + x[1]*x[3]*x[6]*x[10]*x[13]*x[17]*x[18]*x[20]*x[21] - x[1]*x[3]*x[6]*x[10]*x[14]*x[15]*x[18]*x[19]*x[23] + x[1]*x[3]*x[6]*x[10]*x[14]*x[15]*x[19]*x[20]*x[21] + x[1]*x[3]*x[6]*x[10]*x[14]*x[16]*std::pow(x[18], 2)*x[23] - x[1]*x[3]*x[6]*x[10]*x[14]*x[16]*x[18]*x[20]*x[21] + x[1]*x[3]*x[6]*x[11]*x[12]*x[16]*x[18]*x[20]*x[22] - x[1]*x[3]*x[6]*x[11]*x[12]*x[16]*x[19]*x[20]*x[21] - x[1]*x[3]*x[6]*x[11]*x[13]*x[15]*x[18]*x[20]*x[22] + x[1]*x[3]*x[6]*x[11]*x[13]*x[15]*x[19]*x[20]*x[21] - x[1]*x[3]*x[7]*x[9]*x[12]*x[17]*x[19]*x[22]*x[23] + x[1]*x[3]*x[7]*x[9]*x[12]*x[17]*x[20]*std::pow(x[22], 2) + x[1]*x[3]*x[7]*x[9]*x[13]*x[17]*x[18]*x[22]*x[23] - x[1]*x[3]*x[7]*x[9]*x[13]*x[17]*x[20]*x[21]*x[22] + x[1]*x[3]*x[7]*x[9]*x[14]*x[16]*x[18]*x[22]*x[23] - x[1]*x[3]*x[7]*x[9]*x[14]*x[16]*x[19]*x[21]*x[23] + x[1]*x[3]*x[7]*x[10]*x[12]*x[17]*x[19]*x[21]*x[23] - x[1]*x[3]*x[7]*x[10]*x[12]*x[17]*x[20]*x[21]*x[22] - x[1]*x[3]*x[7]*x[10]*x[13]*x[17]*x[18]*x[21]*x[23] + x[1]*x[3]*x[7]*x[10]*x[13]*x[17]*x[20]*std::pow(x[21], 2) - x[1]*x[3]*x[7]*x[10]*x[14]*x[15]*x[18]*x[22]*x[23] + x[1]*x[3]*x[7]*x[10]*x[14]*x[15]*x[19]*x[21]*x[23] + x[1]*x[3]*x[7]*x[11]*x[12]*x[15]*x[19]*x[22]*x[23] - x[1]*x[3]*x[7]*x[11]*x[12]*x[15]*x[20]*std::pow(x[22], 2) - x[1]*x[3]*x[7]*x[11]*x[12]*x[16]*x[19]*x[21]*x[23] + x[1]*x[3]*x[7]*x[11]*x[12]*x[16]*x[20]*x[21]*x[22] - x[1]*x[3]*x[7]*x[11]*x[13]*x[15]*x[18]*x[22]*x[23] + x[1]*x[3]*x[7]*x[11]*x[13]*x[15]*x[20]*x[21]*x[22] + x[1]*x[3]*x[7]*x[11]*x[13]*x[16]*x[18]*x[21]*x[23] - x[1]*x[3]*x[7]*x[11]*x[13]*x[16]*x[20]*std::pow(x[21], 2) + x[1]*x[3]*x[8]*x[9]*x[12]*x[16]*x[19]*x[23]*x[26] - x[1]*x[3]*x[8]*x[9]*x[12]*x[16]*x[20]*x[22]*x[26] + x[1]*x[3]*x[8]*x[9]*x[13]*x[15]*x[20]*x[22]*x[26] - x[1]*x[3]*x[8]*x[9]*x[13]*x[15]*x[20]*x[23]*x[25] - x[1]*x[3]*x[8]*x[9]*x[13]*x[16]*x[18]*x[23]*x[26] + x[1]*x[3]*x[8]*x[9]*x[13]*x[16]*x[20]*x[23]*x[24] - x[1]*x[3]*x[8]*x[10]*x[12]*x[15]*x[19]*x[23]*x[26] + x[1]*x[3]*x[8]*x[10]*x[12]*x[15]*x[20]*x[23]*x[25] + x[1]*x[3]*x[8]*x[10]*x[12]*x[16]*x[20]*x[21]*x[26] - x[1]*x[3]*x[8]*x[10]*x[12]*x[16]*x[20]*x[23]*x[24] + x[1]*x[3]*x[8]*x[10]*x[13]*x[15]*x[18]*x[23]*x[26] - x[1]*x[3]*x[8]*x[10]*x[13]*x[15]*x[20]*x[21]*x[26] - x[1]*x[4]*x[6]*x[9]*x[13]*x[17]*x[18]*x[22]*x[23] + x[1]*x[4]*x[6]*x[9]*x[13]*x[17]*x[19]*x[21]*x[23] + x[1]*x[4]*x[6]*x[9]*x[14]*x[15]*x[19]*x[22]*x[23] - x[1]*x[4]*x[6]*x[9]*x[14]*x[15]*x[20]*std::pow(x[22], 2) - x[1]*x[4]*x[6]*x[9]*x[14]*x[16]*x[18]*x[22]*x[23] + x[1]*x[4]*x[6]*x[9]*x[14]*x[16]*x[20]*x[21]*x[22] + x[1]*x[4]*x[6]*x[10]*x[12]*x[17]*x[18]*x[22]*x[23] - x[1]*x[4]*x[6]*x[10]*x[12]*x[17]*x[19]*x[21]*x[23] - x[1]*x[4]*x[6]*x[10]*x[14]*x[15]*x[19]*x[21]*x[23] + x[1]*x[4]*x[6]*x[10]*x[14]*x[15]*x[20]*x[21]*x[22] + x[1]*x[4]*x[6]*x[10]*x[14]*x[16]*x[18]*x[21]*x[23] - x[1]*x[4]*x[6]*x[10]*x[14]*x[16]*x[20]*std::pow(x[21], 2) - x[1]*x[4]*x[6]*x[11]*x[12]*x[15]*x[19]*x[22]*x[23] + x[1]*x[4]*x[6]*x[11]*x[12]*x[15]*x[20]*std::pow(x[22], 2) + x[1]*x[4]*x[6]*x[11]*x[12]*x[16]*x[18]*x[22]*x[23] - x[1]*x[4]*x[6]*x[11]*x[12]*x[16]*x[20]*x[21]*x[22] + x[1]*x[4]*x[6]*x[11]*x[13]*x[15]*x[19]*x[21]*x[23] - x[1]*x[4]*x[6]*x[11]*x[13]*x[15]*x[20]*x[21]*x[22] - x[1]*x[4]*x[6]*x[11]*x[13]*x[16]*x[18]*x[21]*x[23] + x[1]*x[4]*x[6]*x[11]*x[13]*x[16]*x[20]*std::pow(x[21], 2) + x[1]*x[4]*x[8]*x[9]*x[13]*x[15]*x[22]*x[23]*x[26] - x[1]*x[4]*x[8]*x[9]*x[13]*x[15]*std::pow(x[23], 2)*x[25] - x[1]*x[4]*x[8]*x[9]*x[13]*x[16]*x[21]*x[23]*x[26] + x[1]*x[4]*x[8]*x[9]*x[13]*x[16]*std::pow(x[23], 2)*x[24] - x[1]*x[4]*x[8]*x[10]*x[12]*x[15]*x[22]*x[23]*x[26] + x[1]*x[4]*x[8]*x[10]*x[12]*x[15]*std::pow(x[23], 2)*x[25] + x[1]*x[4]*x[8]*x[10]*x[12]*x[16]*x[21]*x[23]*x[26] - x[1]*x[4]*x[8]*x[10]*x[12]*x[16]*std::pow(x[23], 2)*x[24] - x[1]*x[5]*x[6]*x[9]*x[12]*x[16]*x[20]*x[22]*x[26] + x[1]*x[5]*x[6]*x[9]*x[12]*x[16]*x[20]*x[23]*x[25] - x[1]*x[5]*x[6]*x[9]*x[13]*x[15]*x[19]*x[23]*x[26] + x[1]*x[5]*x[6]*x[9]*x[13]*x[15]*x[20]*x[22]*x[26] + x[1]*x[5]*x[6]*x[9]*x[13]*x[16]*x[18]*x[23]*x[26] - x[1]*x[5]*x[6]*x[9]*x[13]*x[16]*x[20]*x[23]*x[24] + x[1]*x[5]*x[6]*x[10]*x[12]*x[15]*x[19]*x[23]*x[26] - x[1]*x[5]*x[6]*x[10]*x[12]*x[15]*x[20]*x[23]*x[25] - x[1]*x[5]*x[6]*x[10]*x[12]*x[16]*x[18]*x[23]*x[26] + x[1]*x[5]*x[6]*x[10]*x[12]*x[16]*x[20]*x[21]*x[26] - x[1]*x[5]*x[6]*x[10]*x[13]*x[15]*x[20]*x[21]*x[26] + x[1]*x[5]*x[6]*x[10]*x[13]*x[15]*x[20]*x[23]*x[24] - x[1]*x[5]*x[7]*x[9]*x[12]*x[16]*x[22]*x[23]*x[26] + x[1]*x[5]*x[7]*x[9]*x[12]*x[16]*std::pow(x[23], 2)*x[25] + x[1]*x[5]*x[7]*x[9]*x[13]*x[16]*x[21]*x[23]*x[26] - x[1]*x[5]*x[7]*x[9]*x[13]*x[16]*std::pow(x[23], 2)*x[24] + x[1]*x[5]*x[7]*x[10]*x[12]*x[15]*x[22]*x[23]*x[26] - x[1]*x[5]*x[7]*x[10]*x[12]*x[15]*std::pow(x[23], 2)*x[25] - x[1]*x[5]*x[7]*x[10]*x[13]*x[15]*x[21]*x[23]*x[26] + x[1]*x[5]*x[7]*x[10]*x[13]*x[15]*std::pow(x[23], 2)*x[24] + x[2]*x[3]*x[6]*x[9]*x[12]*x[16]*x[19]*x[20]*x[26] - x[2]*x[3]*x[6]*x[9]*x[12]*x[16]*std::pow(x[20], 2)*x[25] - x[2]*x[3]*x[6]*x[9]*x[13]*x[15]*x[19]*x[20]*x[26] + x[2]*x[3]*x[6]*x[9]*x[13]*x[15]*std::pow(x[20], 2)*x[25] - x[2]*x[3]*x[6]*x[10]*x[12]*x[16]*x[18]*x[20]*x[26] + x[2]*x[3]*x[6]*x[10]*x[12]*x[16]*std::pow(x[20], 2)*x[24] + x[2]*x[3]*x[6]*x[10]*x[13]*x[15]*x[18]*x[20]*x[26] - x[2]*x[3]*x[6]*x[10]*x[13]*x[15]*std::pow(x[20], 2)*x[24] + x[2]*x[3]*x[7]*x[9]*x[12]*x[16]*x[19]*x[23]*x[26] - x[2]*x[3]*x[7]*x[9]*x[12]*x[16]*x[20]*x[23]*x[25] - x[2]*x[3]*x[7]*x[9]*x[13]*x[15]*x[20]*x[22]*x[26] + x[2]*x[3]*x[7]*x[9]*x[13]*x[15]*x[20]*x[23]*x[25] - x[2]*x[3]*x[7]*x[9]*x[13]*x[16]*x[18]*x[23]*x[26] + x[2]*x[3]*x[7]*x[9]*x[13]*x[16]*x[20]*x[21]*x[26] - x[2]*x[3]*x[7]*x[10]*x[12]*x[15]*x[19]*x[23]*x[26] + x[2]*x[3]*x[7]*x[10]*x[12]*x[15]*x[20]*x[22]*x[26] - x[2]*x[3]*x[7]*x[10]*x[12]*x[16]*x[20]*x[21]*x[26] + x[2]*x[3]*x[7]*x[10]*x[12]*x[16]*x[20]*x[23]*x[24] + x[2]*x[3]*x[7]*x[10]*x[13]*x[15]*x[18]*x[23]*x[26] - x[2]*x[3]*x[7]*x[10]*x[13]*x[15]*x[20]*x[23]*x[24] + x[2]*x[4]*x[6]*x[9]*x[12]*x[16]*x[20]*x[22]*x[26] - x[2]*x[4]*x[6]*x[9]*x[12]*x[16]*x[20]*x[23]*x[25] - x[2]*x[4]*x[6]*x[9]*x[13]*x[15]*x[19]*x[23]*x[26] + x[2]*x[4]*x[6]*x[9]*x[13]*x[15]*x[20]*x[23]*x[25] + x[2]*x[4]*x[6]*x[9]*x[13]*x[16]*x[18]*x[23]*x[26] - x[2]*x[4]*x[6]*x[9]*x[13]*x[16]*x[20]*x[21]*x[26] + x[2]*x[4]*x[6]*x[10]*x[12]*x[15]*x[19]*x[23]*x[26] - x[2]*x[4]*x[6]*x[10]*x[12]*x[15]*x[20]*x[22]*x[26] - x[2]*x[4]*x[6]*x[10]*x[12]*x[16]*x[18]*x[23]*x[26] + x[2]*x[4]*x[6]*x[10]*x[12]*x[16]*x[20]*x[23]*x[24] + x[2]*x[4]*x[6]*x[10]*x[13]*x[15]*x[20]*x[21]*x[26] - x[2]*x[4]*x[6]*x[10]*x[13]*x[15]*x[20]*x[23]*x[24] + x[2]*x[4]*x[7]*x[9]*x[12]*x[16]*x[22]*x[23]*x[26] - x[2]*x[4]*x[7]*x[9]*x[12]*x[16]*std::pow(x[23], 2)*x[25] - x[2]*x[4]*x[7]*x[9]*x[13]*x[15]*x[22]*x[23]*x[26] + x[2]*x[4]*x[7]*x[9]*x[13]*x[15]*std::pow(x[23], 2)*x[25] - x[2]*x[4]*x[7]*x[10]*x[12]*x[16]*x[21]*x[23]*x[26] + x[2]*x[4]*x[7]*x[10]*x[12]*x[16]*std::pow(x[23], 2)*x[24] + x[2]*x[4]*x[7]*x[10]*x[13]*x[15]*x[21]*x[23]*x[26] - x[2]*x[4]*x[7]*x[10]*x[13]*x[15]*std::pow(x[23], 2)*x[24],  // NOLINT [whitespace/line_length]
     x[0]*x[3]*x[7]*x[9]*x[13]*x[15]*x[19]*x[20]*x[23] - x[0]*x[3]*x[7]*x[9]*x[13]*x[15]*std::pow(x[20], 2)*x[22] - x[0]*x[3]*x[7]*x[9]*x[13]*x[16]*x[18]*x[20]*x[23] + x[0]*x[3]*x[7]*x[9]*x[13]*x[16]*std::pow(x[20], 2)*x[21] - x[0]*x[3]*x[7]*x[10]*x[12]*x[15]*x[19]*x[20]*x[23] + x[0]*x[3]*x[7]*x[10]*x[12]*x[15]*std::pow(x[20], 2)*x[22] + x[0]*x[3]*x[7]*x[10]*x[12]*x[16]*x[18]*x[20]*x[23] - x[0]*x[3]*x[7]*x[10]*x[12]*x[16]*std::pow(x[20], 2)*x[21] - x[0]*x[4]*x[6]*x[9]*x[12]*x[16]*x[19]*x[20]*x[23] + x[0]*x[4]*x[6]*x[9]*x[12]*x[16]*std::pow(x[20], 2)*x[22] + x[0]*x[4]*x[6]*x[9]*x[13]*x[16]*x[18]*x[20]*x[23] - x[0]*x[4]*x[6]*x[9]*x[13]*x[16]*std::pow(x[20], 2)*x[21] + x[0]*x[4]*x[6]*x[10]*x[12]*x[15]*x[19]*x[20]*x[23] - x[0]*x[4]*x[6]*x[10]*x[12]*x[15]*std::pow(x[20], 2)*x[22] - x[0]*x[4]*x[6]*x[10]*x[13]*x[15]*x[18]*x[20]*x[23] + x[0]*x[4]*x[6]*x[10]*x[13]*x[15]*std::pow(x[20], 2)*x[21] - x[0]*x[4]*x[7]*x[9]*x[12]*x[16]*x[19]*std::pow(x[23], 2) + x[0]*x[4]*x[7]*x[9]*x[12]*x[16]*x[20]*x[22]*x[23] + x[0]*x[4]*x[7]*x[9]*x[13]*x[15]*x[19]*std::pow(x[23], 2) - x[0]*x[4]*x[7]*x[9]*x[13]*x[15]*x[20]*x[22]*x[23] + x[0]*x[4]*x[7]*x[10]*x[12]*x[16]*x[18]*std::pow(x[23], 2) - x[0]*x[4]*x[7]*x[10]*x[12]*x[16]*x[20]*x[21]*x[23] - x[0]*x[4]*x[7]*x[10]*x[13]*x[15]*x[18]*std::pow(x[23], 2) + x[0]*x[4]*x[7]*x[10]*x[13]*x[15]*x[20]*x[21]*x[23] + x[1]*x[3]*x[6]*x[9]*x[12]*x[16]*x[19]*x[20]*x[23] - x[1]*x[3]*x[6]*x[9]*x[12]*x[16]*std::pow(x[20], 2)*x[22] - x[1]*x[3]*x[6]*x[9]*x[13]*x[15]*x[19]*x[20]*x[23] + x[1]*x[3]*x[6]*x[9]*x[13]*x[15]*std::pow(x[20], 2)*x[22] - x[1]*x[3]*x[6]*x[10]*x[12]*x[16]*x[18]*x[20]*x[23] + x[1]*x[3]*x[6]*x[10]*x[12]*x[16]*std::pow(x[20], 2)*x[21] + x[1]*x[3]*x[6]*x[10]*x[13]*x[15]*x[18]*x[20]*x[23] - x[1]*x[3]*x[6]*x[10]*x[13]*x[15]*std::pow(x[20], 2)*x[21] + x[1]*x[3]*x[7]*x[9]*x[12]*x[16]*x[19]*std::pow(x[23], 2) - x[1]*x[3]*x[7]*x[9]*x[12]*x[16]*x[20]*x[22]*x[23] - x[1]*x[3]*x[7]*x[9]*x[13]*x[16]*x[18]*std::pow(x[23], 2) + x[1]*x[3]*x[7]*x[9]*x[13]*x[16]*x[20]*x[21]*x[23] - x[1]*x[3]*x[7]*x[10]*x[12]*x[15]*x[19]*std::pow(x[23], 2) + x[1]*x[3]*x[7]*x[10]*x[12]*x[15]*x[20]*x[22]*x[23] + x[1]*x[3]*x[7]*x[10]*x[13]*x[15]*x[18]*std::pow(x[23], 2) - x[1]*x[3]*x[7]*x[10]*x[13]*x[15]*x[20]*x[21]*x[23] - x[1]*x[4]*x[6]*x[9]*x[13]*x[15]*x[19]*std::pow(x[23], 2) + x[1]*x[4]*x[6]*x[9]*x[13]*x[15]*x[20]*x[22]*x[23] + x[1]*x[4]*x[6]*x[9]*x[13]*x[16]*x[18]*std::pow(x[23], 2) - x[1]*x[4]*x[6]*x[9]*x[13]*x[16]*x[20]*x[21]*x[23] + x[1]*x[4]*x[6]*x[10]*x[12]*x[15]*x[19]*std::pow(x[23], 2) - x[1]*x[4]*x[6]*x[10]*x[12]*x[15]*x[20]*x[22]*x[23] - x[1]*x[4]*x[6]*x[10]*x[12]*x[16]*x[18]*std::pow(x[23], 2) + x[1]*x[4]*x[6]*x[10]*x[12]*x[16]*x[20]*x[21]*x[23];  // NOLINT [whitespace/line_length]

        return coeffs;
    }